

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,16>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  uint uVar1;
  uint uVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  RTCRayQueryContext *pRVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  float fVar21;
  float fVar22;
  undefined8 uVar23;
  ulong uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  int iVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  int iVar66;
  int iVar67;
  int iVar68;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  byte bVar78;
  byte bVar79;
  byte bVar80;
  byte bVar81;
  byte bVar82;
  ulong uVar83;
  byte bVar84;
  ulong uVar85;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined8 in_R10;
  long lVar86;
  bool bVar87;
  uint uVar88;
  uint uVar155;
  uint uVar156;
  uint uVar158;
  uint uVar159;
  uint uVar160;
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  uint uVar157;
  uint uVar161;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  float pp;
  float fVar162;
  float fVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  float fVar182;
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar180;
  float fVar181;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar179 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined4 uVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar197 [16];
  undefined1 auVar201 [32];
  float fVar202;
  float fVar203;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  float fVar221;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  undefined1 auVar236 [32];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar244 [16];
  float fVar248;
  undefined1 auVar246 [32];
  undefined1 auVar245 [16];
  undefined1 auVar247 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar253 [64];
  float fVar254;
  float fVar261;
  undefined1 auVar257 [32];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar259;
  float fVar260;
  undefined1 auVar258 [64];
  undefined1 auVar262 [16];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  float fVar266;
  undefined1 auVar265 [64];
  undefined1 auVar267 [64];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [64];
  undefined1 auVar272 [32];
  float fVar273;
  undefined1 auVar274 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  int local_d1c;
  RTCFilterFunctionNArguments local_ad0;
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 (*local_a18) [32];
  Primitive *local_a10;
  ulong local_a08;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [16];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  undefined1 local_910 [16];
  undefined1 local_900 [16];
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  undefined1 auStack_870 [16];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  float local_720;
  float fStack_71c;
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  ulong uStack_160;
  int aiStack_158 [74];
  
  uVar85 = (ulong)(byte)prim[1];
  fVar254 = *(float *)(prim + uVar85 * 0x19 + 0x12);
  auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar20 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar94 = vinsertps_avx(auVar20,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar95 = vsubps_avx(auVar19,*(undefined1 (*) [16])(prim + uVar85 * 0x19 + 6));
  fVar221 = fVar254 * auVar95._0_4_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar85 * 4 + 6);
  auVar107 = vpmovsxbd_avx2(auVar19);
  fVar162 = fVar254 * auVar94._0_4_;
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar85 * 5 + 6);
  auVar105 = vpmovsxbd_avx2(auVar20);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar85 * 6 + 6);
  auVar108 = vpmovsxbd_avx2(auVar91);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar85 * 0xb + 6);
  auVar109 = vpmovsxbd_avx2(auVar92);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar109 = vcvtdq2ps_avx(auVar109);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar85 * 0xc + 6);
  auVar110 = vpmovsxbd_avx2(auVar89);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar85 * 0xd + 6);
  auVar106 = vpmovsxbd_avx2(auVar101);
  auVar97._8_8_ = 0;
  auVar97._0_8_ = *(ulong *)(prim + uVar85 * 0x12 + 6);
  auVar111 = vpmovsxbd_avx2(auVar97);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar111 = vcvtdq2ps_avx(auVar111);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar85 * 0x13 + 6);
  auVar112 = vpmovsxbd_avx2(auVar90);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar85 * 0x14 + 6);
  auVar114 = vpmovsxbd_avx2(auVar93);
  auVar113 = vcvtdq2ps_avx(auVar114);
  auVar125._8_4_ = 1;
  auVar125._0_8_ = 0x100000001;
  auVar125._12_4_ = 1;
  auVar125._16_4_ = 1;
  auVar125._20_4_ = 1;
  auVar125._24_4_ = 1;
  auVar125._28_4_ = 1;
  auVar123._4_4_ = fVar162;
  auVar123._0_4_ = fVar162;
  auVar123._8_4_ = fVar162;
  auVar123._12_4_ = fVar162;
  auVar123._16_4_ = fVar162;
  auVar123._20_4_ = fVar162;
  auVar123._24_4_ = fVar162;
  auVar123._28_4_ = fVar162;
  auVar104 = ZEXT1632(CONCAT412(fVar254 * auVar94._12_4_,
                                CONCAT48(fVar254 * auVar94._8_4_,
                                         CONCAT44(fVar254 * auVar94._4_4_,fVar162))));
  auVar115 = vpermps_avx2(auVar125,auVar104);
  auVar102 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar103 = vpermps_avx512vl(auVar102,auVar104);
  fVar162 = auVar103._0_4_;
  auVar179._0_4_ = fVar162 * auVar108._0_4_;
  fVar259 = auVar103._4_4_;
  auVar179._4_4_ = fVar259 * auVar108._4_4_;
  fVar260 = auVar103._8_4_;
  auVar179._8_4_ = fVar260 * auVar108._8_4_;
  fVar261 = auVar103._12_4_;
  auVar179._12_4_ = fVar261 * auVar108._12_4_;
  fVar237 = auVar103._16_4_;
  auVar179._16_4_ = fVar237 * auVar108._16_4_;
  fVar238 = auVar103._20_4_;
  auVar179._20_4_ = fVar238 * auVar108._20_4_;
  fVar239 = auVar103._24_4_;
  auVar179._28_36_ = in_ZMM4._28_36_;
  auVar179._24_4_ = fVar239 * auVar108._24_4_;
  auVar104._4_4_ = auVar106._4_4_ * fVar259;
  auVar104._0_4_ = auVar106._0_4_ * fVar162;
  auVar104._8_4_ = auVar106._8_4_ * fVar260;
  auVar104._12_4_ = auVar106._12_4_ * fVar261;
  auVar104._16_4_ = auVar106._16_4_ * fVar237;
  auVar104._20_4_ = auVar106._20_4_ * fVar238;
  auVar104._24_4_ = auVar106._24_4_ * fVar239;
  auVar104._28_4_ = auVar114._28_4_;
  auVar114._4_4_ = fVar259 * auVar113._4_4_;
  auVar114._0_4_ = fVar162 * auVar113._0_4_;
  auVar114._8_4_ = fVar260 * auVar113._8_4_;
  auVar114._12_4_ = fVar261 * auVar113._12_4_;
  auVar114._16_4_ = fVar237 * auVar113._16_4_;
  auVar114._20_4_ = fVar238 * auVar113._20_4_;
  auVar114._24_4_ = fVar239 * auVar113._24_4_;
  auVar114._28_4_ = auVar103._28_4_;
  auVar19 = vfmadd231ps_fma(auVar179._0_32_,auVar115,auVar105);
  auVar20 = vfmadd231ps_fma(auVar104,auVar115,auVar110);
  auVar91 = vfmadd231ps_fma(auVar114,auVar112,auVar115);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar123,auVar107);
  auVar20 = vfmadd231ps_fma(ZEXT1632(auVar20),auVar123,auVar109);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar111,auVar123);
  auVar124._4_4_ = fVar221;
  auVar124._0_4_ = fVar221;
  auVar124._8_4_ = fVar221;
  auVar124._12_4_ = fVar221;
  auVar124._16_4_ = fVar221;
  auVar124._20_4_ = fVar221;
  auVar124._24_4_ = fVar221;
  auVar124._28_4_ = fVar221;
  auVar115 = ZEXT1632(CONCAT412(fVar254 * auVar95._12_4_,
                                CONCAT48(fVar254 * auVar95._8_4_,
                                         CONCAT44(fVar254 * auVar95._4_4_,fVar221))));
  auVar114 = vpermps_avx2(auVar125,auVar115);
  auVar104 = vpermps_avx512vl(auVar102,auVar115);
  fVar254 = auVar104._0_4_;
  fVar162 = auVar104._4_4_;
  auVar115._4_4_ = fVar162 * auVar108._4_4_;
  auVar115._0_4_ = fVar254 * auVar108._0_4_;
  fVar259 = auVar104._8_4_;
  auVar115._8_4_ = fVar259 * auVar108._8_4_;
  fVar260 = auVar104._12_4_;
  auVar115._12_4_ = fVar260 * auVar108._12_4_;
  fVar261 = auVar104._16_4_;
  auVar115._16_4_ = fVar261 * auVar108._16_4_;
  fVar237 = auVar104._20_4_;
  auVar115._20_4_ = fVar237 * auVar108._20_4_;
  fVar238 = auVar104._24_4_;
  auVar115._24_4_ = fVar238 * auVar108._24_4_;
  auVar115._28_4_ = auVar108._28_4_;
  auVar118._0_4_ = fVar254 * auVar106._0_4_;
  auVar118._4_4_ = fVar162 * auVar106._4_4_;
  auVar118._8_4_ = fVar259 * auVar106._8_4_;
  auVar118._12_4_ = fVar260 * auVar106._12_4_;
  auVar118._16_4_ = fVar261 * auVar106._16_4_;
  auVar118._20_4_ = fVar237 * auVar106._20_4_;
  auVar118._24_4_ = fVar238 * auVar106._24_4_;
  auVar118._28_4_ = 0;
  auVar106._4_4_ = fVar162 * auVar113._4_4_;
  auVar106._0_4_ = fVar254 * auVar113._0_4_;
  auVar106._8_4_ = fVar259 * auVar113._8_4_;
  auVar106._12_4_ = fVar260 * auVar113._12_4_;
  auVar106._16_4_ = fVar261 * auVar113._16_4_;
  auVar106._20_4_ = fVar237 * auVar113._20_4_;
  auVar106._24_4_ = fVar238 * auVar113._24_4_;
  auVar106._28_4_ = auVar113._28_4_;
  auVar92 = vfmadd231ps_fma(auVar115,auVar114,auVar105);
  auVar89 = vfmadd231ps_fma(auVar118,auVar114,auVar110);
  auVar101 = vfmadd231ps_fma(auVar106,auVar114,auVar112);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar124,auVar107);
  auVar89 = vfmadd231ps_fma(ZEXT1632(auVar89),auVar124,auVar109);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar124,auVar111);
  auVar120._8_4_ = 0x7fffffff;
  auVar120._0_8_ = 0x7fffffff7fffffff;
  auVar120._12_4_ = 0x7fffffff;
  auVar120._16_4_ = 0x7fffffff;
  auVar120._20_4_ = 0x7fffffff;
  auVar120._24_4_ = 0x7fffffff;
  auVar120._28_4_ = 0x7fffffff;
  auVar122._8_4_ = 0x219392ef;
  auVar122._0_8_ = 0x219392ef219392ef;
  auVar122._12_4_ = 0x219392ef;
  auVar122._16_4_ = 0x219392ef;
  auVar122._20_4_ = 0x219392ef;
  auVar122._24_4_ = 0x219392ef;
  auVar122._28_4_ = 0x219392ef;
  auVar107 = vandps_avx(ZEXT1632(auVar19),auVar120);
  uVar83 = vcmpps_avx512vl(auVar107,auVar122,1);
  bVar87 = (bool)((byte)uVar83 & 1);
  auVar102._0_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar19._0_4_;
  bVar87 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar19._4_4_;
  bVar87 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar19._8_4_;
  bVar87 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar19._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar83 >> 7) * 0x219392ef;
  auVar107 = vandps_avx(ZEXT1632(auVar20),auVar120);
  uVar83 = vcmpps_avx512vl(auVar107,auVar122,1);
  bVar87 = (bool)((byte)uVar83 & 1);
  auVar103._0_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar20._0_4_;
  bVar87 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar103._4_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar20._4_4_;
  bVar87 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar103._8_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar20._8_4_;
  bVar87 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar103._12_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar20._12_4_;
  auVar103._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * 0x219392ef;
  auVar103._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * 0x219392ef;
  auVar103._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * 0x219392ef;
  auVar103._28_4_ = (uint)(byte)(uVar83 >> 7) * 0x219392ef;
  auVar107 = vandps_avx(ZEXT1632(auVar91),auVar120);
  uVar83 = vcmpps_avx512vl(auVar107,auVar122,1);
  bVar87 = (bool)((byte)uVar83 & 1);
  auVar107._0_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar91._0_4_;
  bVar87 = (bool)((byte)(uVar83 >> 1) & 1);
  auVar107._4_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar91._4_4_;
  bVar87 = (bool)((byte)(uVar83 >> 2) & 1);
  auVar107._8_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar91._8_4_;
  bVar87 = (bool)((byte)(uVar83 >> 3) & 1);
  auVar107._12_4_ = (uint)bVar87 * 0x219392ef | (uint)!bVar87 * auVar91._12_4_;
  auVar107._16_4_ = (uint)((byte)(uVar83 >> 4) & 1) * 0x219392ef;
  auVar107._20_4_ = (uint)((byte)(uVar83 >> 5) & 1) * 0x219392ef;
  auVar107._24_4_ = (uint)((byte)(uVar83 >> 6) & 1) * 0x219392ef;
  auVar107._28_4_ = (uint)(byte)(uVar83 >> 7) * 0x219392ef;
  auVar105 = vrcp14ps_avx512vl(auVar102);
  auVar121._8_4_ = 0x3f800000;
  auVar121._0_8_ = 0x3f8000003f800000;
  auVar121._12_4_ = 0x3f800000;
  auVar121._16_4_ = 0x3f800000;
  auVar121._20_4_ = 0x3f800000;
  auVar121._24_4_ = 0x3f800000;
  auVar121._28_4_ = 0x3f800000;
  auVar19 = vfnmadd213ps_fma(auVar102,auVar105,auVar121);
  auVar19 = vfmadd132ps_fma(ZEXT1632(auVar19),auVar105,auVar105);
  auVar105 = vrcp14ps_avx512vl(auVar103);
  auVar20 = vfnmadd213ps_fma(auVar103,auVar105,auVar121);
  auVar20 = vfmadd132ps_fma(ZEXT1632(auVar20),auVar105,auVar105);
  auVar105 = vrcp14ps_avx512vl(auVar107);
  auVar91 = vfnmadd213ps_fma(auVar107,auVar105,auVar121);
  auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar105,auVar105);
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 7 + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar107 = vsubps_avx(auVar107,ZEXT1632(auVar92));
  auVar111._4_4_ = auVar19._4_4_ * auVar107._4_4_;
  auVar111._0_4_ = auVar19._0_4_ * auVar107._0_4_;
  auVar111._8_4_ = auVar19._8_4_ * auVar107._8_4_;
  auVar111._12_4_ = auVar19._12_4_ * auVar107._12_4_;
  auVar111._16_4_ = auVar107._16_4_ * 0.0;
  auVar111._20_4_ = auVar107._20_4_ * 0.0;
  auVar111._24_4_ = auVar107._24_4_ * 0.0;
  auVar111._28_4_ = auVar107._28_4_;
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 9 + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar107 = vsubps_avx(auVar107,ZEXT1632(auVar92));
  auVar119._0_4_ = auVar19._0_4_ * auVar107._0_4_;
  auVar119._4_4_ = auVar19._4_4_ * auVar107._4_4_;
  auVar119._8_4_ = auVar19._8_4_ * auVar107._8_4_;
  auVar119._12_4_ = auVar19._12_4_ * auVar107._12_4_;
  auVar119._16_4_ = auVar107._16_4_ * 0.0;
  auVar119._20_4_ = auVar107._20_4_ * 0.0;
  auVar119._24_4_ = auVar107._24_4_ * 0.0;
  auVar119._28_4_ = 0;
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0xe + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar107 = vsubps_avx(auVar107,ZEXT1632(auVar89));
  auVar112._4_4_ = auVar20._4_4_ * auVar107._4_4_;
  auVar112._0_4_ = auVar20._0_4_ * auVar107._0_4_;
  auVar112._8_4_ = auVar20._8_4_ * auVar107._8_4_;
  auVar112._12_4_ = auVar20._12_4_ * auVar107._12_4_;
  auVar112._16_4_ = auVar107._16_4_ * 0.0;
  auVar112._20_4_ = auVar107._20_4_ * 0.0;
  auVar112._24_4_ = auVar107._24_4_ * 0.0;
  auVar112._28_4_ = auVar107._28_4_;
  auVar106 = vpbroadcastd_avx512vl();
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar107 = vsubps_avx(auVar107,ZEXT1632(auVar89));
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0x15 + 6));
  auVar117._0_4_ = auVar20._0_4_ * auVar107._0_4_;
  auVar117._4_4_ = auVar20._4_4_ * auVar107._4_4_;
  auVar117._8_4_ = auVar20._8_4_ * auVar107._8_4_;
  auVar117._12_4_ = auVar20._12_4_ * auVar107._12_4_;
  auVar117._16_4_ = auVar107._16_4_ * 0.0;
  auVar117._20_4_ = auVar107._20_4_ * 0.0;
  auVar117._24_4_ = auVar107._24_4_ * 0.0;
  auVar117._28_4_ = 0;
  auVar107 = vcvtdq2ps_avx(auVar105);
  auVar107 = vsubps_avx(auVar107,ZEXT1632(auVar101));
  auVar113._4_4_ = auVar107._4_4_ * auVar91._4_4_;
  auVar113._0_4_ = auVar107._0_4_ * auVar91._0_4_;
  auVar113._8_4_ = auVar107._8_4_ * auVar91._8_4_;
  auVar113._12_4_ = auVar107._12_4_ * auVar91._12_4_;
  auVar113._16_4_ = auVar107._16_4_ * 0.0;
  auVar113._20_4_ = auVar107._20_4_ * 0.0;
  auVar113._24_4_ = auVar107._24_4_ * 0.0;
  auVar113._28_4_ = auVar107._28_4_;
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0x17 + 6));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar107 = vsubps_avx(auVar107,ZEXT1632(auVar101));
  auVar116._0_4_ = auVar91._0_4_ * auVar107._0_4_;
  auVar116._4_4_ = auVar91._4_4_ * auVar107._4_4_;
  auVar116._8_4_ = auVar91._8_4_ * auVar107._8_4_;
  auVar116._12_4_ = auVar91._12_4_ * auVar107._12_4_;
  auVar116._16_4_ = auVar107._16_4_ * 0.0;
  auVar116._20_4_ = auVar107._20_4_ * 0.0;
  auVar116._24_4_ = auVar107._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar107 = vpminsd_avx2(auVar111,auVar119);
  auVar105 = vpminsd_avx2(auVar112,auVar117);
  auVar107 = vmaxps_avx(auVar107,auVar105);
  auVar105 = vpminsd_avx2(auVar113,auVar116);
  uVar186 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar108._4_4_ = uVar186;
  auVar108._0_4_ = uVar186;
  auVar108._8_4_ = uVar186;
  auVar108._12_4_ = uVar186;
  auVar108._16_4_ = uVar186;
  auVar108._20_4_ = uVar186;
  auVar108._24_4_ = uVar186;
  auVar108._28_4_ = uVar186;
  auVar105 = vmaxps_avx512vl(auVar105,auVar108);
  auVar107 = vmaxps_avx(auVar107,auVar105);
  auVar105._8_4_ = 0x3f7ffffa;
  auVar105._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar105._12_4_ = 0x3f7ffffa;
  auVar105._16_4_ = 0x3f7ffffa;
  auVar105._20_4_ = 0x3f7ffffa;
  auVar105._24_4_ = 0x3f7ffffa;
  auVar105._28_4_ = 0x3f7ffffa;
  local_640 = vmulps_avx512vl(auVar107,auVar105);
  auVar107 = vpmaxsd_avx2(auVar111,auVar119);
  auVar105 = vpmaxsd_avx2(auVar112,auVar117);
  auVar107 = vminps_avx(auVar107,auVar105);
  auVar105 = vpmaxsd_avx2(auVar113,auVar116);
  uVar186 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar109._4_4_ = uVar186;
  auVar109._0_4_ = uVar186;
  auVar109._8_4_ = uVar186;
  auVar109._12_4_ = uVar186;
  auVar109._16_4_ = uVar186;
  auVar109._20_4_ = uVar186;
  auVar109._24_4_ = uVar186;
  auVar109._28_4_ = uVar186;
  auVar105 = vminps_avx512vl(auVar105,auVar109);
  auVar107 = vminps_avx(auVar107,auVar105);
  auVar110._8_4_ = 0x3f800003;
  auVar110._0_8_ = 0x3f8000033f800003;
  auVar110._12_4_ = 0x3f800003;
  auVar110._16_4_ = 0x3f800003;
  auVar110._20_4_ = 0x3f800003;
  auVar110._24_4_ = 0x3f800003;
  auVar110._28_4_ = 0x3f800003;
  auVar107 = vmulps_avx512vl(auVar107,auVar110);
  uVar23 = vcmpps_avx512vl(local_640,auVar107,2);
  uVar26 = vpcmpgtd_avx512vl(auVar106,_DAT_01fb4ba0);
  local_a08 = CONCAT44((int)((ulong)in_R10 >> 0x20),(uint)(byte)((byte)uVar23 & (byte)uVar26));
  local_a18 = (undefined1 (*) [32])local_240;
  auVar179 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_4c0 = vmovdqa64_avx512f(auVar179);
  local_a10 = prim;
LAB_01aa4290:
  if (local_a08 == 0) {
    return;
  }
  lVar86 = 0;
  for (uVar83 = local_a08; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
    lVar86 = lVar86 + 1;
  }
  uVar1 = *(uint *)(prim + 2);
  uVar2 = *(uint *)(prim + lVar86 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar1].ptr;
  uVar83 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar2);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar86 = *(long *)&pGVar3[1].time_range.upper;
  auVar19 = *(undefined1 (*) [16])(lVar86 + (long)p_Var4 * uVar83);
  auVar20 = *(undefined1 (*) [16])(lVar86 + (uVar83 + 1) * (long)p_Var4);
  auVar91 = *(undefined1 (*) [16])(lVar86 + (uVar83 + 2) * (long)p_Var4);
  local_a08 = local_a08 - 1 & local_a08;
  auVar92 = *(undefined1 (*) [16])(lVar86 + (uVar83 + 3) * (long)p_Var4);
  if (local_a08 != 0) {
    uVar85 = local_a08 - 1 & local_a08;
    for (uVar83 = local_a08; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
    }
    if (uVar85 != 0) {
      for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar89 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar101 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  uVar186 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar96._4_4_ = uVar186;
  auVar96._0_4_ = uVar186;
  auVar96._8_4_ = uVar186;
  auVar96._12_4_ = uVar186;
  local_820._16_4_ = uVar186;
  local_820._0_16_ = auVar96;
  local_820._20_4_ = uVar186;
  local_820._24_4_ = uVar186;
  local_820._28_4_ = uVar186;
  auVar271 = ZEXT3264(local_820);
  uVar186 = *(undefined4 *)(ray + k * 4 + 0x140);
  auVar100._4_4_ = uVar186;
  auVar100._0_4_ = uVar186;
  auVar100._8_4_ = uVar186;
  auVar100._12_4_ = uVar186;
  local_6c0._16_4_ = uVar186;
  local_6c0._0_16_ = auVar100;
  local_6c0._20_4_ = uVar186;
  local_6c0._24_4_ = uVar186;
  local_6c0._28_4_ = uVar186;
  auVar89 = vunpcklps_avx(auVar96,auVar100);
  fVar254 = *(float *)(ray + k * 4 + 0x180);
  auVar262._4_4_ = fVar254;
  auVar262._0_4_ = fVar254;
  auVar262._8_4_ = fVar254;
  auVar262._12_4_ = fVar254;
  local_840._16_4_ = fVar254;
  local_840._0_16_ = auVar262;
  local_840._20_4_ = fVar254;
  local_840._24_4_ = fVar254;
  local_840._28_4_ = fVar254;
  local_9d0 = vinsertps_avx(auVar89,auVar262,0x28);
  auVar263 = ZEXT1664(local_9d0);
  auVar95._0_4_ = auVar19._0_4_ + auVar20._0_4_ + auVar91._0_4_ + auVar92._0_4_;
  auVar95._4_4_ = auVar19._4_4_ + auVar20._4_4_ + auVar91._4_4_ + auVar92._4_4_;
  auVar95._8_4_ = auVar19._8_4_ + auVar20._8_4_ + auVar91._8_4_ + auVar92._8_4_;
  auVar95._12_4_ = auVar19._12_4_ + auVar20._12_4_ + auVar91._12_4_ + auVar92._12_4_;
  auVar94._8_4_ = 0x3e800000;
  auVar94._0_8_ = 0x3e8000003e800000;
  auVar94._12_4_ = 0x3e800000;
  auVar89 = vmulps_avx512vl(auVar95,auVar94);
  auVar89 = vsubps_avx(auVar89,auVar101);
  auVar89 = vdpps_avx(auVar89,local_9d0,0x7f);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar265 = ZEXT1664(local_9e0);
  fVar162 = *(float *)(ray + k * 4 + 0xc0);
  auVar267 = ZEXT464((uint)fVar162);
  auVar98._4_12_ = ZEXT812(0) << 0x20;
  auVar98._0_4_ = local_9e0._0_4_;
  auVar90 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar98);
  auVar97 = vfnmadd213ss_fma(auVar90,local_9e0,ZEXT416(0x40000000));
  local_620 = auVar89._0_4_ * auVar90._0_4_ * auVar97._0_4_;
  auVar99._4_4_ = local_620;
  auVar99._0_4_ = local_620;
  auVar99._8_4_ = local_620;
  auVar99._12_4_ = local_620;
  fStack_7d0 = local_620;
  _local_7e0 = auVar99;
  fStack_7cc = local_620;
  fStack_7c8 = local_620;
  fStack_7c4 = local_620;
  auVar89 = vfmadd231ps_fma(auVar101,local_9d0,auVar99);
  auVar89 = vblendps_avx(auVar89,ZEXT816(0) << 0x40,8);
  auVar19 = vsubps_avx(auVar19,auVar89);
  auVar91 = vsubps_avx(auVar91,auVar89);
  auVar253 = ZEXT1664(auVar91);
  auVar20 = vsubps_avx(auVar20,auVar89);
  auVar258 = ZEXT1664(auVar20);
  auVar92 = vsubps_avx(auVar92,auVar89);
  auVar107 = vbroadcastss_avx512vl(auVar19);
  auVar127._8_4_ = 1;
  auVar127._0_8_ = 0x100000001;
  auVar127._12_4_ = 1;
  auVar127._16_4_ = 1;
  auVar127._20_4_ = 1;
  auVar127._24_4_ = 1;
  auVar127._28_4_ = 1;
  local_960 = ZEXT1632(auVar19);
  auVar105 = vpermps_avx512vl(auVar127,local_960);
  auVar128._8_4_ = 2;
  auVar128._0_8_ = 0x200000002;
  auVar128._12_4_ = 2;
  auVar128._16_4_ = 2;
  auVar128._20_4_ = 2;
  auVar128._24_4_ = 2;
  auVar128._28_4_ = 2;
  auVar108 = vpermps_avx512vl(auVar128,local_960);
  auVar129._8_4_ = 3;
  auVar129._0_8_ = 0x300000003;
  auVar129._12_4_ = 3;
  auVar129._16_4_ = 3;
  auVar129._20_4_ = 3;
  auVar129._24_4_ = 3;
  auVar129._28_4_ = 3;
  auVar109 = vpermps_avx512vl(auVar129,local_960);
  auVar110 = vbroadcastss_avx512vl(auVar20);
  local_9a0 = ZEXT1632(auVar20);
  auVar106 = vpermps_avx512vl(auVar127,local_9a0);
  auVar111 = vpermps_avx512vl(auVar128,local_9a0);
  auVar112 = vpermps_avx512vl(auVar129,local_9a0);
  auVar113 = vbroadcastss_avx512vl(auVar91);
  local_980 = ZEXT1632(auVar91);
  auVar114 = vpermps_avx512vl(auVar127,local_980);
  auVar115 = vpermps_avx512vl(auVar128,local_980);
  auVar104 = vpermps_avx512vl(auVar129,local_980);
  local_5a0 = vbroadcastss_avx512vl(auVar92);
  _local_9c0 = ZEXT1632(auVar92);
  local_5c0 = vpermps_avx2(auVar127,_local_9c0);
  local_580 = vpermps_avx512vl(auVar128,_local_9c0);
  local_600 = vpermps_avx2(auVar129,_local_9c0);
  auVar19 = vfmadd231ps_fma(ZEXT432((uint)(fVar254 * fVar254)),local_6c0,local_6c0);
  auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_820,local_820);
  local_560._0_4_ = auVar19._0_4_;
  local_560._4_4_ = local_560._0_4_;
  local_560._8_4_ = local_560._0_4_;
  local_560._12_4_ = local_560._0_4_;
  local_560._16_4_ = local_560._0_4_;
  local_560._20_4_ = local_560._0_4_;
  local_560._24_4_ = local_560._0_4_;
  local_560._28_4_ = local_560._0_4_;
  auVar126._8_4_ = 0x7fffffff;
  auVar126._0_8_ = 0x7fffffff7fffffff;
  auVar126._12_4_ = 0x7fffffff;
  auVar126._16_4_ = 0x7fffffff;
  auVar126._20_4_ = 0x7fffffff;
  auVar126._24_4_ = 0x7fffffff;
  auVar126._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_560,auVar126);
  local_940 = ZEXT416((uint)local_620);
  local_620 = fVar162 - local_620;
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  auVar179 = vpbroadcastd_avx512f();
  local_440 = vmovdqa64_avx512f(auVar179);
  uVar83 = 0;
  local_d1c = 1;
  auVar179 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar179);
  auVar19 = vsqrtss_avx(local_9e0,local_9e0);
  auVar20 = vsqrtss_avx(local_9e0,local_9e0);
  local_6f0 = ZEXT816(0x3f80000000000000);
  auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar274 = ZEXT3264(auVar102);
  auVar179 = ZEXT3264(_DAT_01f7b040);
  local_5e0 = local_580;
  do {
    auVar91 = vmovshdup_avx(local_6f0);
    auVar91 = vsubps_avx(auVar91,local_6f0);
    auVar170._0_4_ = auVar91._0_4_;
    fVar22 = auVar170._0_4_ * 0.04761905;
    uVar186 = local_6f0._0_4_;
    local_a60._4_4_ = uVar186;
    local_a60._0_4_ = uVar186;
    local_a60._8_4_ = uVar186;
    local_a60._12_4_ = uVar186;
    local_a60._16_4_ = uVar186;
    local_a60._20_4_ = uVar186;
    local_a60._24_4_ = uVar186;
    local_a60._28_4_ = uVar186;
    auVar170._4_4_ = auVar170._0_4_;
    auVar170._8_4_ = auVar170._0_4_;
    auVar170._12_4_ = auVar170._0_4_;
    auVar170._16_4_ = auVar170._0_4_;
    auVar170._20_4_ = auVar170._0_4_;
    auVar170._24_4_ = auVar170._0_4_;
    auVar170._28_4_ = auVar170._0_4_;
    auVar91 = vfmadd231ps_fma(local_a60,auVar170,auVar179._0_32_);
    auVar103 = vsubps_avx512vl(auVar274._0_32_,ZEXT1632(auVar91));
    fVar254 = auVar103._0_4_;
    fVar260 = auVar103._4_4_;
    fVar237 = auVar103._8_4_;
    fVar239 = auVar103._12_4_;
    fVar273 = auVar103._16_4_;
    fVar203 = auVar103._20_4_;
    fVar21 = auVar103._24_4_;
    fVar163 = fVar254 * fVar254 * fVar254;
    fVar180 = fVar260 * fVar260 * fVar260;
    auVar136._4_4_ = fVar180;
    auVar136._0_4_ = fVar163;
    fVar181 = fVar237 * fVar237 * fVar237;
    auVar136._8_4_ = fVar181;
    fVar182 = fVar239 * fVar239 * fVar239;
    auVar136._12_4_ = fVar182;
    fVar183 = fVar273 * fVar273 * fVar273;
    auVar136._16_4_ = fVar183;
    fVar184 = fVar203 * fVar203 * fVar203;
    auVar136._20_4_ = fVar184;
    fVar185 = fVar21 * fVar21 * fVar21;
    auVar136._24_4_ = fVar185;
    auVar136._28_4_ = auVar170._0_4_;
    auVar102 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar116 = vmulps_avx512vl(auVar136,auVar102);
    fVar259 = auVar91._0_4_;
    fVar261 = auVar91._4_4_;
    fVar238 = auVar91._8_4_;
    fVar221 = auVar91._12_4_;
    fVar202 = fVar259 * fVar259 * fVar259;
    fVar218 = fVar261 * fVar261 * fVar261;
    fVar219 = fVar238 * fVar238 * fVar238;
    fVar220 = fVar221 * fVar221 * fVar221;
    auVar264._0_4_ = fVar259 * fVar254;
    auVar264._4_4_ = fVar261 * fVar260;
    auVar264._8_4_ = fVar238 * fVar237;
    auVar264._12_4_ = fVar221 * fVar239;
    auVar264._16_4_ = fVar273 * 0.0;
    auVar264._20_4_ = fVar203 * 0.0;
    auVar264._28_36_ = auVar263._28_36_;
    auVar264._24_4_ = fVar21 * 0.0;
    auVar117 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar220,CONCAT48(fVar219,CONCAT44(fVar218,fVar202)
                                                                  ))),auVar102);
    fVar266 = auVar117._28_4_ + auVar170._0_4_;
    fVar248 = fVar266 + auVar267._28_4_ + auVar179._28_4_;
    auVar137._4_4_ = fVar180 * 0.16666667;
    auVar137._0_4_ = fVar163 * 0.16666667;
    auVar137._8_4_ = fVar181 * 0.16666667;
    auVar137._12_4_ = fVar182 * 0.16666667;
    auVar137._16_4_ = fVar183 * 0.16666667;
    auVar137._20_4_ = fVar184 * 0.16666667;
    auVar137._24_4_ = fVar185 * 0.16666667;
    auVar137._28_4_ = fVar266;
    auVar138._4_4_ =
         (auVar264._4_4_ * fVar260 * 12.0 + auVar264._4_4_ * fVar261 * 6.0 +
         fVar218 + auVar116._4_4_) * 0.16666667;
    auVar138._0_4_ =
         (auVar264._0_4_ * fVar254 * 12.0 + auVar264._0_4_ * fVar259 * 6.0 +
         fVar202 + auVar116._0_4_) * 0.16666667;
    auVar138._8_4_ =
         (auVar264._8_4_ * fVar237 * 12.0 + auVar264._8_4_ * fVar238 * 6.0 +
         fVar219 + auVar116._8_4_) * 0.16666667;
    auVar138._12_4_ =
         (auVar264._12_4_ * fVar239 * 12.0 + auVar264._12_4_ * fVar221 * 6.0 +
         fVar220 + auVar116._12_4_) * 0.16666667;
    auVar138._16_4_ =
         (auVar264._16_4_ * fVar273 * 12.0 + auVar264._16_4_ * 0.0 * 6.0 + auVar116._16_4_ + 0.0) *
         0.16666667;
    auVar138._20_4_ =
         (auVar264._20_4_ * fVar203 * 12.0 + auVar264._20_4_ * 0.0 * 6.0 + auVar116._20_4_ + 0.0) *
         0.16666667;
    auVar138._24_4_ =
         (auVar264._24_4_ * fVar21 * 12.0 + auVar264._24_4_ * 0.0 * 6.0 + auVar116._24_4_ + 0.0) *
         0.16666667;
    auVar138._28_4_ = auVar267._28_4_;
    auVar139._4_4_ =
         (auVar117._4_4_ + fVar180 +
         auVar264._4_4_ * fVar261 * 12.0 + auVar264._4_4_ * fVar260 * 6.0) * 0.16666667;
    auVar139._0_4_ =
         (auVar117._0_4_ + fVar163 +
         auVar264._0_4_ * fVar259 * 12.0 + auVar264._0_4_ * fVar254 * 6.0) * 0.16666667;
    auVar139._8_4_ =
         (auVar117._8_4_ + fVar181 +
         auVar264._8_4_ * fVar238 * 12.0 + auVar264._8_4_ * fVar237 * 6.0) * 0.16666667;
    auVar139._12_4_ =
         (auVar117._12_4_ + fVar182 +
         auVar264._12_4_ * fVar221 * 12.0 + auVar264._12_4_ * fVar239 * 6.0) * 0.16666667;
    auVar139._16_4_ =
         (auVar117._16_4_ + fVar183 + auVar264._16_4_ * 0.0 * 12.0 + auVar264._16_4_ * fVar273 * 6.0
         ) * 0.16666667;
    auVar139._20_4_ =
         (auVar117._20_4_ + fVar184 + auVar264._20_4_ * 0.0 * 12.0 + auVar264._20_4_ * fVar203 * 6.0
         ) * 0.16666667;
    auVar139._24_4_ =
         (auVar117._24_4_ + fVar185 + auVar264._24_4_ * 0.0 * 12.0 + auVar264._24_4_ * fVar21 * 6.0)
         * 0.16666667;
    auVar139._28_4_ = auVar271._28_4_;
    fVar202 = fVar202 * 0.16666667;
    fVar218 = fVar218 * 0.16666667;
    fVar219 = fVar219 * 0.16666667;
    fVar220 = fVar220 * 0.16666667;
    auVar140._28_4_ = fVar248;
    auVar140._0_28_ = ZEXT1628(CONCAT412(fVar220,CONCAT48(fVar219,CONCAT44(fVar218,fVar202))));
    auVar117 = vmulps_avx512vl(local_5a0,auVar140);
    auVar134._4_4_ = local_5c0._4_4_ * fVar218;
    auVar134._0_4_ = local_5c0._0_4_ * fVar202;
    auVar134._8_4_ = local_5c0._8_4_ * fVar219;
    auVar134._12_4_ = local_5c0._12_4_ * fVar220;
    auVar134._16_4_ = local_5c0._16_4_ * 0.0;
    auVar134._20_4_ = local_5c0._20_4_ * 0.0;
    auVar134._24_4_ = local_5c0._24_4_ * 0.0;
    auVar134._28_4_ = auVar265._28_4_ + auVar271._28_4_ + auVar116._28_4_ + 0.0;
    auVar116 = vmulps_avx512vl(local_5e0,auVar140);
    auVar141._4_4_ = local_600._4_4_ * fVar218;
    auVar141._0_4_ = local_600._0_4_ * fVar202;
    auVar141._8_4_ = local_600._8_4_ * fVar219;
    auVar141._12_4_ = local_600._12_4_ * fVar220;
    auVar141._16_4_ = local_600._16_4_ * 0.0;
    auVar141._20_4_ = local_600._20_4_ * 0.0;
    auVar141._24_4_ = local_600._24_4_ * 0.0;
    auVar141._28_4_ = fVar248;
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar139,auVar113);
    auVar118 = vfmadd231ps_avx512vl(auVar134,auVar139,auVar114);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar139,auVar115);
    auVar119 = vfmadd231ps_avx512vl(auVar141,auVar104,auVar139);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar138,auVar110);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar138,auVar106);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar138,auVar111);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar112,auVar138);
    auVar120 = vfmadd231ps_avx512vl(auVar117,auVar137,auVar107);
    auVar121 = vfmadd231ps_avx512vl(auVar118,auVar137,auVar105);
    auVar122 = vfmadd231ps_avx512vl(auVar116,auVar137,auVar108);
    auVar116 = vfmadd231ps_avx512vl(auVar119,auVar109,auVar137);
    auVar119 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar117 = vxorps_avx512vl(auVar103,auVar119);
    auVar118 = vxorps_avx512vl(ZEXT1632(auVar91),auVar119);
    auVar242._0_4_ = auVar118._0_4_ * fVar259;
    auVar242._4_4_ = auVar118._4_4_ * fVar261;
    auVar242._8_4_ = auVar118._8_4_ * fVar238;
    auVar242._12_4_ = auVar118._12_4_ * fVar221;
    auVar242._16_4_ = auVar118._16_4_ * 0.0;
    auVar242._20_4_ = auVar118._20_4_ * 0.0;
    auVar242._24_4_ = auVar118._24_4_ * 0.0;
    auVar242._28_4_ = 0;
    auVar123 = vmulps_avx512vl(auVar264._0_32_,auVar102);
    auVar102 = vsubps_avx(auVar242,auVar123);
    auVar144._4_4_ = auVar117._4_4_ * fVar260 * 0.5;
    auVar144._0_4_ = auVar117._0_4_ * fVar254 * 0.5;
    auVar144._8_4_ = auVar117._8_4_ * fVar237 * 0.5;
    auVar144._12_4_ = auVar117._12_4_ * fVar239 * 0.5;
    auVar144._16_4_ = auVar117._16_4_ * fVar273 * 0.5;
    auVar144._20_4_ = auVar117._20_4_ * fVar203 * 0.5;
    auVar144._24_4_ = auVar117._24_4_ * fVar21 * 0.5;
    auVar144._28_4_ = auVar103._28_4_;
    auVar145._4_4_ = auVar102._4_4_ * 0.5;
    auVar145._0_4_ = auVar102._0_4_ * 0.5;
    auVar145._8_4_ = auVar102._8_4_ * 0.5;
    auVar145._12_4_ = auVar102._12_4_ * 0.5;
    auVar145._16_4_ = auVar102._16_4_ * 0.5;
    auVar145._20_4_ = auVar102._20_4_ * 0.5;
    auVar145._24_4_ = auVar102._24_4_ * 0.5;
    auVar145._28_4_ = auVar102._28_4_;
    auVar40._4_4_ = (auVar123._4_4_ + fVar260 * fVar260) * 0.5;
    auVar40._0_4_ = (auVar123._0_4_ + fVar254 * fVar254) * 0.5;
    auVar40._8_4_ = (auVar123._8_4_ + fVar237 * fVar237) * 0.5;
    auVar40._12_4_ = (auVar123._12_4_ + fVar239 * fVar239) * 0.5;
    auVar40._16_4_ = (auVar123._16_4_ + fVar273 * fVar273) * 0.5;
    auVar40._20_4_ = (auVar123._20_4_ + fVar203 * fVar203) * 0.5;
    auVar40._24_4_ = (auVar123._24_4_ + fVar21 * fVar21) * 0.5;
    auVar40._28_4_ = auVar123._28_4_ + auVar253._28_4_;
    fVar254 = fVar259 * fVar259 * 0.5;
    fVar259 = fVar261 * fVar261 * 0.5;
    fVar260 = fVar238 * fVar238 * 0.5;
    fVar261 = fVar221 * fVar221 * 0.5;
    auVar41._28_4_ = auVar258._28_4_;
    auVar41._0_28_ = ZEXT1628(CONCAT412(fVar261,CONCAT48(fVar260,CONCAT44(fVar259,fVar254))));
    auVar102 = vmulps_avx512vl(local_5a0,auVar41);
    auVar42._4_4_ = local_5c0._4_4_ * fVar259;
    auVar42._0_4_ = local_5c0._0_4_ * fVar254;
    auVar42._8_4_ = local_5c0._8_4_ * fVar260;
    auVar42._12_4_ = local_5c0._12_4_ * fVar261;
    auVar42._16_4_ = local_5c0._16_4_ * 0.0;
    auVar42._20_4_ = local_5c0._20_4_ * 0.0;
    auVar42._24_4_ = local_5c0._24_4_ * 0.0;
    auVar42._28_4_ = auVar118._28_4_;
    auVar103 = vmulps_avx512vl(local_5e0,auVar41);
    auVar43._4_4_ = fVar259 * local_600._4_4_;
    auVar43._0_4_ = fVar254 * local_600._0_4_;
    auVar43._8_4_ = fVar260 * local_600._8_4_;
    auVar43._12_4_ = fVar261 * local_600._12_4_;
    auVar43._16_4_ = local_600._16_4_ * 0.0;
    auVar43._20_4_ = local_600._20_4_ * 0.0;
    auVar43._24_4_ = local_600._24_4_ * 0.0;
    auVar43._28_4_ = auVar258._28_4_;
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar40,auVar113);
    auVar117 = vfmadd231ps_avx512vl(auVar42,auVar40,auVar114);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar40,auVar115);
    auVar91 = vfmadd231ps_fma(auVar43,auVar104,auVar40);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar145,auVar110);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar145,auVar106);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar145,auVar111);
    auVar118 = vfmadd231ps_avx512vl(ZEXT1632(auVar91),auVar112,auVar145);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar144,auVar107);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar144,auVar105);
    auVar103 = vfmadd231ps_avx512vl(auVar103,auVar144,auVar108);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar109,auVar144);
    auVar44._4_4_ = auVar102._4_4_ * fVar22;
    auVar44._0_4_ = auVar102._0_4_ * fVar22;
    auVar44._8_4_ = auVar102._8_4_ * fVar22;
    auVar44._12_4_ = auVar102._12_4_ * fVar22;
    auVar44._16_4_ = auVar102._16_4_ * fVar22;
    auVar44._20_4_ = auVar102._20_4_ * fVar22;
    auVar44._24_4_ = auVar102._24_4_ * fVar22;
    auVar44._28_4_ = auVar104._28_4_;
    auVar271 = ZEXT3264(auVar44);
    auVar45._4_4_ = auVar117._4_4_ * fVar22;
    auVar45._0_4_ = auVar117._0_4_ * fVar22;
    auVar45._8_4_ = auVar117._8_4_ * fVar22;
    auVar45._12_4_ = auVar117._12_4_ * fVar22;
    auVar45._16_4_ = auVar117._16_4_ * fVar22;
    auVar45._20_4_ = auVar117._20_4_ * fVar22;
    auVar45._24_4_ = auVar117._24_4_ * fVar22;
    auVar45._28_4_ = 0x3e2aaaab;
    auVar46._4_4_ = auVar103._4_4_ * fVar22;
    auVar46._0_4_ = auVar103._0_4_ * fVar22;
    auVar46._8_4_ = auVar103._8_4_ * fVar22;
    auVar46._12_4_ = auVar103._12_4_ * fVar22;
    auVar46._16_4_ = auVar103._16_4_ * fVar22;
    auVar46._20_4_ = auVar103._20_4_ * fVar22;
    auVar46._24_4_ = auVar103._24_4_ * fVar22;
    auVar46._28_4_ = 0x40c00000;
    fVar254 = auVar118._0_4_ * fVar22;
    fVar259 = auVar118._4_4_ * fVar22;
    auVar47._4_4_ = fVar259;
    auVar47._0_4_ = fVar254;
    fVar260 = auVar118._8_4_ * fVar22;
    auVar47._8_4_ = fVar260;
    fVar261 = auVar118._12_4_ * fVar22;
    auVar47._12_4_ = fVar261;
    fVar237 = auVar118._16_4_ * fVar22;
    auVar47._16_4_ = fVar237;
    fVar238 = auVar118._20_4_ * fVar22;
    auVar47._20_4_ = fVar238;
    fVar239 = auVar118._24_4_ * fVar22;
    auVar47._24_4_ = fVar239;
    auVar47._28_4_ = fVar22;
    auVar91 = vxorps_avx512vl(auVar274._0_16_,auVar274._0_16_);
    auVar123 = vpermt2ps_avx512vl(auVar120,_DAT_01fb9fc0,ZEXT1632(auVar91));
    auVar263 = ZEXT3264(auVar123);
    auVar124 = vpermt2ps_avx512vl(auVar121,_DAT_01fb9fc0,ZEXT1632(auVar91));
    auVar265 = ZEXT3264(auVar124);
    auVar117 = ZEXT1632(auVar91);
    auVar125 = vpermt2ps_avx512vl(auVar122,_DAT_01fb9fc0,auVar117);
    auVar267 = ZEXT3264(auVar125);
    auVar243._0_4_ = fVar254 + auVar116._0_4_;
    auVar243._4_4_ = fVar259 + auVar116._4_4_;
    auVar243._8_4_ = fVar260 + auVar116._8_4_;
    auVar243._12_4_ = fVar261 + auVar116._12_4_;
    auVar243._16_4_ = fVar237 + auVar116._16_4_;
    auVar243._20_4_ = fVar238 + auVar116._20_4_;
    auVar243._24_4_ = fVar239 + auVar116._24_4_;
    auVar243._28_4_ = fVar22 + auVar116._28_4_;
    auVar102 = vmaxps_avx(auVar116,auVar243);
    auVar103 = vminps_avx(auVar116,auVar243);
    auVar126 = vpermt2ps_avx512vl(auVar116,_DAT_01fb9fc0,auVar117);
    auVar127 = vpermt2ps_avx512vl(auVar44,_DAT_01fb9fc0,auVar117);
    auVar128 = vpermt2ps_avx512vl(auVar45,_DAT_01fb9fc0,auVar117);
    auVar141 = ZEXT1632(auVar91);
    auVar129 = vpermt2ps_avx512vl(auVar46,_DAT_01fb9fc0,auVar141);
    auVar116 = vpermt2ps_avx512vl(auVar47,_DAT_01fb9fc0,auVar141);
    auVar130 = vsubps_avx512vl(auVar126,auVar116);
    auVar116 = vsubps_avx(auVar123,auVar120);
    auVar258 = ZEXT3264(auVar116);
    auVar117 = vsubps_avx(auVar124,auVar121);
    auVar253 = ZEXT3264(auVar117);
    auVar118 = vsubps_avx(auVar125,auVar122);
    auVar131 = vmulps_avx512vl(auVar117,auVar46);
    auVar131 = vfmsub231ps_avx512vl(auVar131,auVar45,auVar118);
    auVar132 = vmulps_avx512vl(auVar118,auVar44);
    auVar132 = vfmsub231ps_avx512vl(auVar132,auVar46,auVar116);
    auVar133 = vmulps_avx512vl(auVar116,auVar45);
    auVar133 = vfmsub231ps_avx512vl(auVar133,auVar44,auVar117);
    auVar133 = vmulps_avx512vl(auVar133,auVar133);
    auVar132 = vfmadd231ps_avx512vl(auVar133,auVar132,auVar132);
    auVar131 = vfmadd231ps_avx512vl(auVar132,auVar131,auVar131);
    auVar132 = vmulps_avx512vl(auVar118,auVar118);
    auVar132 = vfmadd231ps_avx512vl(auVar132,auVar117,auVar117);
    auVar133 = vfmadd231ps_avx512vl(auVar132,auVar116,auVar116);
    auVar132 = vrcp14ps_avx512vl(auVar133);
    auVar134 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar135 = vfnmadd213ps_avx512vl(auVar132,auVar133,auVar134);
    auVar132 = vfmadd132ps_avx512vl(auVar135,auVar132,auVar132);
    auVar131 = vmulps_avx512vl(auVar131,auVar132);
    auVar135 = vmulps_avx512vl(auVar117,auVar129);
    auVar135 = vfmsub231ps_avx512vl(auVar135,auVar128,auVar118);
    auVar136 = vmulps_avx512vl(auVar118,auVar127);
    auVar136 = vfmsub231ps_avx512vl(auVar136,auVar129,auVar116);
    auVar137 = vmulps_avx512vl(auVar116,auVar128);
    auVar137 = vfmsub231ps_avx512vl(auVar137,auVar127,auVar117);
    auVar137 = vmulps_avx512vl(auVar137,auVar137);
    auVar136 = vfmadd231ps_avx512vl(auVar137,auVar136,auVar136);
    auVar135 = vfmadd231ps_avx512vl(auVar136,auVar135,auVar135);
    auVar132 = vmulps_avx512vl(auVar135,auVar132);
    auVar131 = vmaxps_avx512vl(auVar131,auVar132);
    auVar131 = vsqrtps_avx512vl(auVar131);
    auVar132 = vmaxps_avx512vl(auVar130,auVar126);
    auVar102 = vmaxps_avx512vl(auVar102,auVar132);
    auVar135 = vaddps_avx512vl(auVar131,auVar102);
    auVar102 = vminps_avx512vl(auVar130,auVar126);
    auVar102 = vminps_avx(auVar103,auVar102);
    auVar102 = vsubps_avx512vl(auVar102,auVar131);
    auVar130._8_4_ = 0x3f800002;
    auVar130._0_8_ = 0x3f8000023f800002;
    auVar130._12_4_ = 0x3f800002;
    auVar130._16_4_ = 0x3f800002;
    auVar130._20_4_ = 0x3f800002;
    auVar130._24_4_ = 0x3f800002;
    auVar130._28_4_ = 0x3f800002;
    auVar103 = vmulps_avx512vl(auVar135,auVar130);
    auVar131._8_4_ = 0x3f7ffffc;
    auVar131._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar131._12_4_ = 0x3f7ffffc;
    auVar131._16_4_ = 0x3f7ffffc;
    auVar131._20_4_ = 0x3f7ffffc;
    auVar131._24_4_ = 0x3f7ffffc;
    auVar131._28_4_ = 0x3f7ffffc;
    auVar102 = vmulps_avx512vl(auVar102,auVar131);
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    auVar126 = vrsqrt14ps_avx512vl(auVar133);
    auVar132._8_4_ = 0xbf000000;
    auVar132._0_8_ = 0xbf000000bf000000;
    auVar132._12_4_ = 0xbf000000;
    auVar132._16_4_ = 0xbf000000;
    auVar132._20_4_ = 0xbf000000;
    auVar132._24_4_ = 0xbf000000;
    auVar132._28_4_ = 0xbf000000;
    auVar130 = vmulps_avx512vl(auVar133,auVar132);
    fVar254 = auVar126._0_4_;
    fVar259 = auVar126._4_4_;
    fVar260 = auVar126._8_4_;
    fVar261 = auVar126._12_4_;
    fVar237 = auVar126._16_4_;
    fVar238 = auVar126._20_4_;
    fVar239 = auVar126._24_4_;
    auVar48._4_4_ = fVar259 * fVar259 * fVar259 * auVar130._4_4_;
    auVar48._0_4_ = fVar254 * fVar254 * fVar254 * auVar130._0_4_;
    auVar48._8_4_ = fVar260 * fVar260 * fVar260 * auVar130._8_4_;
    auVar48._12_4_ = fVar261 * fVar261 * fVar261 * auVar130._12_4_;
    auVar48._16_4_ = fVar237 * fVar237 * fVar237 * auVar130._16_4_;
    auVar48._20_4_ = fVar238 * fVar238 * fVar238 * auVar130._20_4_;
    auVar48._24_4_ = fVar239 * fVar239 * fVar239 * auVar130._24_4_;
    auVar48._28_4_ = auVar135._28_4_;
    auVar133._8_4_ = 0x3fc00000;
    auVar133._0_8_ = 0x3fc000003fc00000;
    auVar133._12_4_ = 0x3fc00000;
    auVar133._16_4_ = 0x3fc00000;
    auVar133._20_4_ = 0x3fc00000;
    auVar133._24_4_ = 0x3fc00000;
    auVar133._28_4_ = 0x3fc00000;
    auVar126 = vfmadd231ps_avx512vl(auVar48,auVar126,auVar133);
    auVar130 = vmulps_avx512vl(auVar116,auVar126);
    auVar131 = vmulps_avx512vl(auVar117,auVar126);
    auVar132 = vmulps_avx512vl(auVar118,auVar126);
    auVar133 = vsubps_avx512vl(auVar141,auVar120);
    auVar136 = vsubps_avx512vl(auVar141,auVar121);
    auVar137 = vsubps_avx512vl(auVar141,auVar122);
    auVar135 = vmulps_avx512vl(local_840,auVar137);
    auVar135 = vfmadd231ps_avx512vl(auVar135,local_6c0,auVar136);
    auVar135 = vfmadd231ps_avx512vl(auVar135,local_820,auVar133);
    auVar138 = vmulps_avx512vl(auVar137,auVar137);
    auVar138 = vfmadd231ps_avx512vl(auVar138,auVar136,auVar136);
    auVar138 = vfmadd231ps_avx512vl(auVar138,auVar133,auVar133);
    auVar139 = vmulps_avx512vl(local_840,auVar132);
    auVar139 = vfmadd231ps_avx512vl(auVar139,auVar131,local_6c0);
    auVar139 = vfmadd231ps_avx512vl(auVar139,auVar130,local_820);
    auVar132 = vmulps_avx512vl(auVar137,auVar132);
    auVar131 = vfmadd231ps_avx512vl(auVar132,auVar136,auVar131);
    auVar130 = vfmadd231ps_avx512vl(auVar131,auVar133,auVar130);
    auVar131 = vmulps_avx512vl(auVar139,auVar139);
    auVar132 = vsubps_avx512vl(local_560,auVar131);
    auVar140 = vmulps_avx512vl(auVar139,auVar130);
    auVar135 = vsubps_avx512vl(auVar135,auVar140);
    auVar140 = vaddps_avx512vl(auVar135,auVar135);
    auVar135 = vmulps_avx512vl(auVar130,auVar130);
    local_a00 = vsubps_avx512vl(auVar138,auVar135);
    auVar103 = vsubps_avx512vl(local_a00,auVar103);
    auVar138 = vmulps_avx512vl(auVar140,auVar140);
    auVar135._8_4_ = 0x40800000;
    auVar135._0_8_ = 0x4080000040800000;
    auVar135._12_4_ = 0x40800000;
    auVar135._16_4_ = 0x40800000;
    auVar135._20_4_ = 0x40800000;
    auVar135._24_4_ = 0x40800000;
    auVar135._28_4_ = 0x40800000;
    _local_a80 = vmulps_avx512vl(auVar132,auVar135);
    auVar135 = vmulps_avx512vl(_local_a80,auVar103);
    auVar135 = vsubps_avx512vl(auVar138,auVar135);
    uVar85 = vcmpps_avx512vl(auVar135,auVar141,5);
    bVar78 = (byte)uVar85;
    if (bVar78 == 0) {
LAB_01aa5032:
      auVar274 = ZEXT3264(auVar134);
      auVar179 = ZEXT3264(_DAT_01f7b040);
    }
    else {
      local_7c0._0_32_ = auVar138;
      auVar135 = vsqrtps_avx512vl(auVar135);
      auVar141 = vaddps_avx512vl(auVar132,auVar132);
      local_aa0 = vrcp14ps_avx512vl(auVar141);
      auVar134 = vfnmadd213ps_avx512vl(local_aa0,auVar141,auVar134);
      auVar134 = vfmadd132ps_avx512vl(auVar134,local_aa0,local_aa0);
      _local_880 = vxorps_avx512vl(auVar140,auVar119);
      auVar119 = vsubps_avx512vl(_local_880,auVar135);
      local_860 = vmulps_avx512vl(auVar119,auVar134);
      auVar119 = vsubps_avx512vl(auVar135,auVar140);
      local_8a0 = vmulps_avx512vl(auVar119,auVar134);
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar135 = vblendmps_avx512vl(auVar119,local_860);
      auVar142._0_4_ =
           (uint)(bVar78 & 1) * auVar135._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar119._0_4_;
      bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar142._4_4_ = (uint)bVar87 * auVar135._4_4_ | (uint)!bVar87 * auVar119._4_4_;
      bVar87 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar142._8_4_ = (uint)bVar87 * auVar135._8_4_ | (uint)!bVar87 * auVar119._8_4_;
      bVar87 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar142._12_4_ = (uint)bVar87 * auVar135._12_4_ | (uint)!bVar87 * auVar119._12_4_;
      bVar87 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar142._16_4_ = (uint)bVar87 * auVar135._16_4_ | (uint)!bVar87 * auVar119._16_4_;
      bVar87 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar142._20_4_ = (uint)bVar87 * auVar135._20_4_ | (uint)!bVar87 * auVar119._20_4_;
      bVar87 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar142._24_4_ = (uint)bVar87 * auVar135._24_4_ | (uint)!bVar87 * auVar119._24_4_;
      bVar87 = SUB81(uVar85 >> 7,0);
      auVar142._28_4_ = (uint)bVar87 * auVar135._28_4_ | (uint)!bVar87 * auVar119._28_4_;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar135 = vblendmps_avx512vl(auVar119,local_8a0);
      auVar143._0_4_ =
           (uint)(bVar78 & 1) * auVar135._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar119._0_4_;
      bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
      auVar143._4_4_ = (uint)bVar87 * auVar135._4_4_ | (uint)!bVar87 * auVar119._4_4_;
      bVar87 = (bool)((byte)(uVar85 >> 2) & 1);
      auVar143._8_4_ = (uint)bVar87 * auVar135._8_4_ | (uint)!bVar87 * auVar119._8_4_;
      bVar87 = (bool)((byte)(uVar85 >> 3) & 1);
      auVar143._12_4_ = (uint)bVar87 * auVar135._12_4_ | (uint)!bVar87 * auVar119._12_4_;
      bVar87 = (bool)((byte)(uVar85 >> 4) & 1);
      auVar143._16_4_ = (uint)bVar87 * auVar135._16_4_ | (uint)!bVar87 * auVar119._16_4_;
      bVar87 = (bool)((byte)(uVar85 >> 5) & 1);
      auVar143._20_4_ = (uint)bVar87 * auVar135._20_4_ | (uint)!bVar87 * auVar119._20_4_;
      bVar87 = (bool)((byte)(uVar85 >> 6) & 1);
      auVar143._24_4_ = (uint)bVar87 * auVar135._24_4_ | (uint)!bVar87 * auVar119._24_4_;
      bVar87 = SUB81(uVar85 >> 7,0);
      auVar143._28_4_ = (uint)bVar87 * auVar135._28_4_ | (uint)!bVar87 * auVar119._28_4_;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar131,auVar119);
      local_8c0 = vmaxps_avx512vl(local_580,auVar119);
      auVar34._8_4_ = 0x36000000;
      auVar34._0_8_ = 0x3600000036000000;
      auVar34._12_4_ = 0x36000000;
      auVar34._16_4_ = 0x36000000;
      auVar34._20_4_ = 0x36000000;
      auVar34._24_4_ = 0x36000000;
      auVar34._28_4_ = 0x36000000;
      local_8e0 = vmulps_avx512vl(local_8c0,auVar34);
      vandps_avx512vl(auVar132,auVar119);
      uVar24 = vcmpps_avx512vl(local_8e0,local_8e0,1);
      uVar85 = uVar85 & uVar24;
      bVar84 = (byte)uVar85;
      if (bVar84 != 0) {
        uVar24 = vcmpps_avx512vl(auVar103,_DAT_01f7b000,2);
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar131 = vblendmps_avx512vl(auVar103,auVar119);
        bVar82 = (byte)uVar24;
        uVar88 = (uint)(bVar82 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar82 & 1) * local_8e0._0_4_;
        bVar87 = (bool)((byte)(uVar24 >> 1) & 1);
        uVar155 = (uint)bVar87 * auVar131._4_4_ | (uint)!bVar87 * local_8e0._4_4_;
        bVar87 = (bool)((byte)(uVar24 >> 2) & 1);
        uVar156 = (uint)bVar87 * auVar131._8_4_ | (uint)!bVar87 * local_8e0._8_4_;
        bVar87 = (bool)((byte)(uVar24 >> 3) & 1);
        uVar157 = (uint)bVar87 * auVar131._12_4_ | (uint)!bVar87 * local_8e0._12_4_;
        bVar87 = (bool)((byte)(uVar24 >> 4) & 1);
        uVar158 = (uint)bVar87 * auVar131._16_4_ | (uint)!bVar87 * local_8e0._16_4_;
        bVar87 = (bool)((byte)(uVar24 >> 5) & 1);
        uVar159 = (uint)bVar87 * auVar131._20_4_ | (uint)!bVar87 * local_8e0._20_4_;
        bVar87 = (bool)((byte)(uVar24 >> 6) & 1);
        uVar160 = (uint)bVar87 * auVar131._24_4_ | (uint)!bVar87 * local_8e0._24_4_;
        bVar87 = SUB81(uVar24 >> 7,0);
        uVar161 = (uint)bVar87 * auVar131._28_4_ | (uint)!bVar87 * local_8e0._28_4_;
        auVar142._0_4_ = (bVar84 & 1) * uVar88 | !(bool)(bVar84 & 1) * auVar142._0_4_;
        bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar142._4_4_ = bVar87 * uVar155 | !bVar87 * auVar142._4_4_;
        bVar87 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar142._8_4_ = bVar87 * uVar156 | !bVar87 * auVar142._8_4_;
        bVar87 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar142._12_4_ = bVar87 * uVar157 | !bVar87 * auVar142._12_4_;
        bVar87 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar142._16_4_ = bVar87 * uVar158 | !bVar87 * auVar142._16_4_;
        bVar87 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar142._20_4_ = bVar87 * uVar159 | !bVar87 * auVar142._20_4_;
        bVar87 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar142._24_4_ = bVar87 * uVar160 | !bVar87 * auVar142._24_4_;
        bVar87 = SUB81(uVar85 >> 7,0);
        auVar142._28_4_ = bVar87 * uVar161 | !bVar87 * auVar142._28_4_;
        auVar103 = vblendmps_avx512vl(auVar119,auVar103);
        bVar87 = (bool)((byte)(uVar24 >> 1) & 1);
        bVar7 = (bool)((byte)(uVar24 >> 2) & 1);
        bVar8 = (bool)((byte)(uVar24 >> 3) & 1);
        bVar9 = (bool)((byte)(uVar24 >> 4) & 1);
        bVar10 = (bool)((byte)(uVar24 >> 5) & 1);
        bVar11 = (bool)((byte)(uVar24 >> 6) & 1);
        bVar12 = SUB81(uVar24 >> 7,0);
        auVar143._0_4_ =
             (uint)(bVar84 & 1) *
             ((uint)(bVar82 & 1) * auVar103._0_4_ | !(bool)(bVar82 & 1) * uVar88) |
             !(bool)(bVar84 & 1) * auVar143._0_4_;
        bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
        auVar143._4_4_ =
             (uint)bVar6 * ((uint)bVar87 * auVar103._4_4_ | !bVar87 * uVar155) |
             !bVar6 * auVar143._4_4_;
        bVar87 = (bool)((byte)(uVar85 >> 2) & 1);
        auVar143._8_4_ =
             (uint)bVar87 * ((uint)bVar7 * auVar103._8_4_ | !bVar7 * uVar156) |
             !bVar87 * auVar143._8_4_;
        bVar87 = (bool)((byte)(uVar85 >> 3) & 1);
        auVar143._12_4_ =
             (uint)bVar87 * ((uint)bVar8 * auVar103._12_4_ | !bVar8 * uVar157) |
             !bVar87 * auVar143._12_4_;
        bVar87 = (bool)((byte)(uVar85 >> 4) & 1);
        auVar143._16_4_ =
             (uint)bVar87 * ((uint)bVar9 * auVar103._16_4_ | !bVar9 * uVar158) |
             !bVar87 * auVar143._16_4_;
        bVar87 = (bool)((byte)(uVar85 >> 5) & 1);
        auVar143._20_4_ =
             (uint)bVar87 * ((uint)bVar10 * auVar103._20_4_ | !bVar10 * uVar159) |
             !bVar87 * auVar143._20_4_;
        bVar87 = (bool)((byte)(uVar85 >> 6) & 1);
        auVar143._24_4_ =
             (uint)bVar87 * ((uint)bVar11 * auVar103._24_4_ | !bVar11 * uVar160) |
             !bVar87 * auVar143._24_4_;
        bVar87 = SUB81(uVar85 >> 7,0);
        auVar143._28_4_ =
             (uint)bVar87 * ((uint)bVar12 * auVar103._28_4_ | !bVar12 * uVar161) |
             !bVar87 * auVar143._28_4_;
        bVar78 = (~bVar84 | bVar82) & bVar78;
      }
      if ((bVar78 & 0x7f) == 0) {
        auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar274 = ZEXT3264(auVar102);
        auVar179 = ZEXT3264(_DAT_01f7b040);
      }
      else {
        auVar103 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar119 = vxorps_avx512vl(auVar129,auVar103);
        auVar127 = vxorps_avx512vl(auVar127,auVar103);
        auVar179 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
        auVar128 = vxorps_avx512vl(auVar128,auVar103);
        auVar91 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                                 ZEXT416((uint)local_940._0_4_));
        auVar129 = vbroadcastss_avx512vl(auVar91);
        auVar129 = vminps_avx512vl(auVar129,auVar143);
        auVar77._4_4_ = fStack_61c;
        auVar77._0_4_ = local_620;
        auVar77._8_4_ = fStack_618;
        auVar77._12_4_ = fStack_614;
        auVar77._16_4_ = fStack_610;
        auVar77._20_4_ = fStack_60c;
        auVar77._24_4_ = fStack_608;
        auVar77._28_4_ = fStack_604;
        auVar131 = vmaxps_avx512vl(auVar77,auVar142);
        auVar132 = vmulps_avx512vl(auVar46,auVar137);
        auVar132 = vfmadd213ps_avx512vl(auVar136,auVar45,auVar132);
        auVar91 = vfmadd213ps_fma(auVar133,auVar44,auVar132);
        auVar132 = vmulps_avx512vl(local_840,auVar46);
        auVar132 = vfmadd231ps_avx512vl(auVar132,local_6c0,auVar45);
        auVar132 = vfmadd231ps_avx512vl(auVar132,local_820,auVar44);
        auVar133 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar132,auVar133);
        auVar135 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar23 = vcmpps_avx512vl(auVar133,auVar135,1);
        auVar136 = vxorps_avx512vl(ZEXT1632(auVar91),auVar103);
        auVar137 = vrcp14ps_avx512vl(auVar132);
        auVar144 = vxorps_avx512vl(auVar132,auVar103);
        auVar134 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar145 = vfnmadd213ps_avx512vl(auVar137,auVar132,auVar134);
        auVar91 = vfmadd132ps_fma(auVar145,auVar137,auVar137);
        fVar254 = auVar91._0_4_ * auVar136._0_4_;
        fVar259 = auVar91._4_4_ * auVar136._4_4_;
        auVar49._4_4_ = fVar259;
        auVar49._0_4_ = fVar254;
        fVar260 = auVar91._8_4_ * auVar136._8_4_;
        auVar49._8_4_ = fVar260;
        fVar261 = auVar91._12_4_ * auVar136._12_4_;
        auVar49._12_4_ = fVar261;
        fVar237 = auVar136._16_4_ * 0.0;
        auVar49._16_4_ = fVar237;
        fVar238 = auVar136._20_4_ * 0.0;
        auVar49._20_4_ = fVar238;
        fVar239 = auVar136._24_4_ * 0.0;
        auVar49._24_4_ = fVar239;
        auVar49._28_4_ = auVar136._28_4_;
        uVar26 = vcmpps_avx512vl(auVar132,auVar144,1);
        bVar84 = (byte)uVar23 | (byte)uVar26;
        auVar272._8_4_ = 0xff800000;
        auVar272._0_8_ = 0xff800000ff800000;
        auVar272._12_4_ = 0xff800000;
        auVar272._16_4_ = 0xff800000;
        auVar272._20_4_ = 0xff800000;
        auVar272._24_4_ = 0xff800000;
        auVar272._28_4_ = 0xff800000;
        auVar145 = vblendmps_avx512vl(auVar49,auVar272);
        auVar146._0_4_ =
             (uint)(bVar84 & 1) * auVar145._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar137._0_4_;
        bVar87 = (bool)(bVar84 >> 1 & 1);
        auVar146._4_4_ = (uint)bVar87 * auVar145._4_4_ | (uint)!bVar87 * auVar137._4_4_;
        bVar87 = (bool)(bVar84 >> 2 & 1);
        auVar146._8_4_ = (uint)bVar87 * auVar145._8_4_ | (uint)!bVar87 * auVar137._8_4_;
        bVar87 = (bool)(bVar84 >> 3 & 1);
        auVar146._12_4_ = (uint)bVar87 * auVar145._12_4_ | (uint)!bVar87 * auVar137._12_4_;
        bVar87 = (bool)(bVar84 >> 4 & 1);
        auVar146._16_4_ = (uint)bVar87 * auVar145._16_4_ | (uint)!bVar87 * auVar137._16_4_;
        bVar87 = (bool)(bVar84 >> 5 & 1);
        auVar146._20_4_ = (uint)bVar87 * auVar145._20_4_ | (uint)!bVar87 * auVar137._20_4_;
        bVar87 = (bool)(bVar84 >> 6 & 1);
        auVar146._24_4_ = (uint)bVar87 * auVar145._24_4_ | (uint)!bVar87 * auVar137._24_4_;
        auVar146._28_4_ =
             (uint)(bVar84 >> 7) * auVar145._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar137._28_4_;
        auVar131 = vmaxps_avx512vl(auVar131,auVar146);
        auVar271 = ZEXT3264(auVar131);
        uVar26 = vcmpps_avx512vl(auVar132,auVar144,6);
        bVar84 = (byte)uVar23 | (byte)uVar26;
        auVar132 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar147._0_4_ =
             (uint)(bVar84 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar84 & 1) * (int)fVar254;
        bVar87 = (bool)(bVar84 >> 1 & 1);
        auVar147._4_4_ = (uint)bVar87 * auVar132._4_4_ | (uint)!bVar87 * (int)fVar259;
        bVar87 = (bool)(bVar84 >> 2 & 1);
        auVar147._8_4_ = (uint)bVar87 * auVar132._8_4_ | (uint)!bVar87 * (int)fVar260;
        bVar87 = (bool)(bVar84 >> 3 & 1);
        auVar147._12_4_ = (uint)bVar87 * auVar132._12_4_ | (uint)!bVar87 * (int)fVar261;
        bVar87 = (bool)(bVar84 >> 4 & 1);
        auVar147._16_4_ = (uint)bVar87 * auVar132._16_4_ | (uint)!bVar87 * (int)fVar237;
        bVar87 = (bool)(bVar84 >> 5 & 1);
        auVar147._20_4_ = (uint)bVar87 * auVar132._20_4_ | (uint)!bVar87 * (int)fVar238;
        bVar87 = (bool)(bVar84 >> 6 & 1);
        auVar147._24_4_ = (uint)bVar87 * auVar132._24_4_ | (uint)!bVar87 * (int)fVar239;
        auVar147._28_4_ =
             (uint)(bVar84 >> 7) * auVar132._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar136._28_4_;
        auVar136 = vminps_avx512vl(auVar129,auVar147);
        auVar91 = vxorps_avx512vl(auVar129._0_16_,auVar129._0_16_);
        auVar123 = vsubps_avx512vl(ZEXT1632(auVar91),auVar123);
        auVar124 = vsubps_avx512vl(ZEXT1632(auVar91),auVar124);
        auVar129 = ZEXT1632(auVar91);
        auVar125 = vsubps_avx512vl(auVar129,auVar125);
        auVar125 = vmulps_avx512vl(auVar125,auVar119);
        auVar124 = vfmadd231ps_avx512vl(auVar125,auVar128,auVar124);
        auVar123 = vfmadd231ps_avx512vl(auVar124,auVar127,auVar123);
        auVar119 = vmulps_avx512vl(local_840,auVar119);
        auVar119 = vfmadd231ps_avx512vl(auVar119,local_6c0,auVar128);
        auVar119 = vfmadd231ps_avx512vl(auVar119,local_820,auVar127);
        vandps_avx512vl(auVar119,auVar133);
        uVar23 = vcmpps_avx512vl(auVar119,auVar135,1);
        auVar123 = vxorps_avx512vl(auVar123,auVar103);
        auVar124 = vrcp14ps_avx512vl(auVar119);
        auVar103 = vxorps_avx512vl(auVar119,auVar103);
        auVar267 = ZEXT3264(auVar103);
        auVar125 = vfnmadd213ps_avx512vl(auVar124,auVar119,auVar134);
        auVar91 = vfmadd132ps_fma(auVar125,auVar124,auVar124);
        fVar254 = auVar91._0_4_ * auVar123._0_4_;
        fVar259 = auVar91._4_4_ * auVar123._4_4_;
        auVar50._4_4_ = fVar259;
        auVar50._0_4_ = fVar254;
        fVar260 = auVar91._8_4_ * auVar123._8_4_;
        auVar50._8_4_ = fVar260;
        fVar261 = auVar91._12_4_ * auVar123._12_4_;
        auVar50._12_4_ = fVar261;
        fVar237 = auVar123._16_4_ * 0.0;
        auVar50._16_4_ = fVar237;
        fVar238 = auVar123._20_4_ * 0.0;
        auVar50._20_4_ = fVar238;
        fVar239 = auVar123._24_4_ * 0.0;
        auVar50._24_4_ = fVar239;
        auVar50._28_4_ = auVar123._28_4_;
        uVar26 = vcmpps_avx512vl(auVar119,auVar103,1);
        bVar84 = (byte)uVar23 | (byte)uVar26;
        auVar125 = vblendmps_avx512vl(auVar50,auVar272);
        auVar148._0_4_ =
             (uint)(bVar84 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar84 & 1) * auVar124._0_4_;
        bVar87 = (bool)(bVar84 >> 1 & 1);
        auVar148._4_4_ = (uint)bVar87 * auVar125._4_4_ | (uint)!bVar87 * auVar124._4_4_;
        bVar87 = (bool)(bVar84 >> 2 & 1);
        auVar148._8_4_ = (uint)bVar87 * auVar125._8_4_ | (uint)!bVar87 * auVar124._8_4_;
        bVar87 = (bool)(bVar84 >> 3 & 1);
        auVar148._12_4_ = (uint)bVar87 * auVar125._12_4_ | (uint)!bVar87 * auVar124._12_4_;
        bVar87 = (bool)(bVar84 >> 4 & 1);
        auVar148._16_4_ = (uint)bVar87 * auVar125._16_4_ | (uint)!bVar87 * auVar124._16_4_;
        bVar87 = (bool)(bVar84 >> 5 & 1);
        auVar148._20_4_ = (uint)bVar87 * auVar125._20_4_ | (uint)!bVar87 * auVar124._20_4_;
        bVar87 = (bool)(bVar84 >> 6 & 1);
        auVar148._24_4_ = (uint)bVar87 * auVar125._24_4_ | (uint)!bVar87 * auVar124._24_4_;
        auVar148._28_4_ =
             (uint)(bVar84 >> 7) * auVar125._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar124._28_4_;
        local_800 = vmaxps_avx(auVar131,auVar148);
        auVar265 = ZEXT3264(local_800);
        uVar26 = vcmpps_avx512vl(auVar119,auVar103,6);
        bVar84 = (byte)uVar23 | (byte)uVar26;
        auVar149._0_4_ =
             (uint)(bVar84 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar84 & 1) * (int)fVar254;
        bVar87 = (bool)(bVar84 >> 1 & 1);
        auVar149._4_4_ = (uint)bVar87 * auVar132._4_4_ | (uint)!bVar87 * (int)fVar259;
        bVar87 = (bool)(bVar84 >> 2 & 1);
        auVar149._8_4_ = (uint)bVar87 * auVar132._8_4_ | (uint)!bVar87 * (int)fVar260;
        bVar87 = (bool)(bVar84 >> 3 & 1);
        auVar149._12_4_ = (uint)bVar87 * auVar132._12_4_ | (uint)!bVar87 * (int)fVar261;
        bVar87 = (bool)(bVar84 >> 4 & 1);
        auVar149._16_4_ = (uint)bVar87 * auVar132._16_4_ | (uint)!bVar87 * (int)fVar237;
        bVar87 = (bool)(bVar84 >> 5 & 1);
        auVar149._20_4_ = (uint)bVar87 * auVar132._20_4_ | (uint)!bVar87 * (int)fVar238;
        bVar87 = (bool)(bVar84 >> 6 & 1);
        auVar149._24_4_ = (uint)bVar87 * auVar132._24_4_ | (uint)!bVar87 * (int)fVar239;
        auVar149._28_4_ =
             (uint)(bVar84 >> 7) * auVar132._28_4_ | (uint)!(bool)(bVar84 >> 7) * auVar123._28_4_;
        local_680 = vminps_avx(auVar136,auVar149);
        auVar263 = ZEXT3264(local_680);
        uVar23 = vcmpps_avx512vl(local_800,local_680,2);
        bVar78 = bVar78 & 0x7f & (byte)uVar23;
        if (bVar78 == 0) goto LAB_01aa5032;
        auVar103 = vmaxps_avx512vl(auVar129,auVar102);
        auVar102 = vfmadd213ps_avx512vl(local_860,auVar139,auVar130);
        fVar254 = auVar126._0_4_;
        fVar259 = auVar126._4_4_;
        auVar51._4_4_ = fVar259 * auVar102._4_4_;
        auVar51._0_4_ = fVar254 * auVar102._0_4_;
        fVar260 = auVar126._8_4_;
        auVar51._8_4_ = fVar260 * auVar102._8_4_;
        fVar261 = auVar126._12_4_;
        auVar51._12_4_ = fVar261 * auVar102._12_4_;
        fVar237 = auVar126._16_4_;
        auVar51._16_4_ = fVar237 * auVar102._16_4_;
        fVar238 = auVar126._20_4_;
        auVar51._20_4_ = fVar238 * auVar102._20_4_;
        fVar239 = auVar126._24_4_;
        auVar51._24_4_ = fVar239 * auVar102._24_4_;
        auVar51._28_4_ = auVar102._28_4_;
        auVar102 = vfmadd213ps_avx512vl(local_8a0,auVar139,auVar130);
        auVar52._4_4_ = fVar259 * auVar102._4_4_;
        auVar52._0_4_ = fVar254 * auVar102._0_4_;
        auVar52._8_4_ = fVar260 * auVar102._8_4_;
        auVar52._12_4_ = fVar261 * auVar102._12_4_;
        auVar52._16_4_ = fVar237 * auVar102._16_4_;
        auVar52._20_4_ = fVar238 * auVar102._20_4_;
        auVar52._24_4_ = fVar239 * auVar102._24_4_;
        auVar52._28_4_ = auVar102._28_4_;
        auVar102 = vminps_avx512vl(auVar51,auVar134);
        auVar119 = ZEXT832(0) << 0x20;
        auVar102 = vmaxps_avx(auVar102,ZEXT832(0) << 0x20);
        auVar123 = vminps_avx512vl(auVar52,auVar134);
        auVar53._4_4_ = (auVar102._4_4_ + 1.0) * 0.125;
        auVar53._0_4_ = (auVar102._0_4_ + 0.0) * 0.125;
        auVar53._8_4_ = (auVar102._8_4_ + 2.0) * 0.125;
        auVar53._12_4_ = (auVar102._12_4_ + 3.0) * 0.125;
        auVar53._16_4_ = (auVar102._16_4_ + 4.0) * 0.125;
        auVar53._20_4_ = (auVar102._20_4_ + 5.0) * 0.125;
        auVar53._24_4_ = (auVar102._24_4_ + 6.0) * 0.125;
        auVar53._28_4_ = auVar102._28_4_ + 7.0;
        local_4e0 = vfmadd213ps_avx512vl(auVar53,auVar170,local_a60);
        auVar102 = vmaxps_avx(auVar123,ZEXT832(0) << 0x20);
        auVar54._4_4_ = (auVar102._4_4_ + 1.0) * 0.125;
        auVar54._0_4_ = (auVar102._0_4_ + 0.0) * 0.125;
        auVar54._8_4_ = (auVar102._8_4_ + 2.0) * 0.125;
        auVar54._12_4_ = (auVar102._12_4_ + 3.0) * 0.125;
        auVar54._16_4_ = (auVar102._16_4_ + 4.0) * 0.125;
        auVar54._20_4_ = (auVar102._20_4_ + 5.0) * 0.125;
        auVar54._24_4_ = (auVar102._24_4_ + 6.0) * 0.125;
        auVar54._28_4_ = auVar102._28_4_ + 7.0;
        local_500 = vfmadd213ps_avx512vl(auVar54,auVar170,local_a60);
        auVar55._4_4_ = auVar103._4_4_ * auVar103._4_4_;
        auVar55._0_4_ = auVar103._0_4_ * auVar103._0_4_;
        auVar55._8_4_ = auVar103._8_4_ * auVar103._8_4_;
        auVar55._12_4_ = auVar103._12_4_ * auVar103._12_4_;
        auVar55._16_4_ = auVar103._16_4_ * auVar103._16_4_;
        auVar55._20_4_ = auVar103._20_4_ * auVar103._20_4_;
        auVar55._24_4_ = auVar103._24_4_ * auVar103._24_4_;
        auVar55._28_4_ = auVar103._28_4_;
        auVar102 = vsubps_avx(local_a00,auVar55);
        auVar271 = ZEXT3264(auVar102);
        auVar56._4_4_ = auVar102._4_4_ * (float)local_a80._4_4_;
        auVar56._0_4_ = auVar102._0_4_ * (float)local_a80._0_4_;
        auVar56._8_4_ = auVar102._8_4_ * fStack_a78;
        auVar56._12_4_ = auVar102._12_4_ * fStack_a74;
        auVar56._16_4_ = auVar102._16_4_ * fStack_a70;
        auVar56._20_4_ = auVar102._20_4_ * fStack_a6c;
        auVar56._24_4_ = auVar102._24_4_ * fStack_a68;
        auVar56._28_4_ = auVar103._28_4_;
        auVar103 = vsubps_avx(auVar138,auVar56);
        uVar23 = vcmpps_avx512vl(auVar103,ZEXT832(0) << 0x20,5);
        bVar84 = (byte)uVar23;
        if (bVar84 == 0) {
          bVar84 = 0;
          auVar116 = ZEXT832(0) << 0x20;
          auVar117 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar123 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar265 = ZEXT864(0) << 0x20;
          auVar150._8_4_ = 0x7f800000;
          auVar150._0_8_ = 0x7f8000007f800000;
          auVar150._12_4_ = 0x7f800000;
          auVar150._16_4_ = 0x7f800000;
          auVar150._20_4_ = 0x7f800000;
          auVar150._24_4_ = 0x7f800000;
          auVar150._28_4_ = 0x7f800000;
          auVar151._8_4_ = 0xff800000;
          auVar151._0_8_ = 0xff800000ff800000;
          auVar151._12_4_ = 0xff800000;
          auVar151._16_4_ = 0xff800000;
          auVar151._20_4_ = 0xff800000;
          auVar151._24_4_ = 0xff800000;
          auVar151._28_4_ = 0xff800000;
        }
        else {
          auVar92 = vxorps_avx512vl(auVar133._0_16_,auVar133._0_16_);
          uVar85 = vcmpps_avx512vl(auVar103,auVar129,5);
          auVar103 = vsqrtps_avx(auVar103);
          auVar119 = vfnmadd213ps_avx512vl(auVar141,local_aa0,auVar134);
          auVar124 = vfmadd132ps_avx512vl(auVar119,local_aa0,local_aa0);
          auVar119 = vsubps_avx(_local_880,auVar103);
          auVar125 = vmulps_avx512vl(auVar119,auVar124);
          auVar103 = vsubps_avx512vl(auVar103,auVar140);
          auVar124 = vmulps_avx512vl(auVar103,auVar124);
          auVar103 = vfmadd213ps_avx512vl(auVar139,auVar125,auVar130);
          auVar57._4_4_ = fVar259 * auVar103._4_4_;
          auVar57._0_4_ = fVar254 * auVar103._0_4_;
          auVar57._8_4_ = fVar260 * auVar103._8_4_;
          auVar57._12_4_ = fVar261 * auVar103._12_4_;
          auVar57._16_4_ = fVar237 * auVar103._16_4_;
          auVar57._20_4_ = fVar238 * auVar103._20_4_;
          auVar57._24_4_ = fVar239 * auVar103._24_4_;
          auVar57._28_4_ = auVar123._28_4_;
          auVar103 = vmulps_avx512vl(local_820,auVar125);
          auVar119 = vmulps_avx512vl(local_6c0,auVar125);
          auVar127 = vmulps_avx512vl(local_840,auVar125);
          auVar123 = vfmadd213ps_avx512vl(auVar116,auVar57,auVar120);
          auVar103 = vsubps_avx512vl(auVar103,auVar123);
          auVar123 = vfmadd213ps_avx512vl(auVar117,auVar57,auVar121);
          auVar123 = vsubps_avx512vl(auVar119,auVar123);
          auVar91 = vfmadd213ps_fma(auVar57,auVar118,auVar122);
          auVar119 = vsubps_avx(auVar127,ZEXT1632(auVar91));
          auVar265 = ZEXT3264(auVar119);
          auVar119 = vfmadd213ps_avx512vl(auVar139,auVar124,auVar130);
          auVar126 = vmulps_avx512vl(auVar126,auVar119);
          auVar119 = vmulps_avx512vl(local_820,auVar124);
          auVar127 = vmulps_avx512vl(local_6c0,auVar124);
          auVar128 = vmulps_avx512vl(local_840,auVar124);
          auVar91 = vfmadd213ps_fma(auVar116,auVar126,auVar120);
          auVar119 = vsubps_avx(auVar119,ZEXT1632(auVar91));
          auVar91 = vfmadd213ps_fma(auVar117,auVar126,auVar121);
          auVar116 = vsubps_avx512vl(auVar127,ZEXT1632(auVar91));
          auVar91 = vfmadd213ps_fma(auVar118,auVar126,auVar122);
          auVar117 = vsubps_avx512vl(auVar128,ZEXT1632(auVar91));
          auVar171._8_4_ = 0x7f800000;
          auVar171._0_8_ = 0x7f8000007f800000;
          auVar171._12_4_ = 0x7f800000;
          auVar171._16_4_ = 0x7f800000;
          auVar171._20_4_ = 0x7f800000;
          auVar171._24_4_ = 0x7f800000;
          auVar171._28_4_ = 0x7f800000;
          auVar118 = vblendmps_avx512vl(auVar171,auVar125);
          bVar87 = (bool)((byte)uVar85 & 1);
          auVar150._0_4_ = (uint)bVar87 * auVar118._0_4_ | (uint)!bVar87 * auVar120._0_4_;
          bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar150._4_4_ = (uint)bVar87 * auVar118._4_4_ | (uint)!bVar87 * auVar120._4_4_;
          bVar87 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar150._8_4_ = (uint)bVar87 * auVar118._8_4_ | (uint)!bVar87 * auVar120._8_4_;
          bVar87 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar150._12_4_ = (uint)bVar87 * auVar118._12_4_ | (uint)!bVar87 * auVar120._12_4_;
          bVar87 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar150._16_4_ = (uint)bVar87 * auVar118._16_4_ | (uint)!bVar87 * auVar120._16_4_;
          bVar87 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar150._20_4_ = (uint)bVar87 * auVar118._20_4_ | (uint)!bVar87 * auVar120._20_4_;
          bVar87 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar150._24_4_ = (uint)bVar87 * auVar118._24_4_ | (uint)!bVar87 * auVar120._24_4_;
          bVar87 = SUB81(uVar85 >> 7,0);
          auVar150._28_4_ = (uint)bVar87 * auVar118._28_4_ | (uint)!bVar87 * auVar120._28_4_;
          auVar172._8_4_ = 0xff800000;
          auVar172._0_8_ = 0xff800000ff800000;
          auVar172._12_4_ = 0xff800000;
          auVar172._16_4_ = 0xff800000;
          auVar172._20_4_ = 0xff800000;
          auVar172._24_4_ = 0xff800000;
          auVar172._28_4_ = 0xff800000;
          auVar118 = vblendmps_avx512vl(auVar172,auVar124);
          bVar87 = (bool)((byte)uVar85 & 1);
          auVar151._0_4_ = (uint)bVar87 * auVar118._0_4_ | (uint)!bVar87 * -0x800000;
          bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
          auVar151._4_4_ = (uint)bVar87 * auVar118._4_4_ | (uint)!bVar87 * -0x800000;
          bVar87 = (bool)((byte)(uVar85 >> 2) & 1);
          auVar151._8_4_ = (uint)bVar87 * auVar118._8_4_ | (uint)!bVar87 * -0x800000;
          bVar87 = (bool)((byte)(uVar85 >> 3) & 1);
          auVar151._12_4_ = (uint)bVar87 * auVar118._12_4_ | (uint)!bVar87 * -0x800000;
          bVar87 = (bool)((byte)(uVar85 >> 4) & 1);
          auVar151._16_4_ = (uint)bVar87 * auVar118._16_4_ | (uint)!bVar87 * -0x800000;
          bVar87 = (bool)((byte)(uVar85 >> 5) & 1);
          auVar151._20_4_ = (uint)bVar87 * auVar118._20_4_ | (uint)!bVar87 * -0x800000;
          bVar87 = (bool)((byte)(uVar85 >> 6) & 1);
          auVar151._24_4_ = (uint)bVar87 * auVar118._24_4_ | (uint)!bVar87 * -0x800000;
          bVar87 = SUB81(uVar85 >> 7,0);
          auVar151._28_4_ = (uint)bVar87 * auVar118._28_4_ | (uint)!bVar87 * -0x800000;
          auVar35._8_4_ = 0x36000000;
          auVar35._0_8_ = 0x3600000036000000;
          auVar35._12_4_ = 0x36000000;
          auVar35._16_4_ = 0x36000000;
          auVar35._20_4_ = 0x36000000;
          auVar35._24_4_ = 0x36000000;
          auVar35._28_4_ = 0x36000000;
          auVar118 = vmulps_avx512vl(local_8c0,auVar35);
          uVar24 = vcmpps_avx512vl(auVar118,local_8e0,0xe);
          uVar85 = uVar85 & uVar24;
          bVar82 = (byte)uVar85;
          if (bVar82 != 0) {
            uVar24 = vcmpps_avx512vl(auVar102,ZEXT1632(auVar92),2);
            auVar257._8_4_ = 0x7f800000;
            auVar257._0_8_ = 0x7f8000007f800000;
            auVar257._12_4_ = 0x7f800000;
            auVar257._16_4_ = 0x7f800000;
            auVar257._20_4_ = 0x7f800000;
            auVar257._24_4_ = 0x7f800000;
            auVar257._28_4_ = 0x7f800000;
            auVar270._8_4_ = 0xff800000;
            auVar270._0_8_ = 0xff800000ff800000;
            auVar270._12_4_ = 0xff800000;
            auVar270._16_4_ = 0xff800000;
            auVar270._20_4_ = 0xff800000;
            auVar270._24_4_ = 0xff800000;
            auVar270._28_4_ = 0xff800000;
            auVar271 = ZEXT3264(auVar270);
            auVar102 = vblendmps_avx512vl(auVar257,auVar270);
            bVar79 = (byte)uVar24;
            uVar88 = (uint)(bVar79 & 1) * auVar102._0_4_ |
                     (uint)!(bool)(bVar79 & 1) * auVar118._0_4_;
            bVar87 = (bool)((byte)(uVar24 >> 1) & 1);
            uVar155 = (uint)bVar87 * auVar102._4_4_ | (uint)!bVar87 * auVar118._4_4_;
            bVar87 = (bool)((byte)(uVar24 >> 2) & 1);
            uVar156 = (uint)bVar87 * auVar102._8_4_ | (uint)!bVar87 * auVar118._8_4_;
            bVar87 = (bool)((byte)(uVar24 >> 3) & 1);
            uVar157 = (uint)bVar87 * auVar102._12_4_ | (uint)!bVar87 * auVar118._12_4_;
            bVar87 = (bool)((byte)(uVar24 >> 4) & 1);
            uVar158 = (uint)bVar87 * auVar102._16_4_ | (uint)!bVar87 * auVar118._16_4_;
            bVar87 = (bool)((byte)(uVar24 >> 5) & 1);
            uVar159 = (uint)bVar87 * auVar102._20_4_ | (uint)!bVar87 * auVar118._20_4_;
            bVar87 = (bool)((byte)(uVar24 >> 6) & 1);
            uVar160 = (uint)bVar87 * auVar102._24_4_ | (uint)!bVar87 * auVar118._24_4_;
            bVar87 = SUB81(uVar24 >> 7,0);
            uVar161 = (uint)bVar87 * auVar102._28_4_ | (uint)!bVar87 * auVar118._28_4_;
            auVar150._0_4_ = (bVar82 & 1) * uVar88 | !(bool)(bVar82 & 1) * auVar150._0_4_;
            bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar150._4_4_ = bVar87 * uVar155 | !bVar87 * auVar150._4_4_;
            bVar87 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar150._8_4_ = bVar87 * uVar156 | !bVar87 * auVar150._8_4_;
            bVar87 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar150._12_4_ = bVar87 * uVar157 | !bVar87 * auVar150._12_4_;
            bVar87 = (bool)((byte)(uVar85 >> 4) & 1);
            auVar150._16_4_ = bVar87 * uVar158 | !bVar87 * auVar150._16_4_;
            bVar87 = (bool)((byte)(uVar85 >> 5) & 1);
            auVar150._20_4_ = bVar87 * uVar159 | !bVar87 * auVar150._20_4_;
            bVar87 = (bool)((byte)(uVar85 >> 6) & 1);
            auVar150._24_4_ = bVar87 * uVar160 | !bVar87 * auVar150._24_4_;
            bVar87 = SUB81(uVar85 >> 7,0);
            auVar150._28_4_ = bVar87 * uVar161 | !bVar87 * auVar150._28_4_;
            auVar102 = vblendmps_avx512vl(auVar270,auVar257);
            bVar87 = (bool)((byte)(uVar24 >> 1) & 1);
            bVar7 = (bool)((byte)(uVar24 >> 2) & 1);
            bVar8 = (bool)((byte)(uVar24 >> 3) & 1);
            bVar9 = (bool)((byte)(uVar24 >> 4) & 1);
            bVar10 = (bool)((byte)(uVar24 >> 5) & 1);
            bVar11 = (bool)((byte)(uVar24 >> 6) & 1);
            bVar12 = SUB81(uVar24 >> 7,0);
            auVar151._0_4_ =
                 (uint)(bVar82 & 1) *
                 ((uint)(bVar79 & 1) * auVar102._0_4_ | !(bool)(bVar79 & 1) * uVar88) |
                 !(bool)(bVar82 & 1) * auVar151._0_4_;
            bVar6 = (bool)((byte)(uVar85 >> 1) & 1);
            auVar151._4_4_ =
                 (uint)bVar6 * ((uint)bVar87 * auVar102._4_4_ | !bVar87 * uVar155) |
                 !bVar6 * auVar151._4_4_;
            bVar87 = (bool)((byte)(uVar85 >> 2) & 1);
            auVar151._8_4_ =
                 (uint)bVar87 * ((uint)bVar7 * auVar102._8_4_ | !bVar7 * uVar156) |
                 !bVar87 * auVar151._8_4_;
            bVar87 = (bool)((byte)(uVar85 >> 3) & 1);
            auVar151._12_4_ =
                 (uint)bVar87 * ((uint)bVar8 * auVar102._12_4_ | !bVar8 * uVar157) |
                 !bVar87 * auVar151._12_4_;
            bVar87 = (bool)((byte)(uVar85 >> 4) & 1);
            auVar151._16_4_ =
                 (uint)bVar87 * ((uint)bVar9 * auVar102._16_4_ | !bVar9 * uVar158) |
                 !bVar87 * auVar151._16_4_;
            bVar87 = (bool)((byte)(uVar85 >> 5) & 1);
            auVar151._20_4_ =
                 (uint)bVar87 * ((uint)bVar10 * auVar102._20_4_ | !bVar10 * uVar159) |
                 !bVar87 * auVar151._20_4_;
            bVar87 = (bool)((byte)(uVar85 >> 6) & 1);
            auVar151._24_4_ =
                 (uint)bVar87 * ((uint)bVar11 * auVar102._24_4_ | !bVar11 * uVar160) |
                 !bVar87 * auVar151._24_4_;
            bVar87 = SUB81(uVar85 >> 7,0);
            auVar151._28_4_ =
                 (uint)bVar87 * ((uint)bVar12 * auVar102._28_4_ | !bVar12 * uVar161) |
                 !bVar87 * auVar151._28_4_;
            bVar84 = (~bVar82 | bVar79) & bVar84;
          }
        }
        auVar102 = vmulps_avx512vl(local_840,auVar117);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_6c0,auVar116);
        auVar258 = ZEXT3264(local_6c0);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_820,auVar119);
        auVar267 = ZEXT3264(local_800);
        _local_540 = local_800;
        local_520 = vminps_avx(local_680,auVar150);
        auVar251._8_4_ = 0x7fffffff;
        auVar251._0_8_ = 0x7fffffff7fffffff;
        auVar251._12_4_ = 0x7fffffff;
        auVar251._16_4_ = 0x7fffffff;
        auVar251._20_4_ = 0x7fffffff;
        auVar251._24_4_ = 0x7fffffff;
        auVar251._28_4_ = 0x7fffffff;
        auVar102 = vandps_avx(auVar102,auVar251);
        _local_740 = vmaxps_avx(local_800,auVar151);
        auVar252._8_4_ = 0x3e99999a;
        auVar252._0_8_ = 0x3e99999a3e99999a;
        auVar252._12_4_ = 0x3e99999a;
        auVar252._16_4_ = 0x3e99999a;
        auVar252._20_4_ = 0x3e99999a;
        auVar252._24_4_ = 0x3e99999a;
        auVar252._28_4_ = 0x3e99999a;
        auVar253 = ZEXT3264(auVar252);
        uVar23 = vcmpps_avx512vl(auVar102,auVar252,1);
        uVar26 = vcmpps_avx512vl(local_800,local_520,2);
        bVar82 = (byte)uVar26 & bVar78;
        uVar25 = vcmpps_avx512vl(_local_740,local_680,2);
        if ((bVar78 & ((byte)uVar25 | (byte)uVar26)) == 0) {
          auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar274 = ZEXT3264(auVar102);
          auVar179 = ZEXT3264(_DAT_01f7b040);
        }
        else {
          bVar79 = (byte)uVar23 | ~bVar84;
          auVar102 = vmulps_avx512vl(local_840,auVar265._0_32_);
          auVar91 = vfmadd213ps_fma(auVar123,local_6c0,auVar102);
          auVar102 = vfmadd213ps_avx512vl(auVar103,local_820,ZEXT1632(auVar91));
          auVar102 = vandps_avx(auVar102,auVar251);
          uVar23 = vcmpps_avx512vl(auVar102,auVar252,1);
          bVar84 = (byte)uVar23 | ~bVar84;
          auVar173._8_4_ = 2;
          auVar173._0_8_ = 0x200000002;
          auVar173._12_4_ = 2;
          auVar173._16_4_ = 2;
          auVar173._20_4_ = 2;
          auVar173._24_4_ = 2;
          auVar173._28_4_ = 2;
          auVar36._8_4_ = 3;
          auVar36._0_8_ = 0x300000003;
          auVar36._12_4_ = 3;
          auVar36._16_4_ = 3;
          auVar36._20_4_ = 3;
          auVar36._24_4_ = 3;
          auVar36._28_4_ = 3;
          auVar102 = vpblendmd_avx512vl(auVar173,auVar36);
          local_660._0_4_ = (uint)(bVar84 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar84 & 1) * 2;
          bVar87 = (bool)(bVar84 >> 1 & 1);
          local_660._4_4_ = (uint)bVar87 * auVar102._4_4_ | (uint)!bVar87 * 2;
          bVar87 = (bool)(bVar84 >> 2 & 1);
          local_660._8_4_ = (uint)bVar87 * auVar102._8_4_ | (uint)!bVar87 * 2;
          bVar87 = (bool)(bVar84 >> 3 & 1);
          local_660._12_4_ = (uint)bVar87 * auVar102._12_4_ | (uint)!bVar87 * 2;
          bVar87 = (bool)(bVar84 >> 4 & 1);
          local_660._16_4_ = (uint)bVar87 * auVar102._16_4_ | (uint)!bVar87 * 2;
          bVar87 = (bool)(bVar84 >> 5 & 1);
          local_660._20_4_ = (uint)bVar87 * auVar102._20_4_ | (uint)!bVar87 * 2;
          bVar87 = (bool)(bVar84 >> 6 & 1);
          local_660._24_4_ = (uint)bVar87 * auVar102._24_4_ | (uint)!bVar87 * 2;
          local_660._28_4_ = (uint)(bVar84 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar84 >> 7) * 2;
          local_6e0 = vpbroadcastd_avx512vl();
          uVar23 = vpcmpd_avx512vl(local_6e0,local_660,5);
          local_720 = local_800._0_4_ + (float)local_7e0._0_4_;
          fStack_71c = local_800._4_4_ + (float)local_7e0._4_4_;
          fStack_718 = local_800._8_4_ + fStack_7d8;
          fStack_714 = local_800._12_4_ + fStack_7d4;
          fStack_710 = local_800._16_4_ + fStack_7d0;
          fStack_70c = local_800._20_4_ + fStack_7cc;
          fStack_708 = local_800._24_4_ + fStack_7c8;
          fStack_704 = local_800._28_4_ + fStack_7c4;
          _local_6a0 = _local_740;
          for (bVar84 = (byte)uVar23 & bVar82; bVar84 != 0;
              bVar84 = ~('\x01' << ((byte)iVar27 & 0x1f)) & bVar84 & (byte)uVar23) {
            auVar174._8_4_ = 0x7f800000;
            auVar174._0_8_ = 0x7f8000007f800000;
            auVar174._12_4_ = 0x7f800000;
            auVar174._16_4_ = 0x7f800000;
            auVar174._20_4_ = 0x7f800000;
            auVar174._24_4_ = 0x7f800000;
            auVar174._28_4_ = 0x7f800000;
            auVar102 = vblendmps_avx512vl(auVar174,local_800);
            auVar152._0_4_ =
                 (uint)(bVar84 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar84 & 1) * 0x7f800000;
            bVar87 = (bool)(bVar84 >> 1 & 1);
            auVar152._4_4_ = (uint)bVar87 * auVar102._4_4_ | (uint)!bVar87 * 0x7f800000;
            bVar87 = (bool)(bVar84 >> 2 & 1);
            auVar152._8_4_ = (uint)bVar87 * auVar102._8_4_ | (uint)!bVar87 * 0x7f800000;
            bVar87 = (bool)(bVar84 >> 3 & 1);
            auVar152._12_4_ = (uint)bVar87 * auVar102._12_4_ | (uint)!bVar87 * 0x7f800000;
            bVar87 = (bool)(bVar84 >> 4 & 1);
            auVar152._16_4_ = (uint)bVar87 * auVar102._16_4_ | (uint)!bVar87 * 0x7f800000;
            bVar87 = (bool)(bVar84 >> 5 & 1);
            auVar152._20_4_ = (uint)bVar87 * auVar102._20_4_ | (uint)!bVar87 * 0x7f800000;
            auVar152._24_4_ =
                 (uint)(bVar84 >> 6) * auVar102._24_4_ | (uint)!(bool)(bVar84 >> 6) * 0x7f800000;
            auVar152._28_4_ = 0x7f800000;
            auVar102 = vshufps_avx(auVar152,auVar152,0xb1);
            auVar102 = vminps_avx(auVar152,auVar102);
            auVar103 = vshufpd_avx(auVar102,auVar102,5);
            auVar102 = vminps_avx(auVar102,auVar103);
            auVar103 = vpermpd_avx2(auVar102,0x4e);
            auVar102 = vminps_avx(auVar102,auVar103);
            uVar23 = vcmpps_avx512vl(auVar152,auVar102,0);
            bVar80 = (byte)uVar23 & bVar84;
            bVar81 = bVar84;
            if (bVar80 != 0) {
              bVar81 = bVar80;
            }
            iVar27 = 0;
            for (uVar88 = (uint)bVar81; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
              iVar27 = iVar27 + 1;
            }
            uVar88 = *(uint *)(local_540 + (uint)(iVar27 << 2));
            fVar254 = auVar20._0_4_;
            auVar91 = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar27 << 2)));
            if ((float)local_9e0._0_4_ < 0.0) {
              local_a60._0_16_ = ZEXT416(*(uint *)(local_4e0 + (uint)(iVar27 << 2)));
              auVar258 = ZEXT1664(auVar258._0_16_);
              auVar265 = ZEXT1664(auVar265._0_16_);
              auVar267 = ZEXT1664(auVar267._0_16_);
              auVar271 = ZEXT1664(auVar271._0_16_);
              fVar254 = sqrtf((float)local_9e0._0_4_);
              auVar91 = local_a60._0_16_;
            }
            auVar253 = ZEXT464(uVar88);
            auVar89 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar92 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar101 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar97 = vminps_avx(auVar89,auVar101);
            auVar89 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar101 = vmaxps_avx(auVar92,auVar89);
            auVar222._8_4_ = 0x7fffffff;
            auVar222._0_8_ = 0x7fffffff7fffffff;
            auVar222._12_4_ = 0x7fffffff;
            auVar92 = vandps_avx(auVar97,auVar222);
            auVar89 = vandps_avx(auVar101,auVar222);
            auVar92 = vmaxps_avx(auVar92,auVar89);
            auVar89 = vmovshdup_avx(auVar92);
            auVar89 = vmaxss_avx(auVar89,auVar92);
            auVar92 = vshufpd_avx(auVar92,auVar92,1);
            auVar92 = vmaxss_avx(auVar92,auVar89);
            fVar259 = auVar92._0_4_ * 1.9073486e-06;
            local_a40._0_4_ = fVar254 * 1.9073486e-06;
            local_930 = vshufps_avx(auVar101,auVar101,0xff);
            auVar91 = vinsertps_avx(ZEXT416(uVar88),auVar91,0x10);
            auVar263 = ZEXT1664(auVar91);
            lVar86 = 5;
            do {
              do {
                bVar87 = lVar86 == 0;
                lVar86 = lVar86 + -1;
                if (bVar87) goto LAB_01aa5bdb;
                uVar186 = auVar263._0_4_;
                auVar164._4_4_ = uVar186;
                auVar164._0_4_ = uVar186;
                auVar164._8_4_ = uVar186;
                auVar164._12_4_ = uVar186;
                auVar91 = vfmadd132ps_fma(auVar164,ZEXT816(0) << 0x40,local_9d0);
                auVar92 = vmovshdup_avx(auVar263._0_16_);
                fVar237 = auVar92._0_4_;
                fVar221 = 1.0 - fVar237;
                fVar261 = fVar221 * fVar221 * fVar221;
                fVar254 = fVar237 * fVar237;
                fVar239 = fVar237 * fVar254;
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar261),
                                          ZEXT416((uint)fVar239));
                fVar260 = fVar237 * fVar221;
                auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * fVar260 * 6.0)),
                                          ZEXT416((uint)(fVar221 * fVar260)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar239),
                                           ZEXT416((uint)fVar261));
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * fVar260 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar237 * fVar260)));
                fVar261 = fVar261 * 0.16666667;
                fVar237 = (auVar89._0_4_ + auVar97._0_4_) * 0.16666667;
                fVar238 = (auVar101._0_4_ + auVar90._0_4_) * 0.16666667;
                fVar239 = fVar239 * 0.16666667;
                auVar204._0_4_ = fVar239 * (float)local_9c0._0_4_;
                auVar204._4_4_ = fVar239 * (float)local_9c0._4_4_;
                auVar204._8_4_ = fVar239 * fStack_9b8;
                auVar204._12_4_ = fVar239 * fStack_9b4;
                auVar240._4_4_ = fVar238;
                auVar240._0_4_ = fVar238;
                auVar240._8_4_ = fVar238;
                auVar240._12_4_ = fVar238;
                auVar89 = vfmadd132ps_fma(auVar240,auVar204,local_980._0_16_);
                auVar205._4_4_ = fVar237;
                auVar205._0_4_ = fVar237;
                auVar205._8_4_ = fVar237;
                auVar205._12_4_ = fVar237;
                auVar89 = vfmadd132ps_fma(auVar205,auVar89,local_9a0._0_16_);
                auVar187._4_4_ = fVar261;
                auVar187._0_4_ = fVar261;
                auVar187._8_4_ = fVar261;
                auVar187._12_4_ = fVar261;
                auVar89 = vfmadd132ps_fma(auVar187,auVar89,local_960._0_16_);
                local_860._0_16_ = auVar89;
                auVar89 = vsubps_avx(auVar91,auVar89);
                auVar91 = vdpps_avx(auVar89,auVar89,0x7f);
                local_a00._0_16_ = auVar91;
                local_a60._0_16_ = ZEXT416((uint)fVar221);
                local_7c0 = auVar263;
                if (auVar91._0_4_ < 0.0) {
                  local_a80._0_4_ = fVar254;
                  local_aa0._0_4_ = fVar260;
                  auVar258._0_4_ = sqrtf(auVar91._0_4_);
                  auVar258._4_60_ = extraout_var;
                  auVar91 = auVar258._0_16_;
                  fVar260 = (float)local_aa0._0_4_;
                  auVar101 = local_a60._0_16_;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  local_a80._0_4_ = fVar254;
                  auVar101 = ZEXT416((uint)fVar221);
                }
                local_880._4_4_ = auVar101._0_4_;
                local_880._0_4_ = local_880._4_4_;
                fStack_878 = (float)local_880._4_4_;
                fStack_874 = (float)local_880._4_4_;
                auVar97 = vfnmsub213ss_fma(auVar92,auVar92,ZEXT416((uint)(fVar260 * 4.0)));
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar260 * 4.0)),auVar101,auVar101);
                fVar254 = (float)local_880._4_4_ * -(float)local_880._4_4_ * 0.5;
                fVar260 = auVar97._0_4_ * 0.5;
                fVar261 = auVar101._0_4_ * 0.5;
                local_a80._0_4_ = (float)local_a80._0_4_ * 0.5;
                auVar223._0_4_ = (float)local_a80._0_4_ * (float)local_9c0._0_4_;
                auVar223._4_4_ = (float)local_a80._0_4_ * (float)local_9c0._4_4_;
                auVar223._8_4_ = (float)local_a80._0_4_ * fStack_9b8;
                auVar223._12_4_ = (float)local_a80._0_4_ * fStack_9b4;
                auVar188._4_4_ = fVar261;
                auVar188._0_4_ = fVar261;
                auVar188._8_4_ = fVar261;
                auVar188._12_4_ = fVar261;
                auVar101 = vfmadd132ps_fma(auVar188,auVar223,local_980._0_16_);
                auVar206._4_4_ = fVar260;
                auVar206._0_4_ = fVar260;
                auVar206._8_4_ = fVar260;
                auVar206._12_4_ = fVar260;
                auVar101 = vfmadd132ps_fma(auVar206,auVar101,local_9a0._0_16_);
                auVar268._4_4_ = fVar254;
                auVar268._0_4_ = fVar254;
                auVar268._8_4_ = fVar254;
                auVar268._12_4_ = fVar254;
                _local_a80 = vfmadd132ps_fma(auVar268,auVar101,local_960._0_16_);
                local_8a0._0_16_ = vdpps_avx(_local_a80,_local_a80,0x7f);
                auVar58._12_4_ = 0;
                auVar58._0_12_ = ZEXT812(0);
                fVar254 = local_8a0._0_4_;
                local_a30 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar254));
                fVar260 = local_a30._0_4_;
                local_8c0._0_16_ = vrcp14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar254));
                auVar101 = vfnmadd213ss_fma(local_8c0._0_16_,local_8a0._0_16_,ZEXT416(0x40000000));
                local_8e0._0_4_ = auVar101._0_4_;
                local_aa0._0_4_ = auVar91._0_4_;
                if (fVar254 < -fVar254) {
                  fVar261 = sqrtf(fVar254);
                  auVar91 = ZEXT416((uint)local_aa0._0_4_);
                  auVar101 = _local_a80;
                }
                else {
                  auVar101 = vsqrtss_avx(local_8a0._0_16_,local_8a0._0_16_);
                  fVar261 = auVar101._0_4_;
                  auVar101 = _local_a80;
                }
                fVar237 = local_a30._0_4_;
                fVar254 = fVar260 * 1.5 + fVar254 * -0.5 * fVar237 * fVar237 * fVar237;
                local_a30._0_4_ = auVar101._0_4_ * fVar254;
                local_a30._4_4_ = auVar101._4_4_ * fVar254;
                local_a30._8_4_ = auVar101._8_4_ * fVar254;
                local_a30._12_4_ = auVar101._12_4_ * fVar254;
                auVar97 = vdpps_avx(auVar89,local_a30,0x7f);
                fVar238 = auVar91._0_4_;
                fVar260 = auVar97._0_4_;
                auVar165._0_4_ = fVar260 * fVar260;
                auVar165._4_4_ = auVar97._4_4_ * auVar97._4_4_;
                auVar165._8_4_ = auVar97._8_4_ * auVar97._8_4_;
                auVar165._12_4_ = auVar97._12_4_ * auVar97._12_4_;
                auVar90 = vsubps_avx(local_a00._0_16_,auVar165);
                fVar237 = auVar90._0_4_;
                auVar189._4_12_ = ZEXT812(0) << 0x20;
                auVar189._0_4_ = fVar237;
                auVar93 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
                auVar94 = vmulss_avx512f(auVar93,ZEXT416(0x3fc00000));
                auVar95 = vmulss_avx512f(auVar90,ZEXT416(0xbf000000));
                if (fVar237 < 0.0) {
                  local_8f0._0_4_ = fVar261;
                  local_910._0_4_ = auVar94._0_4_;
                  local_920._4_4_ = fVar254;
                  local_920._0_4_ = fVar254;
                  fStack_918 = fVar254;
                  fStack_914 = fVar254;
                  local_900 = auVar93;
                  fVar237 = sqrtf(fVar237);
                  auVar95 = ZEXT416(auVar95._0_4_);
                  auVar94 = ZEXT416((uint)local_910._0_4_);
                  auVar91 = ZEXT416((uint)local_aa0._0_4_);
                  auVar93 = local_900;
                  auVar101 = _local_a80;
                  fVar254 = (float)local_920._0_4_;
                  fVar239 = (float)local_920._4_4_;
                  fVar221 = fStack_918;
                  fVar273 = fStack_914;
                  fVar261 = (float)local_8f0._0_4_;
                }
                else {
                  auVar90 = vsqrtss_avx(auVar90,auVar90);
                  fVar237 = auVar90._0_4_;
                  fVar239 = fVar254;
                  fVar221 = fVar254;
                  fVar273 = fVar254;
                }
                auVar271 = ZEXT1664(auVar101);
                auVar267 = ZEXT1664(local_a00._0_16_);
                auVar265 = ZEXT1664(auVar89);
                auVar90 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_,auVar92);
                auVar98 = vfmadd213ss_fma(auVar92,SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_);
                auVar100 = local_7c0._0_16_;
                auVar92 = vshufps_avx(auVar100,auVar100,0x55);
                auVar207._0_4_ = auVar92._0_4_ * (float)local_9c0._0_4_;
                auVar207._4_4_ = auVar92._4_4_ * (float)local_9c0._4_4_;
                auVar207._8_4_ = auVar92._8_4_ * fStack_9b8;
                auVar207._12_4_ = auVar92._12_4_ * fStack_9b4;
                auVar224._0_4_ = auVar98._0_4_;
                auVar224._4_4_ = auVar224._0_4_;
                auVar224._8_4_ = auVar224._0_4_;
                auVar224._12_4_ = auVar224._0_4_;
                auVar92 = vfmadd132ps_fma(auVar224,auVar207,local_980._0_16_);
                auVar190._0_4_ = auVar90._0_4_;
                auVar190._4_4_ = auVar190._0_4_;
                auVar190._8_4_ = auVar190._0_4_;
                auVar190._12_4_ = auVar190._0_4_;
                auVar92 = vfmadd132ps_fma(auVar190,auVar92,local_9a0._0_16_);
                auVar92 = vfmadd132ps_fma(_local_880,auVar92,local_960._0_16_);
                auVar191._0_4_ = auVar92._0_4_ * (float)local_8a0._0_4_;
                auVar191._4_4_ = auVar92._4_4_ * (float)local_8a0._0_4_;
                auVar191._8_4_ = auVar92._8_4_ * (float)local_8a0._0_4_;
                auVar191._12_4_ = auVar92._12_4_ * (float)local_8a0._0_4_;
                auVar92 = vdpps_avx(auVar101,auVar92,0x7f);
                fVar203 = auVar92._0_4_;
                auVar208._0_4_ = auVar101._0_4_ * fVar203;
                auVar208._4_4_ = auVar101._4_4_ * fVar203;
                auVar208._8_4_ = auVar101._8_4_ * fVar203;
                auVar208._12_4_ = auVar101._12_4_ * fVar203;
                auVar92 = vsubps_avx(auVar191,auVar208);
                fVar203 = (float)local_8e0._0_4_ * (float)local_8c0._0_4_;
                auVar98 = vmaxss_avx(ZEXT416((uint)fVar259),
                                     ZEXT416((uint)(local_7c0._0_4_ * (float)local_a40._0_4_)));
                auVar28._8_4_ = 0x80000000;
                auVar28._0_8_ = 0x8000000080000000;
                auVar28._12_4_ = 0x80000000;
                auVar96 = vxorps_avx512vl(auVar101,auVar28);
                auVar209._0_4_ = fVar254 * auVar92._0_4_ * fVar203;
                auVar209._4_4_ = fVar239 * auVar92._4_4_ * fVar203;
                auVar209._8_4_ = fVar221 * auVar92._8_4_ * fVar203;
                auVar209._12_4_ = fVar273 * auVar92._12_4_ * fVar203;
                auVar92 = vdpps_avx(auVar96,local_a30,0x7f);
                auVar90 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar259),auVar98);
                auVar91 = vdpps_avx(auVar89,auVar209,0x7f);
                auVar99 = vfmadd213ss_fma(ZEXT416((uint)(fVar238 + 1.0)),
                                          ZEXT416((uint)(fVar259 / fVar261)),auVar90);
                fVar254 = auVar92._0_4_ + auVar91._0_4_;
                auVar91 = vdpps_avx(local_9d0,local_a30,0x7f);
                auVar92 = vdpps_avx(auVar89,auVar96,0x7f);
                auVar90 = vmulss_avx512f(auVar95,auVar93);
                auVar95 = vaddss_avx512f(auVar94,ZEXT416((uint)(auVar90._0_4_ *
                                                               auVar93._0_4_ * auVar93._0_4_)));
                auVar90 = vdpps_avx(auVar89,local_9d0,0x7f);
                auVar94 = vfnmadd231ss_fma(auVar92,auVar97,ZEXT416((uint)fVar254));
                auVar90 = vfnmadd231ss_fma(auVar90,auVar97,auVar91);
                auVar92 = vpermilps_avx(local_860._0_16_,0xff);
                fVar237 = fVar237 - auVar92._0_4_;
                auVar93 = vshufps_avx(auVar101,auVar101,0xff);
                auVar92 = vfmsub213ss_fma(auVar94,auVar95,auVar93);
                auVar255._8_4_ = 0x80000000;
                auVar255._0_8_ = 0x8000000080000000;
                auVar255._12_4_ = 0x80000000;
                auVar258 = ZEXT1664(auVar255);
                auVar249._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
                auVar249._8_4_ = auVar92._8_4_ ^ 0x80000000;
                auVar249._12_4_ = auVar92._12_4_ ^ 0x80000000;
                auVar253 = ZEXT1664(auVar249);
                auVar90 = ZEXT416((uint)(auVar90._0_4_ * auVar95._0_4_));
                auVar94 = vfmsub231ss_fma(ZEXT416((uint)(auVar91._0_4_ * auVar92._0_4_)),
                                          ZEXT416((uint)fVar254),auVar90);
                auVar92 = vinsertps_avx(auVar249,auVar90,0x1c);
                auVar244._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                auVar244._8_4_ = auVar91._8_4_ ^ 0x80000000;
                auVar244._12_4_ = auVar91._12_4_ ^ 0x80000000;
                auVar90 = vinsertps_avx(ZEXT416((uint)fVar254),auVar244,0x10);
                auVar225._0_4_ = auVar94._0_4_;
                auVar225._4_4_ = auVar225._0_4_;
                auVar225._8_4_ = auVar225._0_4_;
                auVar225._12_4_ = auVar225._0_4_;
                auVar91 = vdivps_avx(auVar92,auVar225);
                auVar92 = vdivps_avx(auVar90,auVar225);
                auVar226._0_4_ = fVar260 * auVar91._0_4_ + fVar237 * auVar92._0_4_;
                auVar226._4_4_ = fVar260 * auVar91._4_4_ + fVar237 * auVar92._4_4_;
                auVar226._8_4_ = fVar260 * auVar91._8_4_ + fVar237 * auVar92._8_4_;
                auVar226._12_4_ = fVar260 * auVar91._12_4_ + fVar237 * auVar92._12_4_;
                auVar91 = vsubps_avx(auVar100,auVar226);
                auVar263 = ZEXT1664(auVar91);
                auVar29._8_4_ = 0x7fffffff;
                auVar29._0_8_ = 0x7fffffff7fffffff;
                auVar29._12_4_ = 0x7fffffff;
                auVar92 = vandps_avx512vl(auVar97,auVar29);
              } while (auVar99._0_4_ <= auVar92._0_4_);
              auVar92 = vfmadd231ss_fma(ZEXT416((uint)(auVar99._0_4_ + auVar98._0_4_)),local_930,
                                        ZEXT416(0x36000000));
              auVar30._8_4_ = 0x7fffffff;
              auVar30._0_8_ = 0x7fffffff7fffffff;
              auVar30._12_4_ = 0x7fffffff;
              auVar97 = vandps_avx512vl(ZEXT416((uint)fVar237),auVar30);
            } while (auVar92._0_4_ <= auVar97._0_4_);
            fVar254 = auVar91._0_4_ + (float)local_940._0_4_;
            if ((fVar162 <= fVar254) &&
               (fVar259 = *(float *)(ray + k * 4 + 0x200), fVar254 <= fVar259)) {
              auVar92 = vmovshdup_avx(auVar91);
              fVar260 = auVar92._0_4_;
              if ((0.0 <= fVar260) && (fVar260 <= 1.0)) {
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a00._0_4_));
                fVar261 = auVar92._0_4_;
                pGVar3 = (context->scene->geometries).items[uVar1].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar261 = fVar261 * 1.5 + local_a00._0_4_ * -0.5 * fVar261 * fVar261 * fVar261;
                  auVar227._0_4_ = auVar89._0_4_ * fVar261;
                  auVar227._4_4_ = auVar89._4_4_ * fVar261;
                  auVar227._8_4_ = auVar89._8_4_ * fVar261;
                  auVar227._12_4_ = auVar89._12_4_ * fVar261;
                  auVar93 = vfmadd213ps_fma(auVar93,auVar227,auVar101);
                  auVar92 = vshufps_avx(auVar227,auVar227,0xc9);
                  auVar97 = vshufps_avx(auVar101,auVar101,0xc9);
                  auVar228._0_4_ = auVar227._0_4_ * auVar97._0_4_;
                  auVar228._4_4_ = auVar227._4_4_ * auVar97._4_4_;
                  auVar228._8_4_ = auVar227._8_4_ * auVar97._8_4_;
                  auVar228._12_4_ = auVar227._12_4_ * auVar97._12_4_;
                  auVar90 = vfmsub231ps_fma(auVar228,auVar101,auVar92);
                  auVar92 = vshufps_avx(auVar90,auVar90,0xc9);
                  auVar97 = vshufps_avx(auVar93,auVar93,0xc9);
                  auVar90 = vshufps_avx(auVar90,auVar90,0xd2);
                  auVar166._0_4_ = auVar93._0_4_ * auVar90._0_4_;
                  auVar166._4_4_ = auVar93._4_4_ * auVar90._4_4_;
                  auVar166._8_4_ = auVar93._8_4_ * auVar90._8_4_;
                  auVar166._12_4_ = auVar93._12_4_ * auVar90._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar166,auVar92,auVar97);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar254;
                    uVar186 = vextractps_avx(auVar92,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar186;
                    uVar186 = vextractps_avx(auVar92,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar186;
                    *(int *)(ray + k * 4 + 0x380) = auVar92._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar260;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar2;
                    *(uint *)(ray + k * 4 + 0x480) = uVar1;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar5 = context->user;
                    auVar179 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar179,auVar263);
                    auVar179 = vpermps_avx512f(auVar179,ZEXT1664(auVar92));
                    auVar274 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar274,ZEXT1664(auVar92));
                    local_380 = vbroadcastss_avx512f(auVar92);
                    local_400[0] = (RTCHitN)auVar179[0];
                    local_400[1] = (RTCHitN)auVar179[1];
                    local_400[2] = (RTCHitN)auVar179[2];
                    local_400[3] = (RTCHitN)auVar179[3];
                    local_400[4] = (RTCHitN)auVar179[4];
                    local_400[5] = (RTCHitN)auVar179[5];
                    local_400[6] = (RTCHitN)auVar179[6];
                    local_400[7] = (RTCHitN)auVar179[7];
                    local_400[8] = (RTCHitN)auVar179[8];
                    local_400[9] = (RTCHitN)auVar179[9];
                    local_400[10] = (RTCHitN)auVar179[10];
                    local_400[0xb] = (RTCHitN)auVar179[0xb];
                    local_400[0xc] = (RTCHitN)auVar179[0xc];
                    local_400[0xd] = (RTCHitN)auVar179[0xd];
                    local_400[0xe] = (RTCHitN)auVar179[0xe];
                    local_400[0xf] = (RTCHitN)auVar179[0xf];
                    local_400[0x10] = (RTCHitN)auVar179[0x10];
                    local_400[0x11] = (RTCHitN)auVar179[0x11];
                    local_400[0x12] = (RTCHitN)auVar179[0x12];
                    local_400[0x13] = (RTCHitN)auVar179[0x13];
                    local_400[0x14] = (RTCHitN)auVar179[0x14];
                    local_400[0x15] = (RTCHitN)auVar179[0x15];
                    local_400[0x16] = (RTCHitN)auVar179[0x16];
                    local_400[0x17] = (RTCHitN)auVar179[0x17];
                    local_400[0x18] = (RTCHitN)auVar179[0x18];
                    local_400[0x19] = (RTCHitN)auVar179[0x19];
                    local_400[0x1a] = (RTCHitN)auVar179[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar179[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar179[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar179[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar179[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar179[0x1f];
                    local_400[0x20] = (RTCHitN)auVar179[0x20];
                    local_400[0x21] = (RTCHitN)auVar179[0x21];
                    local_400[0x22] = (RTCHitN)auVar179[0x22];
                    local_400[0x23] = (RTCHitN)auVar179[0x23];
                    local_400[0x24] = (RTCHitN)auVar179[0x24];
                    local_400[0x25] = (RTCHitN)auVar179[0x25];
                    local_400[0x26] = (RTCHitN)auVar179[0x26];
                    local_400[0x27] = (RTCHitN)auVar179[0x27];
                    local_400[0x28] = (RTCHitN)auVar179[0x28];
                    local_400[0x29] = (RTCHitN)auVar179[0x29];
                    local_400[0x2a] = (RTCHitN)auVar179[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar179[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar179[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar179[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar179[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar179[0x2f];
                    local_400[0x30] = (RTCHitN)auVar179[0x30];
                    local_400[0x31] = (RTCHitN)auVar179[0x31];
                    local_400[0x32] = (RTCHitN)auVar179[0x32];
                    local_400[0x33] = (RTCHitN)auVar179[0x33];
                    local_400[0x34] = (RTCHitN)auVar179[0x34];
                    local_400[0x35] = (RTCHitN)auVar179[0x35];
                    local_400[0x36] = (RTCHitN)auVar179[0x36];
                    local_400[0x37] = (RTCHitN)auVar179[0x37];
                    local_400[0x38] = (RTCHitN)auVar179[0x38];
                    local_400[0x39] = (RTCHitN)auVar179[0x39];
                    local_400[0x3a] = (RTCHitN)auVar179[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar179[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar179[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar179[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar179[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar179[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar179 = vmovdqa64_avx512f(local_440);
                    local_280 = vmovdqa64_avx512f(auVar179);
                    auVar102 = vpcmpeqd_avx2(auVar179._0_32_,auVar179._0_32_);
                    local_a18[3] = auVar102;
                    local_a18[2] = auVar102;
                    local_a18[1] = auVar102;
                    *local_a18 = auVar102;
                    local_240 = vbroadcastss_avx512f(ZEXT416(pRVar5->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(pRVar5->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar254;
                    auVar179 = vmovdqa64_avx512f(local_4c0);
                    local_780 = vmovdqa64_avx512f(auVar179);
                    local_ad0.valid = (int *)local_780;
                    local_ad0.geometryUserPtr = pGVar3->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_400;
                    local_ad0.N = 0x10;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar253 = ZEXT1664(auVar249);
                      auVar258 = ZEXT1664(auVar255);
                      auVar263 = ZEXT1664(auVar91);
                      auVar265 = ZEXT1664(auVar89);
                      auVar267 = ZEXT1664(local_a00._0_16_);
                      auVar271 = ZEXT1664(auVar101);
                      (*pGVar3->intersectionFilterN)(&local_ad0);
                      auVar179 = vmovdqa64_avx512f(local_780);
                    }
                    uVar23 = vptestmd_avx512f(auVar179,auVar179);
                    if ((short)uVar23 != 0) {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        auVar258 = ZEXT1664(auVar258._0_16_);
                        auVar263 = ZEXT1664(auVar263._0_16_);
                        auVar265 = ZEXT1664(auVar265._0_16_);
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        (*p_Var4)(&local_ad0);
                        auVar179 = vmovdqa64_avx512f(local_780);
                      }
                      uVar85 = vptestmd_avx512f(auVar179,auVar179);
                      if ((short)uVar85 != 0) {
                        iVar60 = *(int *)(local_ad0.hit + 4);
                        iVar61 = *(int *)(local_ad0.hit + 8);
                        iVar62 = *(int *)(local_ad0.hit + 0xc);
                        iVar63 = *(int *)(local_ad0.hit + 0x10);
                        iVar64 = *(int *)(local_ad0.hit + 0x14);
                        iVar65 = *(int *)(local_ad0.hit + 0x18);
                        iVar66 = *(int *)(local_ad0.hit + 0x1c);
                        iVar67 = *(int *)(local_ad0.hit + 0x20);
                        iVar68 = *(int *)(local_ad0.hit + 0x24);
                        iVar69 = *(int *)(local_ad0.hit + 0x28);
                        iVar70 = *(int *)(local_ad0.hit + 0x2c);
                        iVar71 = *(int *)(local_ad0.hit + 0x30);
                        iVar72 = *(int *)(local_ad0.hit + 0x34);
                        iVar73 = *(int *)(local_ad0.hit + 0x38);
                        iVar74 = *(int *)(local_ad0.hit + 0x3c);
                        bVar81 = (byte)uVar85;
                        bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar8 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar80 = (byte)(uVar85 >> 8);
                        bVar12 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar18 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x300) =
                             (uint)(bVar81 & 1) * *(int *)local_ad0.hit |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 0x300);
                        *(uint *)(local_ad0.ray + 0x304) =
                             (uint)bVar87 * iVar60 | (uint)!bVar87 * *(int *)(local_ad0.ray + 0x304)
                        ;
                        *(uint *)(local_ad0.ray + 0x308) =
                             (uint)bVar6 * iVar61 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x308);
                        *(uint *)(local_ad0.ray + 0x30c) =
                             (uint)bVar7 * iVar62 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x30c);
                        *(uint *)(local_ad0.ray + 0x310) =
                             (uint)bVar8 * iVar63 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x310);
                        *(uint *)(local_ad0.ray + 0x314) =
                             (uint)bVar9 * iVar64 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x314);
                        *(uint *)(local_ad0.ray + 0x318) =
                             (uint)bVar10 * iVar65 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x318)
                        ;
                        *(uint *)(local_ad0.ray + 0x31c) =
                             (uint)bVar11 * iVar66 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x31c)
                        ;
                        *(uint *)(local_ad0.ray + 800) =
                             (uint)(bVar80 & 1) * iVar67 |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_ad0.ray + 800);
                        *(uint *)(local_ad0.ray + 0x324) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x324)
                        ;
                        *(uint *)(local_ad0.ray + 0x328) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x328)
                        ;
                        *(uint *)(local_ad0.ray + 0x32c) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x32c)
                        ;
                        *(uint *)(local_ad0.ray + 0x330) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x330)
                        ;
                        *(uint *)(local_ad0.ray + 0x334) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x334)
                        ;
                        *(uint *)(local_ad0.ray + 0x338) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x338)
                        ;
                        *(uint *)(local_ad0.ray + 0x33c) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x33c)
                        ;
                        iVar60 = *(int *)(local_ad0.hit + 0x44);
                        iVar61 = *(int *)(local_ad0.hit + 0x48);
                        iVar62 = *(int *)(local_ad0.hit + 0x4c);
                        iVar63 = *(int *)(local_ad0.hit + 0x50);
                        iVar64 = *(int *)(local_ad0.hit + 0x54);
                        iVar65 = *(int *)(local_ad0.hit + 0x58);
                        iVar66 = *(int *)(local_ad0.hit + 0x5c);
                        iVar67 = *(int *)(local_ad0.hit + 0x60);
                        iVar68 = *(int *)(local_ad0.hit + 100);
                        iVar69 = *(int *)(local_ad0.hit + 0x68);
                        iVar70 = *(int *)(local_ad0.hit + 0x6c);
                        iVar71 = *(int *)(local_ad0.hit + 0x70);
                        iVar72 = *(int *)(local_ad0.hit + 0x74);
                        iVar73 = *(int *)(local_ad0.hit + 0x78);
                        iVar74 = *(int *)(local_ad0.hit + 0x7c);
                        bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar8 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar18 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x340) =
                             (uint)(bVar81 & 1) * *(int *)(local_ad0.hit + 0x40) |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 0x340);
                        *(uint *)(local_ad0.ray + 0x344) =
                             (uint)bVar87 * iVar60 | (uint)!bVar87 * *(int *)(local_ad0.ray + 0x344)
                        ;
                        *(uint *)(local_ad0.ray + 0x348) =
                             (uint)bVar6 * iVar61 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x348);
                        *(uint *)(local_ad0.ray + 0x34c) =
                             (uint)bVar7 * iVar62 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x34c);
                        *(uint *)(local_ad0.ray + 0x350) =
                             (uint)bVar8 * iVar63 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x350);
                        *(uint *)(local_ad0.ray + 0x354) =
                             (uint)bVar9 * iVar64 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x354);
                        *(uint *)(local_ad0.ray + 0x358) =
                             (uint)bVar10 * iVar65 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x358)
                        ;
                        *(uint *)(local_ad0.ray + 0x35c) =
                             (uint)bVar11 * iVar66 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x35c)
                        ;
                        *(uint *)(local_ad0.ray + 0x360) =
                             (uint)(bVar80 & 1) * iVar67 |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_ad0.ray + 0x360);
                        *(uint *)(local_ad0.ray + 0x364) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x364)
                        ;
                        *(uint *)(local_ad0.ray + 0x368) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x368)
                        ;
                        *(uint *)(local_ad0.ray + 0x36c) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x36c)
                        ;
                        *(uint *)(local_ad0.ray + 0x370) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x370)
                        ;
                        *(uint *)(local_ad0.ray + 0x374) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x374)
                        ;
                        *(uint *)(local_ad0.ray + 0x378) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x378)
                        ;
                        *(uint *)(local_ad0.ray + 0x37c) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x37c)
                        ;
                        iVar60 = *(int *)(local_ad0.hit + 0x84);
                        iVar61 = *(int *)(local_ad0.hit + 0x88);
                        iVar62 = *(int *)(local_ad0.hit + 0x8c);
                        iVar63 = *(int *)(local_ad0.hit + 0x90);
                        iVar64 = *(int *)(local_ad0.hit + 0x94);
                        iVar65 = *(int *)(local_ad0.hit + 0x98);
                        iVar66 = *(int *)(local_ad0.hit + 0x9c);
                        iVar67 = *(int *)(local_ad0.hit + 0xa0);
                        iVar68 = *(int *)(local_ad0.hit + 0xa4);
                        iVar69 = *(int *)(local_ad0.hit + 0xa8);
                        iVar70 = *(int *)(local_ad0.hit + 0xac);
                        iVar71 = *(int *)(local_ad0.hit + 0xb0);
                        iVar72 = *(int *)(local_ad0.hit + 0xb4);
                        iVar73 = *(int *)(local_ad0.hit + 0xb8);
                        iVar74 = *(int *)(local_ad0.hit + 0xbc);
                        bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar8 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar18 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x380) =
                             (uint)(bVar81 & 1) * *(int *)(local_ad0.hit + 0x80) |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 0x380);
                        *(uint *)(local_ad0.ray + 900) =
                             (uint)bVar87 * iVar60 | (uint)!bVar87 * *(int *)(local_ad0.ray + 900);
                        *(uint *)(local_ad0.ray + 0x388) =
                             (uint)bVar6 * iVar61 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x388);
                        *(uint *)(local_ad0.ray + 0x38c) =
                             (uint)bVar7 * iVar62 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x38c);
                        *(uint *)(local_ad0.ray + 0x390) =
                             (uint)bVar8 * iVar63 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x390);
                        *(uint *)(local_ad0.ray + 0x394) =
                             (uint)bVar9 * iVar64 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x394);
                        *(uint *)(local_ad0.ray + 0x398) =
                             (uint)bVar10 * iVar65 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x398)
                        ;
                        *(uint *)(local_ad0.ray + 0x39c) =
                             (uint)bVar11 * iVar66 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x39c)
                        ;
                        *(uint *)(local_ad0.ray + 0x3a0) =
                             (uint)(bVar80 & 1) * iVar67 |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_ad0.ray + 0x3a0);
                        *(uint *)(local_ad0.ray + 0x3a4) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x3a4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3a8) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x3a8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3ac) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x3ac)
                        ;
                        *(uint *)(local_ad0.ray + 0x3b0) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3b0)
                        ;
                        *(uint *)(local_ad0.ray + 0x3b4) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3b4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3b8) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3b8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3bc) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3bc)
                        ;
                        iVar60 = *(int *)(local_ad0.hit + 0xc4);
                        iVar61 = *(int *)(local_ad0.hit + 200);
                        iVar62 = *(int *)(local_ad0.hit + 0xcc);
                        iVar63 = *(int *)(local_ad0.hit + 0xd0);
                        iVar64 = *(int *)(local_ad0.hit + 0xd4);
                        iVar65 = *(int *)(local_ad0.hit + 0xd8);
                        iVar66 = *(int *)(local_ad0.hit + 0xdc);
                        iVar67 = *(int *)(local_ad0.hit + 0xe0);
                        iVar68 = *(int *)(local_ad0.hit + 0xe4);
                        iVar69 = *(int *)(local_ad0.hit + 0xe8);
                        iVar70 = *(int *)(local_ad0.hit + 0xec);
                        iVar71 = *(int *)(local_ad0.hit + 0xf0);
                        iVar72 = *(int *)(local_ad0.hit + 0xf4);
                        iVar73 = *(int *)(local_ad0.hit + 0xf8);
                        iVar74 = *(int *)(local_ad0.hit + 0xfc);
                        bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar8 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar18 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x3c0) =
                             (uint)(bVar81 & 1) * *(int *)(local_ad0.hit + 0xc0) |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 0x3c0);
                        *(uint *)(local_ad0.ray + 0x3c4) =
                             (uint)bVar87 * iVar60 | (uint)!bVar87 * *(int *)(local_ad0.ray + 0x3c4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3c8) =
                             (uint)bVar6 * iVar61 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x3c8);
                        *(uint *)(local_ad0.ray + 0x3cc) =
                             (uint)bVar7 * iVar62 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x3cc);
                        *(uint *)(local_ad0.ray + 0x3d0) =
                             (uint)bVar8 * iVar63 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x3d0);
                        *(uint *)(local_ad0.ray + 0x3d4) =
                             (uint)bVar9 * iVar64 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x3d4);
                        *(uint *)(local_ad0.ray + 0x3d8) =
                             (uint)bVar10 * iVar65 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x3d8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3dc) =
                             (uint)bVar11 * iVar66 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x3dc)
                        ;
                        *(uint *)(local_ad0.ray + 0x3e0) =
                             (uint)(bVar80 & 1) * iVar67 |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_ad0.ray + 0x3e0);
                        *(uint *)(local_ad0.ray + 0x3e4) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x3e4)
                        ;
                        *(uint *)(local_ad0.ray + 1000) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_ad0.ray + 1000);
                        *(uint *)(local_ad0.ray + 0x3ec) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x3ec)
                        ;
                        *(uint *)(local_ad0.ray + 0x3f0) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3f0)
                        ;
                        *(uint *)(local_ad0.ray + 0x3f4) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3f4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3f8) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3f8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3fc) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3fc)
                        ;
                        iVar60 = *(int *)(local_ad0.hit + 0x104);
                        iVar61 = *(int *)(local_ad0.hit + 0x108);
                        iVar62 = *(int *)(local_ad0.hit + 0x10c);
                        iVar63 = *(int *)(local_ad0.hit + 0x110);
                        iVar64 = *(int *)(local_ad0.hit + 0x114);
                        iVar65 = *(int *)(local_ad0.hit + 0x118);
                        iVar66 = *(int *)(local_ad0.hit + 0x11c);
                        iVar67 = *(int *)(local_ad0.hit + 0x120);
                        iVar68 = *(int *)(local_ad0.hit + 0x124);
                        iVar69 = *(int *)(local_ad0.hit + 0x128);
                        iVar70 = *(int *)(local_ad0.hit + 300);
                        iVar71 = *(int *)(local_ad0.hit + 0x130);
                        iVar72 = *(int *)(local_ad0.hit + 0x134);
                        iVar73 = *(int *)(local_ad0.hit + 0x138);
                        iVar74 = *(int *)(local_ad0.hit + 0x13c);
                        bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar8 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar18 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x400) =
                             (uint)(bVar81 & 1) * *(int *)(local_ad0.hit + 0x100) |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 0x400);
                        *(uint *)(local_ad0.ray + 0x404) =
                             (uint)bVar87 * iVar60 | (uint)!bVar87 * *(int *)(local_ad0.ray + 0x404)
                        ;
                        *(uint *)(local_ad0.ray + 0x408) =
                             (uint)bVar6 * iVar61 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x408);
                        *(uint *)(local_ad0.ray + 0x40c) =
                             (uint)bVar7 * iVar62 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x40c);
                        *(uint *)(local_ad0.ray + 0x410) =
                             (uint)bVar8 * iVar63 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x410);
                        *(uint *)(local_ad0.ray + 0x414) =
                             (uint)bVar9 * iVar64 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x414);
                        *(uint *)(local_ad0.ray + 0x418) =
                             (uint)bVar10 * iVar65 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x418)
                        ;
                        *(uint *)(local_ad0.ray + 0x41c) =
                             (uint)bVar11 * iVar66 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x41c)
                        ;
                        *(uint *)(local_ad0.ray + 0x420) =
                             (uint)(bVar80 & 1) * iVar67 |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_ad0.ray + 0x420);
                        *(uint *)(local_ad0.ray + 0x424) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x424)
                        ;
                        *(uint *)(local_ad0.ray + 0x428) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x428)
                        ;
                        *(uint *)(local_ad0.ray + 0x42c) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x42c)
                        ;
                        *(uint *)(local_ad0.ray + 0x430) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x430)
                        ;
                        *(uint *)(local_ad0.ray + 0x434) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x434)
                        ;
                        *(uint *)(local_ad0.ray + 0x438) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x438)
                        ;
                        *(uint *)(local_ad0.ray + 0x43c) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x43c)
                        ;
                        auVar179 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x140));
                        auVar179 = vmovdqu32_avx512f(auVar179);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x440) = auVar179;
                        auVar179 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x180));
                        auVar179 = vmovdqu32_avx512f(auVar179);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x480) = auVar179;
                        auVar179 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x1c0));
                        auVar179 = vmovdqa32_avx512f(auVar179);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x4c0) = auVar179;
                        auVar179 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x200));
                        auVar179 = vmovdqa32_avx512f(auVar179);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x500) = auVar179;
                        goto LAB_01aa5bdb;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar259;
                  }
                }
              }
            }
LAB_01aa5bdb:
            uVar186 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar246._4_4_ = uVar186;
            auVar246._0_4_ = uVar186;
            auVar246._8_4_ = uVar186;
            auVar246._12_4_ = uVar186;
            auVar246._16_4_ = uVar186;
            auVar246._20_4_ = uVar186;
            auVar246._24_4_ = uVar186;
            auVar246._28_4_ = uVar186;
            auVar179 = ZEXT3264(auVar246);
            auVar75._4_4_ = fStack_71c;
            auVar75._0_4_ = local_720;
            auVar75._8_4_ = fStack_718;
            auVar75._12_4_ = fStack_714;
            auVar75._16_4_ = fStack_710;
            auVar75._20_4_ = fStack_70c;
            auVar75._24_4_ = fStack_708;
            auVar75._28_4_ = fStack_704;
            uVar23 = vcmpps_avx512vl(auVar246,auVar75,0xd);
          }
          auVar175._0_4_ = (float)local_7e0._0_4_ + (float)local_740._0_4_;
          auVar175._4_4_ = (float)local_7e0._4_4_ + (float)local_740._4_4_;
          auVar175._8_4_ = fStack_7d8 + fStack_738;
          auVar175._12_4_ = fStack_7d4 + fStack_734;
          auVar175._16_4_ = fStack_7d0 + fStack_730;
          auVar175._20_4_ = fStack_7cc + fStack_72c;
          auVar175._24_4_ = fStack_7c8 + fStack_728;
          auVar175._28_4_ = fStack_7c4 + fStack_724;
          uVar186 = auVar179._0_4_;
          auVar198._4_4_ = uVar186;
          auVar198._0_4_ = uVar186;
          auVar198._8_4_ = uVar186;
          auVar198._12_4_ = uVar186;
          auVar198._16_4_ = uVar186;
          auVar198._20_4_ = uVar186;
          auVar198._24_4_ = uVar186;
          auVar198._28_4_ = uVar186;
          uVar23 = vcmpps_avx512vl(auVar175,auVar198,2);
          auVar176._8_4_ = 2;
          auVar176._0_8_ = 0x200000002;
          auVar176._12_4_ = 2;
          auVar176._16_4_ = 2;
          auVar176._20_4_ = 2;
          auVar176._24_4_ = 2;
          auVar176._28_4_ = 2;
          auVar37._8_4_ = 3;
          auVar37._0_8_ = 0x300000003;
          auVar37._12_4_ = 3;
          auVar37._16_4_ = 3;
          auVar37._20_4_ = 3;
          auVar37._24_4_ = 3;
          auVar37._28_4_ = 3;
          auVar102 = vpblendmd_avx512vl(auVar176,auVar37);
          local_740._0_4_ = (uint)(bVar79 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar79 & 1) * 2;
          bVar87 = (bool)(bVar79 >> 1 & 1);
          local_740._4_4_ = (uint)bVar87 * auVar102._4_4_ | (uint)!bVar87 * 2;
          bVar87 = (bool)(bVar79 >> 2 & 1);
          fStack_738 = (float)((uint)bVar87 * auVar102._8_4_ | (uint)!bVar87 * 2);
          bVar87 = (bool)(bVar79 >> 3 & 1);
          fStack_734 = (float)((uint)bVar87 * auVar102._12_4_ | (uint)!bVar87 * 2);
          bVar87 = (bool)(bVar79 >> 4 & 1);
          fStack_730 = (float)((uint)bVar87 * auVar102._16_4_ | (uint)!bVar87 * 2);
          bVar87 = (bool)(bVar79 >> 5 & 1);
          fStack_72c = (float)((uint)bVar87 * auVar102._20_4_ | (uint)!bVar87 * 2);
          bVar87 = (bool)(bVar79 >> 6 & 1);
          fStack_728 = (float)((uint)bVar87 * auVar102._24_4_ | (uint)!bVar87 * 2);
          fStack_724 = (float)((uint)(bVar79 >> 7) * auVar102._28_4_ |
                              (uint)!(bool)(bVar79 >> 7) * 2);
          bVar78 = (byte)uVar25 & bVar78 & (byte)uVar23;
          uVar23 = vpcmpd_avx512vl(_local_740,local_6e0,2);
          local_800 = _local_6a0;
          local_720 = (float)local_7e0._0_4_ + (float)local_6a0._0_4_;
          fStack_71c = (float)local_7e0._4_4_ + (float)local_6a0._4_4_;
          fStack_718 = fStack_7d8 + fStack_698;
          fStack_714 = fStack_7d4 + fStack_694;
          fStack_710 = fStack_7d0 + fStack_690;
          fStack_70c = fStack_7cc + fStack_68c;
          fStack_708 = fStack_7c8 + fStack_688;
          fStack_704 = fStack_7c4 + fStack_684;
          for (bVar84 = (byte)uVar23 & bVar78; bVar84 != 0;
              bVar84 = ~('\x01' << ((byte)iVar27 & 0x1f)) & bVar84 & (byte)uVar23) {
            auVar177._8_4_ = 0x7f800000;
            auVar177._0_8_ = 0x7f8000007f800000;
            auVar177._12_4_ = 0x7f800000;
            auVar177._16_4_ = 0x7f800000;
            auVar177._20_4_ = 0x7f800000;
            auVar177._24_4_ = 0x7f800000;
            auVar177._28_4_ = 0x7f800000;
            auVar102 = vblendmps_avx512vl(auVar177,local_800);
            auVar153._0_4_ =
                 (uint)(bVar84 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar84 & 1) * 0x7f800000;
            bVar87 = (bool)(bVar84 >> 1 & 1);
            auVar153._4_4_ = (uint)bVar87 * auVar102._4_4_ | (uint)!bVar87 * 0x7f800000;
            bVar87 = (bool)(bVar84 >> 2 & 1);
            auVar153._8_4_ = (uint)bVar87 * auVar102._8_4_ | (uint)!bVar87 * 0x7f800000;
            bVar87 = (bool)(bVar84 >> 3 & 1);
            auVar153._12_4_ = (uint)bVar87 * auVar102._12_4_ | (uint)!bVar87 * 0x7f800000;
            bVar87 = (bool)(bVar84 >> 4 & 1);
            auVar153._16_4_ = (uint)bVar87 * auVar102._16_4_ | (uint)!bVar87 * 0x7f800000;
            bVar87 = (bool)(bVar84 >> 5 & 1);
            auVar153._20_4_ = (uint)bVar87 * auVar102._20_4_ | (uint)!bVar87 * 0x7f800000;
            auVar153._24_4_ =
                 (uint)(bVar84 >> 6) * auVar102._24_4_ | (uint)!(bool)(bVar84 >> 6) * 0x7f800000;
            auVar153._28_4_ = 0x7f800000;
            auVar102 = vshufps_avx(auVar153,auVar153,0xb1);
            auVar102 = vminps_avx(auVar153,auVar102);
            auVar103 = vshufpd_avx(auVar102,auVar102,5);
            auVar102 = vminps_avx(auVar102,auVar103);
            auVar103 = vpermpd_avx2(auVar102,0x4e);
            auVar102 = vminps_avx(auVar102,auVar103);
            uVar23 = vcmpps_avx512vl(auVar153,auVar102,0);
            bVar81 = (byte)uVar23 & bVar84;
            bVar79 = bVar84;
            if (bVar81 != 0) {
              bVar79 = bVar81;
            }
            iVar27 = 0;
            for (uVar88 = (uint)bVar79; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x80000000) {
              iVar27 = iVar27 + 1;
            }
            uVar88 = *(uint *)(local_680 + (uint)(iVar27 << 2));
            fVar254 = auVar19._0_4_;
            auVar91 = ZEXT416(*(uint *)(local_500 + (uint)(iVar27 << 2)));
            if ((float)local_9e0._0_4_ < 0.0) {
              local_a60._0_16_ = ZEXT416(*(uint *)(local_500 + (uint)(iVar27 << 2)));
              auVar258 = ZEXT1664(auVar258._0_16_);
              auVar265 = ZEXT1664(auVar265._0_16_);
              auVar267 = ZEXT1664(auVar267._0_16_);
              auVar271 = ZEXT1664(auVar271._0_16_);
              fVar254 = sqrtf((float)local_9e0._0_4_);
              auVar91 = local_a60._0_16_;
            }
            auVar253 = ZEXT464(uVar88);
            auVar89 = vminps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar92 = vmaxps_avx(local_960._0_16_,local_9a0._0_16_);
            auVar101 = vminps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar97 = vminps_avx(auVar89,auVar101);
            auVar89 = vmaxps_avx(local_980._0_16_,local_9c0._0_16_);
            auVar101 = vmaxps_avx(auVar92,auVar89);
            auVar229._8_4_ = 0x7fffffff;
            auVar229._0_8_ = 0x7fffffff7fffffff;
            auVar229._12_4_ = 0x7fffffff;
            auVar92 = vandps_avx(auVar97,auVar229);
            auVar89 = vandps_avx(auVar101,auVar229);
            auVar92 = vmaxps_avx(auVar92,auVar89);
            auVar89 = vmovshdup_avx(auVar92);
            auVar89 = vmaxss_avx(auVar89,auVar92);
            auVar92 = vshufpd_avx(auVar92,auVar92,1);
            auVar92 = vmaxss_avx(auVar92,auVar89);
            local_a30._0_4_ = auVar92._0_4_ * 1.9073486e-06;
            local_930 = vshufps_avx(auVar101,auVar101,0xff);
            auVar91 = vinsertps_avx(ZEXT416(uVar88),auVar91,0x10);
            auVar263 = ZEXT1664(auVar91);
            lVar86 = 5;
            do {
              do {
                bVar87 = lVar86 == 0;
                lVar86 = lVar86 + -1;
                if (bVar87) goto LAB_01aa690a;
                uVar186 = auVar263._0_4_;
                auVar167._4_4_ = uVar186;
                auVar167._0_4_ = uVar186;
                auVar167._8_4_ = uVar186;
                auVar167._12_4_ = uVar186;
                auVar91 = vfmadd132ps_fma(auVar167,ZEXT816(0) << 0x40,local_9d0);
                auVar92 = vmovshdup_avx(auVar263._0_16_);
                fVar237 = auVar92._0_4_;
                fVar221 = 1.0 - fVar237;
                fVar261 = fVar221 * fVar221 * fVar221;
                fVar259 = fVar237 * fVar237;
                fVar239 = fVar237 * fVar259;
                auVar89 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar261),
                                          ZEXT416((uint)fVar239));
                fVar260 = fVar237 * fVar221;
                auVar97 = vfmadd231ss_fma(ZEXT416((uint)(fVar237 * fVar260 * 6.0)),
                                          ZEXT416((uint)(fVar221 * fVar260)),
                                          SUB6416(ZEXT464(0x41400000),0));
                auVar101 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar239),
                                           ZEXT416((uint)fVar261));
                auVar90 = vfmadd231ss_fma(ZEXT416((uint)(fVar221 * fVar260 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar237 * fVar260)));
                fVar261 = fVar261 * 0.16666667;
                fVar237 = (auVar89._0_4_ + auVar97._0_4_) * 0.16666667;
                fVar238 = (auVar101._0_4_ + auVar90._0_4_) * 0.16666667;
                fVar239 = fVar239 * 0.16666667;
                auVar210._0_4_ = fVar239 * (float)local_9c0._0_4_;
                auVar210._4_4_ = fVar239 * (float)local_9c0._4_4_;
                auVar210._8_4_ = fVar239 * fStack_9b8;
                auVar210._12_4_ = fVar239 * fStack_9b4;
                auVar241._4_4_ = fVar238;
                auVar241._0_4_ = fVar238;
                auVar241._8_4_ = fVar238;
                auVar241._12_4_ = fVar238;
                auVar89 = vfmadd132ps_fma(auVar241,auVar210,local_980._0_16_);
                auVar211._4_4_ = fVar237;
                auVar211._0_4_ = fVar237;
                auVar211._8_4_ = fVar237;
                auVar211._12_4_ = fVar237;
                auVar89 = vfmadd132ps_fma(auVar211,auVar89,local_9a0._0_16_);
                auVar192._4_4_ = fVar261;
                auVar192._0_4_ = fVar261;
                auVar192._8_4_ = fVar261;
                auVar192._12_4_ = fVar261;
                auVar89 = vfmadd132ps_fma(auVar192,auVar89,local_960._0_16_);
                local_860._0_16_ = auVar89;
                auVar89 = vsubps_avx(auVar91,auVar89);
                auVar91 = vdpps_avx(auVar89,auVar89,0x7f);
                local_a00._0_16_ = auVar91;
                local_a60._0_16_ = ZEXT416((uint)fVar221);
                local_7c0 = auVar263;
                if (auVar91._0_4_ < 0.0) {
                  local_a80._0_4_ = fVar259;
                  local_aa0._0_4_ = fVar260;
                  auVar253._0_4_ = sqrtf(auVar91._0_4_);
                  auVar253._4_60_ = extraout_var_00;
                  auVar91 = auVar253._0_16_;
                  fVar260 = (float)local_aa0._0_4_;
                  auVar101 = local_a60._0_16_;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                  local_a80._0_4_ = fVar259;
                  auVar101 = ZEXT416((uint)fVar221);
                }
                local_880._4_4_ = auVar101._0_4_;
                local_880._0_4_ = local_880._4_4_;
                fStack_878 = (float)local_880._4_4_;
                fStack_874 = (float)local_880._4_4_;
                auVar97 = vfnmsub213ss_fma(auVar92,auVar92,ZEXT416((uint)(fVar260 * 4.0)));
                auVar101 = vfmadd231ss_fma(ZEXT416((uint)(fVar260 * 4.0)),auVar101,auVar101);
                fVar259 = (float)local_880._4_4_ * -(float)local_880._4_4_ * 0.5;
                fVar260 = auVar97._0_4_ * 0.5;
                fVar261 = auVar101._0_4_ * 0.5;
                local_a80._0_4_ = (float)local_a80._0_4_ * 0.5;
                auVar230._0_4_ = (float)local_a80._0_4_ * (float)local_9c0._0_4_;
                auVar230._4_4_ = (float)local_a80._0_4_ * (float)local_9c0._4_4_;
                auVar230._8_4_ = (float)local_a80._0_4_ * fStack_9b8;
                auVar230._12_4_ = (float)local_a80._0_4_ * fStack_9b4;
                auVar193._4_4_ = fVar261;
                auVar193._0_4_ = fVar261;
                auVar193._8_4_ = fVar261;
                auVar193._12_4_ = fVar261;
                auVar101 = vfmadd132ps_fma(auVar193,auVar230,local_980._0_16_);
                auVar212._4_4_ = fVar260;
                auVar212._0_4_ = fVar260;
                auVar212._8_4_ = fVar260;
                auVar212._12_4_ = fVar260;
                auVar101 = vfmadd132ps_fma(auVar212,auVar101,local_9a0._0_16_);
                auVar269._4_4_ = fVar259;
                auVar269._0_4_ = fVar259;
                auVar269._8_4_ = fVar259;
                auVar269._12_4_ = fVar259;
                _local_a80 = vfmadd132ps_fma(auVar269,auVar101,local_960._0_16_);
                local_8a0._0_16_ = vdpps_avx(_local_a80,_local_a80,0x7f);
                auVar59._12_4_ = 0;
                auVar59._0_12_ = ZEXT812(0);
                fVar259 = local_8a0._0_4_;
                auVar97 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar259));
                local_8c0._0_16_ = vrcp14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar259));
                auVar101 = vfnmadd213ss_fma(local_8c0._0_16_,local_8a0._0_16_,ZEXT416(0x40000000));
                local_8e0._0_4_ = auVar101._0_4_;
                local_aa0._0_4_ = auVar91._0_4_;
                if (fVar259 < -fVar259) {
                  local_a40 = auVar97;
                  fVar260 = sqrtf(fVar259);
                  auVar91 = ZEXT416((uint)local_aa0._0_4_);
                  auVar101 = local_a40;
                  auVar90 = _local_a80;
                }
                else {
                  auVar101 = vsqrtss_avx(local_8a0._0_16_,local_8a0._0_16_);
                  fVar260 = auVar101._0_4_;
                  auVar101 = auVar97;
                  auVar90 = _local_a80;
                }
                fVar261 = auVar101._0_4_;
                auVar95 = vbroadcastss_avx512vl
                                    (ZEXT416((uint)(auVar97._0_4_ * 1.5 +
                                                   fVar259 * -0.5 * fVar261 * fVar261 * fVar261)));
                auVar94 = vmulps_avx512vl(auVar90,auVar95);
                auVar101 = vdpps_avx(auVar89,auVar94,0x7f);
                fVar259 = auVar91._0_4_ + 1.0;
                fVar261 = auVar101._0_4_;
                auVar168._0_4_ = fVar261 * fVar261;
                auVar168._4_4_ = auVar101._4_4_ * auVar101._4_4_;
                auVar168._8_4_ = auVar101._8_4_ * auVar101._8_4_;
                auVar168._12_4_ = auVar101._12_4_ * auVar101._12_4_;
                auVar97 = vsubps_avx(local_a00._0_16_,auVar168);
                fVar237 = auVar97._0_4_;
                auVar194._4_12_ = ZEXT812(0) << 0x20;
                auVar194._0_4_ = fVar237;
                auVar93 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar194);
                auVar98 = vmulss_avx512f(auVar93,ZEXT416(0x3fc00000));
                auVar99 = vmulss_avx512f(auVar97,ZEXT416(0xbf000000));
                if (fVar237 < 0.0) {
                  local_a40._0_4_ = fVar259;
                  local_900._0_4_ = auVar98._0_4_;
                  _local_920 = auVar95;
                  local_910 = auVar94;
                  local_8f0 = auVar93;
                  fVar237 = sqrtf(fVar237);
                  auVar99 = ZEXT416(auVar99._0_4_);
                  auVar98 = ZEXT416((uint)local_900._0_4_);
                  auVar91 = ZEXT416((uint)local_aa0._0_4_);
                  auVar93 = local_8f0;
                  auVar90 = _local_a80;
                  fVar259 = (float)local_a40._0_4_;
                  auVar94 = local_910;
                  auVar95 = _local_920;
                }
                else {
                  auVar97 = vsqrtss_avx(auVar97,auVar97);
                  fVar237 = auVar97._0_4_;
                }
                auVar271 = ZEXT1664(auVar90);
                auVar267 = ZEXT1664(local_a00._0_16_);
                auVar265 = ZEXT1664(auVar89);
                auVar97 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_,auVar92);
                auVar96 = vfmadd213ss_fma(auVar92,SUB6416(ZEXT464(0xc0000000),0),local_a60._0_16_);
                auVar262 = local_7c0._0_16_;
                auVar92 = vshufps_avx(auVar262,auVar262,0x55);
                auVar213._0_4_ = auVar92._0_4_ * (float)local_9c0._0_4_;
                auVar213._4_4_ = auVar92._4_4_ * (float)local_9c0._4_4_;
                auVar213._8_4_ = auVar92._8_4_ * fStack_9b8;
                auVar213._12_4_ = auVar92._12_4_ * fStack_9b4;
                auVar231._0_4_ = auVar96._0_4_;
                auVar231._4_4_ = auVar231._0_4_;
                auVar231._8_4_ = auVar231._0_4_;
                auVar231._12_4_ = auVar231._0_4_;
                auVar92 = vfmadd132ps_fma(auVar231,auVar213,local_980._0_16_);
                auVar195._0_4_ = auVar97._0_4_;
                auVar195._4_4_ = auVar195._0_4_;
                auVar195._8_4_ = auVar195._0_4_;
                auVar195._12_4_ = auVar195._0_4_;
                auVar92 = vfmadd132ps_fma(auVar195,auVar92,local_9a0._0_16_);
                auVar92 = vfmadd132ps_fma(_local_880,auVar92,local_960._0_16_);
                auVar196._0_4_ = auVar92._0_4_ * (float)local_8a0._0_4_;
                auVar196._4_4_ = auVar92._4_4_ * (float)local_8a0._0_4_;
                auVar196._8_4_ = auVar92._8_4_ * (float)local_8a0._0_4_;
                auVar196._12_4_ = auVar92._12_4_ * (float)local_8a0._0_4_;
                auVar92 = vdpps_avx(auVar90,auVar92,0x7f);
                fVar238 = auVar92._0_4_;
                auVar214._0_4_ = auVar90._0_4_ * fVar238;
                auVar214._4_4_ = auVar90._4_4_ * fVar238;
                auVar214._8_4_ = auVar90._8_4_ * fVar238;
                auVar214._12_4_ = auVar90._12_4_ * fVar238;
                auVar92 = vsubps_avx(auVar196,auVar214);
                fVar238 = (float)local_8e0._0_4_ * (float)local_8c0._0_4_;
                auVar96 = vmaxss_avx(ZEXT416((uint)local_a30._0_4_),
                                     ZEXT416((uint)(local_7c0._0_4_ * fVar254 * 1.9073486e-06)));
                auVar215._0_4_ = auVar92._0_4_ * fVar238;
                auVar215._4_4_ = auVar92._4_4_ * fVar238;
                auVar215._8_4_ = auVar92._8_4_ * fVar238;
                auVar215._12_4_ = auVar92._12_4_ * fVar238;
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar100 = vxorps_avx512vl(auVar90,auVar31);
                auVar95 = vmulps_avx512vl(auVar95,auVar215);
                auVar92 = vdpps_avx(auVar100,auVar94,0x7f);
                auVar97 = vfmadd213ss_fma(auVar91,ZEXT416((uint)local_a30._0_4_),auVar96);
                auVar91 = vdpps_avx(auVar89,auVar95,0x7f);
                auVar95 = vfmadd213ss_fma(ZEXT416((uint)fVar259),
                                          ZEXT416((uint)((float)local_a30._0_4_ / fVar260)),auVar97)
                ;
                fVar259 = auVar92._0_4_ + auVar91._0_4_;
                auVar91 = vdpps_avx(local_9d0,auVar94,0x7f);
                auVar92 = vdpps_avx(auVar89,auVar100,0x7f);
                auVar97 = vmulss_avx512f(auVar99,auVar93);
                auVar98 = vaddss_avx512f(auVar98,ZEXT416((uint)(auVar97._0_4_ *
                                                               auVar93._0_4_ * auVar93._0_4_)));
                auVar97 = vdpps_avx(auVar89,local_9d0,0x7f);
                auVar94 = vfnmadd231ss_fma(auVar92,auVar101,ZEXT416((uint)fVar259));
                auVar97 = vfnmadd231ss_fma(auVar97,auVar101,auVar91);
                auVar92 = vpermilps_avx(local_860._0_16_,0xff);
                fVar237 = fVar237 - auVar92._0_4_;
                auVar93 = vshufps_avx(auVar90,auVar90,0xff);
                auVar92 = vfmsub213ss_fma(auVar94,auVar98,auVar93);
                auVar256._8_4_ = 0x80000000;
                auVar256._0_8_ = 0x8000000080000000;
                auVar256._12_4_ = 0x80000000;
                auVar258 = ZEXT1664(auVar256);
                auVar250._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
                auVar250._8_4_ = auVar92._8_4_ ^ 0x80000000;
                auVar250._12_4_ = auVar92._12_4_ ^ 0x80000000;
                auVar253 = ZEXT1664(auVar250);
                auVar97 = ZEXT416((uint)(auVar97._0_4_ * auVar98._0_4_));
                auVar94 = vfmsub231ss_fma(ZEXT416((uint)(auVar91._0_4_ * auVar92._0_4_)),
                                          ZEXT416((uint)fVar259),auVar97);
                auVar92 = vinsertps_avx(auVar250,auVar97,0x1c);
                auVar245._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
                auVar245._8_4_ = auVar91._8_4_ ^ 0x80000000;
                auVar245._12_4_ = auVar91._12_4_ ^ 0x80000000;
                auVar97 = vinsertps_avx(ZEXT416((uint)fVar259),auVar245,0x10);
                auVar232._0_4_ = auVar94._0_4_;
                auVar232._4_4_ = auVar232._0_4_;
                auVar232._8_4_ = auVar232._0_4_;
                auVar232._12_4_ = auVar232._0_4_;
                auVar91 = vdivps_avx(auVar92,auVar232);
                auVar92 = vdivps_avx(auVar97,auVar232);
                auVar233._0_4_ = fVar261 * auVar91._0_4_ + fVar237 * auVar92._0_4_;
                auVar233._4_4_ = fVar261 * auVar91._4_4_ + fVar237 * auVar92._4_4_;
                auVar233._8_4_ = fVar261 * auVar91._8_4_ + fVar237 * auVar92._8_4_;
                auVar233._12_4_ = fVar261 * auVar91._12_4_ + fVar237 * auVar92._12_4_;
                auVar91 = vsubps_avx(auVar262,auVar233);
                auVar263 = ZEXT1664(auVar91);
                auVar32._8_4_ = 0x7fffffff;
                auVar32._0_8_ = 0x7fffffff7fffffff;
                auVar32._12_4_ = 0x7fffffff;
                auVar92 = vandps_avx512vl(auVar101,auVar32);
              } while (auVar95._0_4_ <= auVar92._0_4_);
              auVar92 = vfmadd231ss_fma(ZEXT416((uint)(auVar95._0_4_ + auVar96._0_4_)),local_930,
                                        ZEXT416(0x36000000));
              auVar33._8_4_ = 0x7fffffff;
              auVar33._0_8_ = 0x7fffffff7fffffff;
              auVar33._12_4_ = 0x7fffffff;
              auVar101 = vandps_avx512vl(ZEXT416((uint)fVar237),auVar33);
            } while (auVar92._0_4_ <= auVar101._0_4_);
            fVar254 = auVar91._0_4_ + (float)local_940._0_4_;
            if ((fVar162 <= fVar254) &&
               (fVar259 = *(float *)(ray + k * 4 + 0x200), fVar254 <= fVar259)) {
              auVar92 = vmovshdup_avx(auVar91);
              fVar260 = auVar92._0_4_;
              if ((0.0 <= fVar260) && (fVar260 <= 1.0)) {
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,ZEXT416((uint)local_a00._0_4_));
                fVar261 = auVar92._0_4_;
                pGVar3 = (context->scene->geometries).items[uVar1].ptr;
                if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                  fVar261 = fVar261 * 1.5 + local_a00._0_4_ * -0.5 * fVar261 * fVar261 * fVar261;
                  auVar234._0_4_ = auVar89._0_4_ * fVar261;
                  auVar234._4_4_ = auVar89._4_4_ * fVar261;
                  auVar234._8_4_ = auVar89._8_4_ * fVar261;
                  auVar234._12_4_ = auVar89._12_4_ * fVar261;
                  auVar93 = vfmadd213ps_fma(auVar93,auVar234,auVar90);
                  auVar92 = vshufps_avx(auVar234,auVar234,0xc9);
                  auVar101 = vshufps_avx(auVar90,auVar90,0xc9);
                  auVar235._0_4_ = auVar234._0_4_ * auVar101._0_4_;
                  auVar235._4_4_ = auVar234._4_4_ * auVar101._4_4_;
                  auVar235._8_4_ = auVar234._8_4_ * auVar101._8_4_;
                  auVar235._12_4_ = auVar234._12_4_ * auVar101._12_4_;
                  auVar97 = vfmsub231ps_fma(auVar235,auVar90,auVar92);
                  auVar92 = vshufps_avx(auVar97,auVar97,0xc9);
                  auVar101 = vshufps_avx(auVar93,auVar93,0xc9);
                  auVar97 = vshufps_avx(auVar97,auVar97,0xd2);
                  auVar169._0_4_ = auVar93._0_4_ * auVar97._0_4_;
                  auVar169._4_4_ = auVar93._4_4_ * auVar97._4_4_;
                  auVar169._8_4_ = auVar93._8_4_ * auVar97._8_4_;
                  auVar169._12_4_ = auVar93._12_4_ * auVar97._12_4_;
                  auVar92 = vfmsub231ps_fma(auVar169,auVar92,auVar101);
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar3->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x200) = fVar254;
                    uVar186 = vextractps_avx(auVar92,1);
                    *(undefined4 *)(ray + k * 4 + 0x300) = uVar186;
                    uVar186 = vextractps_avx(auVar92,2);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar186;
                    *(int *)(ray + k * 4 + 0x380) = auVar92._0_4_;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar260;
                    *(undefined4 *)(ray + k * 4 + 0x400) = 0;
                    *(uint *)(ray + k * 4 + 0x440) = uVar2;
                    *(uint *)(ray + k * 4 + 0x480) = uVar1;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar5 = context->user;
                    auVar179 = vbroadcastss_avx512f(ZEXT416(1));
                    local_340 = vpermps_avx512f(auVar179,auVar263);
                    auVar179 = vpermps_avx512f(auVar179,ZEXT1664(auVar92));
                    auVar274 = vbroadcastss_avx512f(ZEXT416(2));
                    local_3c0 = vpermps_avx512f(auVar274,ZEXT1664(auVar92));
                    local_380 = vbroadcastss_avx512f(auVar92);
                    local_400[0] = (RTCHitN)auVar179[0];
                    local_400[1] = (RTCHitN)auVar179[1];
                    local_400[2] = (RTCHitN)auVar179[2];
                    local_400[3] = (RTCHitN)auVar179[3];
                    local_400[4] = (RTCHitN)auVar179[4];
                    local_400[5] = (RTCHitN)auVar179[5];
                    local_400[6] = (RTCHitN)auVar179[6];
                    local_400[7] = (RTCHitN)auVar179[7];
                    local_400[8] = (RTCHitN)auVar179[8];
                    local_400[9] = (RTCHitN)auVar179[9];
                    local_400[10] = (RTCHitN)auVar179[10];
                    local_400[0xb] = (RTCHitN)auVar179[0xb];
                    local_400[0xc] = (RTCHitN)auVar179[0xc];
                    local_400[0xd] = (RTCHitN)auVar179[0xd];
                    local_400[0xe] = (RTCHitN)auVar179[0xe];
                    local_400[0xf] = (RTCHitN)auVar179[0xf];
                    local_400[0x10] = (RTCHitN)auVar179[0x10];
                    local_400[0x11] = (RTCHitN)auVar179[0x11];
                    local_400[0x12] = (RTCHitN)auVar179[0x12];
                    local_400[0x13] = (RTCHitN)auVar179[0x13];
                    local_400[0x14] = (RTCHitN)auVar179[0x14];
                    local_400[0x15] = (RTCHitN)auVar179[0x15];
                    local_400[0x16] = (RTCHitN)auVar179[0x16];
                    local_400[0x17] = (RTCHitN)auVar179[0x17];
                    local_400[0x18] = (RTCHitN)auVar179[0x18];
                    local_400[0x19] = (RTCHitN)auVar179[0x19];
                    local_400[0x1a] = (RTCHitN)auVar179[0x1a];
                    local_400[0x1b] = (RTCHitN)auVar179[0x1b];
                    local_400[0x1c] = (RTCHitN)auVar179[0x1c];
                    local_400[0x1d] = (RTCHitN)auVar179[0x1d];
                    local_400[0x1e] = (RTCHitN)auVar179[0x1e];
                    local_400[0x1f] = (RTCHitN)auVar179[0x1f];
                    local_400[0x20] = (RTCHitN)auVar179[0x20];
                    local_400[0x21] = (RTCHitN)auVar179[0x21];
                    local_400[0x22] = (RTCHitN)auVar179[0x22];
                    local_400[0x23] = (RTCHitN)auVar179[0x23];
                    local_400[0x24] = (RTCHitN)auVar179[0x24];
                    local_400[0x25] = (RTCHitN)auVar179[0x25];
                    local_400[0x26] = (RTCHitN)auVar179[0x26];
                    local_400[0x27] = (RTCHitN)auVar179[0x27];
                    local_400[0x28] = (RTCHitN)auVar179[0x28];
                    local_400[0x29] = (RTCHitN)auVar179[0x29];
                    local_400[0x2a] = (RTCHitN)auVar179[0x2a];
                    local_400[0x2b] = (RTCHitN)auVar179[0x2b];
                    local_400[0x2c] = (RTCHitN)auVar179[0x2c];
                    local_400[0x2d] = (RTCHitN)auVar179[0x2d];
                    local_400[0x2e] = (RTCHitN)auVar179[0x2e];
                    local_400[0x2f] = (RTCHitN)auVar179[0x2f];
                    local_400[0x30] = (RTCHitN)auVar179[0x30];
                    local_400[0x31] = (RTCHitN)auVar179[0x31];
                    local_400[0x32] = (RTCHitN)auVar179[0x32];
                    local_400[0x33] = (RTCHitN)auVar179[0x33];
                    local_400[0x34] = (RTCHitN)auVar179[0x34];
                    local_400[0x35] = (RTCHitN)auVar179[0x35];
                    local_400[0x36] = (RTCHitN)auVar179[0x36];
                    local_400[0x37] = (RTCHitN)auVar179[0x37];
                    local_400[0x38] = (RTCHitN)auVar179[0x38];
                    local_400[0x39] = (RTCHitN)auVar179[0x39];
                    local_400[0x3a] = (RTCHitN)auVar179[0x3a];
                    local_400[0x3b] = (RTCHitN)auVar179[0x3b];
                    local_400[0x3c] = (RTCHitN)auVar179[0x3c];
                    local_400[0x3d] = (RTCHitN)auVar179[0x3d];
                    local_400[0x3e] = (RTCHitN)auVar179[0x3e];
                    local_400[0x3f] = (RTCHitN)auVar179[0x3f];
                    local_300 = 0;
                    uStack_2f8 = 0;
                    uStack_2f0 = 0;
                    uStack_2e8 = 0;
                    uStack_2e0 = 0;
                    uStack_2d8 = 0;
                    uStack_2d0 = 0;
                    uStack_2c8 = 0;
                    local_2c0 = local_480._0_8_;
                    uStack_2b8 = local_480._8_8_;
                    uStack_2b0 = local_480._16_8_;
                    uStack_2a8 = local_480._24_8_;
                    uStack_2a0 = local_480._32_8_;
                    uStack_298 = local_480._40_8_;
                    uStack_290 = local_480._48_8_;
                    uStack_288 = local_480._56_8_;
                    auVar179 = vmovdqa64_avx512f(local_440);
                    local_280 = vmovdqa64_avx512f(auVar179);
                    auVar102 = vpcmpeqd_avx2(auVar179._0_32_,auVar179._0_32_);
                    local_a18[3] = auVar102;
                    local_a18[2] = auVar102;
                    local_a18[1] = auVar102;
                    *local_a18 = auVar102;
                    local_240 = vbroadcastss_avx512f(ZEXT416(pRVar5->instID[0]));
                    local_200 = vbroadcastss_avx512f(ZEXT416(pRVar5->instPrimID[0]));
                    *(float *)(ray + k * 4 + 0x200) = fVar254;
                    auVar179 = vmovdqa64_avx512f(local_4c0);
                    local_780 = vmovdqa64_avx512f(auVar179);
                    local_ad0.valid = (int *)local_780;
                    local_ad0.geometryUserPtr = pGVar3->userPtr;
                    local_ad0.context = context->user;
                    local_ad0.hit = local_400;
                    local_ad0.N = 0x10;
                    local_ad0.ray = (RTCRayN *)ray;
                    if (pGVar3->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar253 = ZEXT1664(auVar250);
                      auVar258 = ZEXT1664(auVar256);
                      auVar263 = ZEXT1664(auVar91);
                      auVar265 = ZEXT1664(auVar89);
                      auVar267 = ZEXT1664(local_a00._0_16_);
                      auVar271 = ZEXT1664(auVar90);
                      (*pGVar3->intersectionFilterN)(&local_ad0);
                      auVar179 = vmovdqa64_avx512f(local_780);
                    }
                    uVar23 = vptestmd_avx512f(auVar179,auVar179);
                    if ((short)uVar23 != 0) {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar253 = ZEXT1664(auVar253._0_16_);
                        auVar258 = ZEXT1664(auVar258._0_16_);
                        auVar263 = ZEXT1664(auVar263._0_16_);
                        auVar265 = ZEXT1664(auVar265._0_16_);
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        auVar271 = ZEXT1664(auVar271._0_16_);
                        (*p_Var4)(&local_ad0);
                        auVar179 = vmovdqa64_avx512f(local_780);
                      }
                      uVar85 = vptestmd_avx512f(auVar179,auVar179);
                      if ((short)uVar85 != 0) {
                        iVar60 = *(int *)(local_ad0.hit + 4);
                        iVar61 = *(int *)(local_ad0.hit + 8);
                        iVar62 = *(int *)(local_ad0.hit + 0xc);
                        iVar63 = *(int *)(local_ad0.hit + 0x10);
                        iVar64 = *(int *)(local_ad0.hit + 0x14);
                        iVar65 = *(int *)(local_ad0.hit + 0x18);
                        iVar66 = *(int *)(local_ad0.hit + 0x1c);
                        iVar67 = *(int *)(local_ad0.hit + 0x20);
                        iVar68 = *(int *)(local_ad0.hit + 0x24);
                        iVar69 = *(int *)(local_ad0.hit + 0x28);
                        iVar70 = *(int *)(local_ad0.hit + 0x2c);
                        iVar71 = *(int *)(local_ad0.hit + 0x30);
                        iVar72 = *(int *)(local_ad0.hit + 0x34);
                        iVar73 = *(int *)(local_ad0.hit + 0x38);
                        iVar74 = *(int *)(local_ad0.hit + 0x3c);
                        bVar79 = (byte)uVar85;
                        bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar8 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar81 = (byte)(uVar85 >> 8);
                        bVar12 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar18 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x300) =
                             (uint)(bVar79 & 1) * *(int *)local_ad0.hit |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_ad0.ray + 0x300);
                        *(uint *)(local_ad0.ray + 0x304) =
                             (uint)bVar87 * iVar60 | (uint)!bVar87 * *(int *)(local_ad0.ray + 0x304)
                        ;
                        *(uint *)(local_ad0.ray + 0x308) =
                             (uint)bVar6 * iVar61 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x308);
                        *(uint *)(local_ad0.ray + 0x30c) =
                             (uint)bVar7 * iVar62 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x30c);
                        *(uint *)(local_ad0.ray + 0x310) =
                             (uint)bVar8 * iVar63 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x310);
                        *(uint *)(local_ad0.ray + 0x314) =
                             (uint)bVar9 * iVar64 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x314);
                        *(uint *)(local_ad0.ray + 0x318) =
                             (uint)bVar10 * iVar65 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x318)
                        ;
                        *(uint *)(local_ad0.ray + 0x31c) =
                             (uint)bVar11 * iVar66 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x31c)
                        ;
                        *(uint *)(local_ad0.ray + 800) =
                             (uint)(bVar81 & 1) * iVar67 |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 800);
                        *(uint *)(local_ad0.ray + 0x324) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x324)
                        ;
                        *(uint *)(local_ad0.ray + 0x328) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x328)
                        ;
                        *(uint *)(local_ad0.ray + 0x32c) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x32c)
                        ;
                        *(uint *)(local_ad0.ray + 0x330) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x330)
                        ;
                        *(uint *)(local_ad0.ray + 0x334) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x334)
                        ;
                        *(uint *)(local_ad0.ray + 0x338) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x338)
                        ;
                        *(uint *)(local_ad0.ray + 0x33c) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x33c)
                        ;
                        iVar60 = *(int *)(local_ad0.hit + 0x44);
                        iVar61 = *(int *)(local_ad0.hit + 0x48);
                        iVar62 = *(int *)(local_ad0.hit + 0x4c);
                        iVar63 = *(int *)(local_ad0.hit + 0x50);
                        iVar64 = *(int *)(local_ad0.hit + 0x54);
                        iVar65 = *(int *)(local_ad0.hit + 0x58);
                        iVar66 = *(int *)(local_ad0.hit + 0x5c);
                        iVar67 = *(int *)(local_ad0.hit + 0x60);
                        iVar68 = *(int *)(local_ad0.hit + 100);
                        iVar69 = *(int *)(local_ad0.hit + 0x68);
                        iVar70 = *(int *)(local_ad0.hit + 0x6c);
                        iVar71 = *(int *)(local_ad0.hit + 0x70);
                        iVar72 = *(int *)(local_ad0.hit + 0x74);
                        iVar73 = *(int *)(local_ad0.hit + 0x78);
                        iVar74 = *(int *)(local_ad0.hit + 0x7c);
                        bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar8 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar18 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x340) =
                             (uint)(bVar79 & 1) * *(int *)(local_ad0.hit + 0x40) |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_ad0.ray + 0x340);
                        *(uint *)(local_ad0.ray + 0x344) =
                             (uint)bVar87 * iVar60 | (uint)!bVar87 * *(int *)(local_ad0.ray + 0x344)
                        ;
                        *(uint *)(local_ad0.ray + 0x348) =
                             (uint)bVar6 * iVar61 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x348);
                        *(uint *)(local_ad0.ray + 0x34c) =
                             (uint)bVar7 * iVar62 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x34c);
                        *(uint *)(local_ad0.ray + 0x350) =
                             (uint)bVar8 * iVar63 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x350);
                        *(uint *)(local_ad0.ray + 0x354) =
                             (uint)bVar9 * iVar64 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x354);
                        *(uint *)(local_ad0.ray + 0x358) =
                             (uint)bVar10 * iVar65 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x358)
                        ;
                        *(uint *)(local_ad0.ray + 0x35c) =
                             (uint)bVar11 * iVar66 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x35c)
                        ;
                        *(uint *)(local_ad0.ray + 0x360) =
                             (uint)(bVar81 & 1) * iVar67 |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 0x360);
                        *(uint *)(local_ad0.ray + 0x364) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x364)
                        ;
                        *(uint *)(local_ad0.ray + 0x368) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x368)
                        ;
                        *(uint *)(local_ad0.ray + 0x36c) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x36c)
                        ;
                        *(uint *)(local_ad0.ray + 0x370) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x370)
                        ;
                        *(uint *)(local_ad0.ray + 0x374) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x374)
                        ;
                        *(uint *)(local_ad0.ray + 0x378) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x378)
                        ;
                        *(uint *)(local_ad0.ray + 0x37c) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x37c)
                        ;
                        iVar60 = *(int *)(local_ad0.hit + 0x84);
                        iVar61 = *(int *)(local_ad0.hit + 0x88);
                        iVar62 = *(int *)(local_ad0.hit + 0x8c);
                        iVar63 = *(int *)(local_ad0.hit + 0x90);
                        iVar64 = *(int *)(local_ad0.hit + 0x94);
                        iVar65 = *(int *)(local_ad0.hit + 0x98);
                        iVar66 = *(int *)(local_ad0.hit + 0x9c);
                        iVar67 = *(int *)(local_ad0.hit + 0xa0);
                        iVar68 = *(int *)(local_ad0.hit + 0xa4);
                        iVar69 = *(int *)(local_ad0.hit + 0xa8);
                        iVar70 = *(int *)(local_ad0.hit + 0xac);
                        iVar71 = *(int *)(local_ad0.hit + 0xb0);
                        iVar72 = *(int *)(local_ad0.hit + 0xb4);
                        iVar73 = *(int *)(local_ad0.hit + 0xb8);
                        iVar74 = *(int *)(local_ad0.hit + 0xbc);
                        bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar8 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar18 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x380) =
                             (uint)(bVar79 & 1) * *(int *)(local_ad0.hit + 0x80) |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_ad0.ray + 0x380);
                        *(uint *)(local_ad0.ray + 900) =
                             (uint)bVar87 * iVar60 | (uint)!bVar87 * *(int *)(local_ad0.ray + 900);
                        *(uint *)(local_ad0.ray + 0x388) =
                             (uint)bVar6 * iVar61 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x388);
                        *(uint *)(local_ad0.ray + 0x38c) =
                             (uint)bVar7 * iVar62 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x38c);
                        *(uint *)(local_ad0.ray + 0x390) =
                             (uint)bVar8 * iVar63 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x390);
                        *(uint *)(local_ad0.ray + 0x394) =
                             (uint)bVar9 * iVar64 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x394);
                        *(uint *)(local_ad0.ray + 0x398) =
                             (uint)bVar10 * iVar65 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x398)
                        ;
                        *(uint *)(local_ad0.ray + 0x39c) =
                             (uint)bVar11 * iVar66 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x39c)
                        ;
                        *(uint *)(local_ad0.ray + 0x3a0) =
                             (uint)(bVar81 & 1) * iVar67 |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 0x3a0);
                        *(uint *)(local_ad0.ray + 0x3a4) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x3a4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3a8) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x3a8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3ac) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x3ac)
                        ;
                        *(uint *)(local_ad0.ray + 0x3b0) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3b0)
                        ;
                        *(uint *)(local_ad0.ray + 0x3b4) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3b4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3b8) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3b8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3bc) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3bc)
                        ;
                        iVar60 = *(int *)(local_ad0.hit + 0xc4);
                        iVar61 = *(int *)(local_ad0.hit + 200);
                        iVar62 = *(int *)(local_ad0.hit + 0xcc);
                        iVar63 = *(int *)(local_ad0.hit + 0xd0);
                        iVar64 = *(int *)(local_ad0.hit + 0xd4);
                        iVar65 = *(int *)(local_ad0.hit + 0xd8);
                        iVar66 = *(int *)(local_ad0.hit + 0xdc);
                        iVar67 = *(int *)(local_ad0.hit + 0xe0);
                        iVar68 = *(int *)(local_ad0.hit + 0xe4);
                        iVar69 = *(int *)(local_ad0.hit + 0xe8);
                        iVar70 = *(int *)(local_ad0.hit + 0xec);
                        iVar71 = *(int *)(local_ad0.hit + 0xf0);
                        iVar72 = *(int *)(local_ad0.hit + 0xf4);
                        iVar73 = *(int *)(local_ad0.hit + 0xf8);
                        iVar74 = *(int *)(local_ad0.hit + 0xfc);
                        bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar8 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar18 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x3c0) =
                             (uint)(bVar79 & 1) * *(int *)(local_ad0.hit + 0xc0) |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_ad0.ray + 0x3c0);
                        *(uint *)(local_ad0.ray + 0x3c4) =
                             (uint)bVar87 * iVar60 | (uint)!bVar87 * *(int *)(local_ad0.ray + 0x3c4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3c8) =
                             (uint)bVar6 * iVar61 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x3c8);
                        *(uint *)(local_ad0.ray + 0x3cc) =
                             (uint)bVar7 * iVar62 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x3cc);
                        *(uint *)(local_ad0.ray + 0x3d0) =
                             (uint)bVar8 * iVar63 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x3d0);
                        *(uint *)(local_ad0.ray + 0x3d4) =
                             (uint)bVar9 * iVar64 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x3d4);
                        *(uint *)(local_ad0.ray + 0x3d8) =
                             (uint)bVar10 * iVar65 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x3d8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3dc) =
                             (uint)bVar11 * iVar66 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x3dc)
                        ;
                        *(uint *)(local_ad0.ray + 0x3e0) =
                             (uint)(bVar81 & 1) * iVar67 |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 0x3e0);
                        *(uint *)(local_ad0.ray + 0x3e4) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x3e4)
                        ;
                        *(uint *)(local_ad0.ray + 1000) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_ad0.ray + 1000);
                        *(uint *)(local_ad0.ray + 0x3ec) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x3ec)
                        ;
                        *(uint *)(local_ad0.ray + 0x3f0) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x3f0)
                        ;
                        *(uint *)(local_ad0.ray + 0x3f4) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x3f4)
                        ;
                        *(uint *)(local_ad0.ray + 0x3f8) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x3f8)
                        ;
                        *(uint *)(local_ad0.ray + 0x3fc) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x3fc)
                        ;
                        iVar60 = *(int *)(local_ad0.hit + 0x104);
                        iVar61 = *(int *)(local_ad0.hit + 0x108);
                        iVar62 = *(int *)(local_ad0.hit + 0x10c);
                        iVar63 = *(int *)(local_ad0.hit + 0x110);
                        iVar64 = *(int *)(local_ad0.hit + 0x114);
                        iVar65 = *(int *)(local_ad0.hit + 0x118);
                        iVar66 = *(int *)(local_ad0.hit + 0x11c);
                        iVar67 = *(int *)(local_ad0.hit + 0x120);
                        iVar68 = *(int *)(local_ad0.hit + 0x124);
                        iVar69 = *(int *)(local_ad0.hit + 0x128);
                        iVar70 = *(int *)(local_ad0.hit + 300);
                        iVar71 = *(int *)(local_ad0.hit + 0x130);
                        iVar72 = *(int *)(local_ad0.hit + 0x134);
                        iVar73 = *(int *)(local_ad0.hit + 0x138);
                        iVar74 = *(int *)(local_ad0.hit + 0x13c);
                        bVar87 = (bool)((byte)(uVar85 >> 1) & 1);
                        bVar6 = (bool)((byte)(uVar85 >> 2) & 1);
                        bVar7 = (bool)((byte)(uVar85 >> 3) & 1);
                        bVar8 = (bool)((byte)(uVar85 >> 4) & 1);
                        bVar9 = (bool)((byte)(uVar85 >> 5) & 1);
                        bVar10 = (bool)((byte)(uVar85 >> 6) & 1);
                        bVar11 = (bool)((byte)(uVar85 >> 7) & 1);
                        bVar12 = (bool)((byte)(uVar85 >> 9) & 1);
                        bVar13 = (bool)((byte)(uVar85 >> 10) & 1);
                        bVar14 = (bool)((byte)(uVar85 >> 0xb) & 1);
                        bVar15 = (bool)((byte)(uVar85 >> 0xc) & 1);
                        bVar16 = (bool)((byte)(uVar85 >> 0xd) & 1);
                        bVar17 = (bool)((byte)(uVar85 >> 0xe) & 1);
                        bVar18 = SUB81(uVar85 >> 0xf,0);
                        *(uint *)(local_ad0.ray + 0x400) =
                             (uint)(bVar79 & 1) * *(int *)(local_ad0.hit + 0x100) |
                             (uint)!(bool)(bVar79 & 1) * *(int *)(local_ad0.ray + 0x400);
                        *(uint *)(local_ad0.ray + 0x404) =
                             (uint)bVar87 * iVar60 | (uint)!bVar87 * *(int *)(local_ad0.ray + 0x404)
                        ;
                        *(uint *)(local_ad0.ray + 0x408) =
                             (uint)bVar6 * iVar61 | (uint)!bVar6 * *(int *)(local_ad0.ray + 0x408);
                        *(uint *)(local_ad0.ray + 0x40c) =
                             (uint)bVar7 * iVar62 | (uint)!bVar7 * *(int *)(local_ad0.ray + 0x40c);
                        *(uint *)(local_ad0.ray + 0x410) =
                             (uint)bVar8 * iVar63 | (uint)!bVar8 * *(int *)(local_ad0.ray + 0x410);
                        *(uint *)(local_ad0.ray + 0x414) =
                             (uint)bVar9 * iVar64 | (uint)!bVar9 * *(int *)(local_ad0.ray + 0x414);
                        *(uint *)(local_ad0.ray + 0x418) =
                             (uint)bVar10 * iVar65 | (uint)!bVar10 * *(int *)(local_ad0.ray + 0x418)
                        ;
                        *(uint *)(local_ad0.ray + 0x41c) =
                             (uint)bVar11 * iVar66 | (uint)!bVar11 * *(int *)(local_ad0.ray + 0x41c)
                        ;
                        *(uint *)(local_ad0.ray + 0x420) =
                             (uint)(bVar81 & 1) * iVar67 |
                             (uint)!(bool)(bVar81 & 1) * *(int *)(local_ad0.ray + 0x420);
                        *(uint *)(local_ad0.ray + 0x424) =
                             (uint)bVar12 * iVar68 | (uint)!bVar12 * *(int *)(local_ad0.ray + 0x424)
                        ;
                        *(uint *)(local_ad0.ray + 0x428) =
                             (uint)bVar13 * iVar69 | (uint)!bVar13 * *(int *)(local_ad0.ray + 0x428)
                        ;
                        *(uint *)(local_ad0.ray + 0x42c) =
                             (uint)bVar14 * iVar70 | (uint)!bVar14 * *(int *)(local_ad0.ray + 0x42c)
                        ;
                        *(uint *)(local_ad0.ray + 0x430) =
                             (uint)bVar15 * iVar71 | (uint)!bVar15 * *(int *)(local_ad0.ray + 0x430)
                        ;
                        *(uint *)(local_ad0.ray + 0x434) =
                             (uint)bVar16 * iVar72 | (uint)!bVar16 * *(int *)(local_ad0.ray + 0x434)
                        ;
                        *(uint *)(local_ad0.ray + 0x438) =
                             (uint)bVar17 * iVar73 | (uint)!bVar17 * *(int *)(local_ad0.ray + 0x438)
                        ;
                        *(uint *)(local_ad0.ray + 0x43c) =
                             (uint)bVar18 * iVar74 | (uint)!bVar18 * *(int *)(local_ad0.ray + 0x43c)
                        ;
                        auVar179 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x140));
                        auVar179 = vmovdqu32_avx512f(auVar179);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x440) = auVar179;
                        auVar179 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x180));
                        auVar179 = vmovdqu32_avx512f(auVar179);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x480) = auVar179;
                        auVar179 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x1c0));
                        auVar179 = vmovdqa32_avx512f(auVar179);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x4c0) = auVar179;
                        auVar179 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_ad0.hit + 0x200));
                        auVar179 = vmovdqa32_avx512f(auVar179);
                        *(undefined1 (*) [64])(local_ad0.ray + 0x500) = auVar179;
                        goto LAB_01aa690a;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x200) = fVar259;
                  }
                }
              }
            }
LAB_01aa690a:
            uVar186 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar247._4_4_ = uVar186;
            auVar247._0_4_ = uVar186;
            auVar247._8_4_ = uVar186;
            auVar247._12_4_ = uVar186;
            auVar247._16_4_ = uVar186;
            auVar247._20_4_ = uVar186;
            auVar247._24_4_ = uVar186;
            auVar247._28_4_ = uVar186;
            auVar179 = ZEXT3264(auVar247);
            auVar76._4_4_ = fStack_71c;
            auVar76._0_4_ = local_720;
            auVar76._8_4_ = fStack_718;
            auVar76._12_4_ = fStack_714;
            auVar76._16_4_ = fStack_710;
            auVar76._20_4_ = fStack_70c;
            auVar76._24_4_ = fStack_708;
            auVar76._28_4_ = fStack_704;
            uVar23 = vcmpps_avx512vl(auVar247,auVar76,0xd);
          }
          uVar26 = vpcmpd_avx512vl(local_6e0,local_660,1);
          uVar25 = vpcmpd_avx512vl(local_6e0,_local_740,1);
          auVar199._0_4_ = (float)local_7e0._0_4_ + (float)local_540._0_4_;
          auVar199._4_4_ = (float)local_7e0._4_4_ + (float)local_540._4_4_;
          auVar199._8_4_ = fStack_7d8 + fStack_538;
          auVar199._12_4_ = fStack_7d4 + fStack_534;
          auVar199._16_4_ = fStack_7d0 + fStack_530;
          auVar199._20_4_ = fStack_7cc + fStack_52c;
          auVar199._24_4_ = fStack_7c8 + fStack_528;
          auVar199._28_4_ = fStack_7c4 + fStack_524;
          uVar186 = auVar179._0_4_;
          auVar216._4_4_ = uVar186;
          auVar216._0_4_ = uVar186;
          auVar216._8_4_ = uVar186;
          auVar216._12_4_ = uVar186;
          auVar216._16_4_ = uVar186;
          auVar216._20_4_ = uVar186;
          auVar216._24_4_ = uVar186;
          auVar216._28_4_ = uVar186;
          uVar23 = vcmpps_avx512vl(auVar199,auVar216,2);
          bVar82 = bVar82 & (byte)uVar26 & (byte)uVar23;
          auVar236._0_4_ = (float)local_7e0._0_4_ + (float)local_6a0._0_4_;
          auVar236._4_4_ = (float)local_7e0._4_4_ + (float)local_6a0._4_4_;
          auVar236._8_4_ = fStack_7d8 + fStack_698;
          auVar236._12_4_ = fStack_7d4 + fStack_694;
          auVar236._16_4_ = fStack_7d0 + fStack_690;
          auVar236._20_4_ = fStack_7cc + fStack_68c;
          auVar236._24_4_ = fStack_7c8 + fStack_688;
          auVar236._28_4_ = fStack_7c4 + fStack_684;
          uVar23 = vcmpps_avx512vl(auVar236,auVar216,2);
          bVar78 = bVar78 & (byte)uVar25 & (byte)uVar23 | bVar82;
          if (bVar78 != 0) {
            abStack_1a0[uVar83 * 0x60] = bVar78;
            bVar87 = (bool)(bVar82 >> 1 & 1);
            bVar6 = (bool)(bVar82 >> 2 & 1);
            bVar7 = (bool)(bVar82 >> 3 & 1);
            bVar8 = (bool)(bVar82 >> 4 & 1);
            bVar9 = (bool)(bVar82 >> 5 & 1);
            auStack_180[uVar83 * 0x18] =
                 (uint)(bVar82 & 1) * local_540._0_4_ | (uint)!(bool)(bVar82 & 1) * local_6a0._0_4_;
            auStack_180[uVar83 * 0x18 + 1] =
                 (uint)bVar87 * local_540._4_4_ | (uint)!bVar87 * local_6a0._4_4_;
            auStack_180[uVar83 * 0x18 + 2] =
                 (uint)bVar6 * (int)fStack_538 | (uint)!bVar6 * (int)fStack_698;
            auStack_180[uVar83 * 0x18 + 3] =
                 (uint)bVar7 * (int)fStack_534 | (uint)!bVar7 * (int)fStack_694;
            auStack_180[uVar83 * 0x18 + 4] =
                 (uint)bVar8 * (int)fStack_530 | (uint)!bVar8 * (int)fStack_690;
            auStack_180[uVar83 * 0x18 + 5] =
                 (uint)bVar9 * (int)fStack_52c | (uint)!bVar9 * (int)fStack_68c;
            auStack_180[uVar83 * 0x18 + 6] =
                 (uint)(bVar82 >> 6) * (int)fStack_528 |
                 (uint)!(bool)(bVar82 >> 6) * (int)fStack_688;
            (&fStack_164)[uVar83 * 0x18] = fStack_684;
            uVar85 = vmovlps_avx(local_6f0);
            (&uStack_160)[uVar83 * 0xc] = uVar85;
            aiStack_158[uVar83 * 0x18] = local_d1c + 1;
            uVar83 = (ulong)((int)uVar83 + 1);
          }
          auVar102 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar274 = ZEXT3264(auVar102);
          auVar179 = ZEXT3264(_DAT_01f7b040);
          prim = local_a10;
        }
      }
    }
    do {
      uVar88 = (uint)uVar83;
      uVar83 = (ulong)(uVar88 - 1);
      if (uVar88 == 0) {
        uVar186 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar39._4_4_ = uVar186;
        auVar39._0_4_ = uVar186;
        auVar39._8_4_ = uVar186;
        auVar39._12_4_ = uVar186;
        auVar39._16_4_ = uVar186;
        auVar39._20_4_ = uVar186;
        auVar39._24_4_ = uVar186;
        auVar39._28_4_ = uVar186;
        uVar23 = vcmpps_avx512vl(local_640,auVar39,2);
        local_a08 = (ulong)((uint)local_a08 & (uint)uVar23);
        goto LAB_01aa4290;
      }
      auVar102 = *(undefined1 (*) [32])(auStack_180 + uVar83 * 0x18);
      auVar200._0_4_ = auVar102._0_4_ + (float)local_7e0._0_4_;
      auVar200._4_4_ = auVar102._4_4_ + (float)local_7e0._4_4_;
      auVar200._8_4_ = auVar102._8_4_ + fStack_7d8;
      auVar200._12_4_ = auVar102._12_4_ + fStack_7d4;
      auVar200._16_4_ = auVar102._16_4_ + fStack_7d0;
      auVar200._20_4_ = auVar102._20_4_ + fStack_7cc;
      auVar200._24_4_ = auVar102._24_4_ + fStack_7c8;
      auVar200._28_4_ = auVar102._28_4_ + fStack_7c4;
      uVar186 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar38._4_4_ = uVar186;
      auVar38._0_4_ = uVar186;
      auVar38._8_4_ = uVar186;
      auVar38._12_4_ = uVar186;
      auVar38._16_4_ = uVar186;
      auVar38._20_4_ = uVar186;
      auVar38._24_4_ = uVar186;
      auVar38._28_4_ = uVar186;
      uVar23 = vcmpps_avx512vl(auVar200,auVar38,2);
      uVar155 = (uint)uVar23 & (uint)abStack_1a0[uVar83 * 0x60];
    } while (uVar155 == 0);
    uVar85 = (&uStack_160)[uVar83 * 0xc];
    auVar197._8_8_ = 0;
    auVar197._0_8_ = uVar85;
    auVar217._8_4_ = 0x7f800000;
    auVar217._0_8_ = 0x7f8000007f800000;
    auVar217._12_4_ = 0x7f800000;
    auVar217._16_4_ = 0x7f800000;
    auVar217._20_4_ = 0x7f800000;
    auVar217._24_4_ = 0x7f800000;
    auVar217._28_4_ = 0x7f800000;
    auVar103 = vblendmps_avx512vl(auVar217,auVar102);
    bVar78 = (byte)uVar155;
    auVar154._0_4_ =
         (uint)(bVar78 & 1) * auVar103._0_4_ | (uint)!(bool)(bVar78 & 1) * (int)auVar102._0_4_;
    bVar87 = (bool)((byte)(uVar155 >> 1) & 1);
    auVar154._4_4_ = (uint)bVar87 * auVar103._4_4_ | (uint)!bVar87 * (int)auVar102._4_4_;
    bVar87 = (bool)((byte)(uVar155 >> 2) & 1);
    auVar154._8_4_ = (uint)bVar87 * auVar103._8_4_ | (uint)!bVar87 * (int)auVar102._8_4_;
    bVar87 = (bool)((byte)(uVar155 >> 3) & 1);
    auVar154._12_4_ = (uint)bVar87 * auVar103._12_4_ | (uint)!bVar87 * (int)auVar102._12_4_;
    bVar87 = (bool)((byte)(uVar155 >> 4) & 1);
    auVar154._16_4_ = (uint)bVar87 * auVar103._16_4_ | (uint)!bVar87 * (int)auVar102._16_4_;
    bVar87 = (bool)((byte)(uVar155 >> 5) & 1);
    auVar154._20_4_ = (uint)bVar87 * auVar103._20_4_ | (uint)!bVar87 * (int)auVar102._20_4_;
    bVar87 = (bool)((byte)(uVar155 >> 6) & 1);
    auVar154._24_4_ = (uint)bVar87 * auVar103._24_4_ | (uint)!bVar87 * (int)auVar102._24_4_;
    auVar154._28_4_ =
         (uVar155 >> 7) * auVar103._28_4_ | (uint)!SUB41(uVar155 >> 7,0) * (int)auVar102._28_4_;
    auVar102 = vshufps_avx(auVar154,auVar154,0xb1);
    auVar102 = vminps_avx(auVar154,auVar102);
    auVar103 = vshufpd_avx(auVar102,auVar102,5);
    auVar102 = vminps_avx(auVar102,auVar103);
    auVar103 = vpermpd_avx2(auVar102,0x4e);
    auVar102 = vminps_avx(auVar102,auVar103);
    uVar23 = vcmpps_avx512vl(auVar154,auVar102,0);
    bVar84 = (byte)uVar23 & bVar78;
    if (bVar84 != 0) {
      uVar155 = (uint)bVar84;
    }
    uVar156 = 0;
    for (; (uVar155 & 1) == 0; uVar155 = uVar155 >> 1 | 0x80000000) {
      uVar156 = uVar156 + 1;
    }
    local_d1c = aiStack_158[uVar83 * 0x18];
    bVar78 = ~('\x01' << ((byte)uVar156 & 0x1f)) & bVar78;
    abStack_1a0[uVar83 * 0x60] = bVar78;
    if (bVar78 == 0) {
      uVar88 = uVar88 - 1;
    }
    uVar186 = (undefined4)uVar85;
    auVar178._4_4_ = uVar186;
    auVar178._0_4_ = uVar186;
    auVar178._8_4_ = uVar186;
    auVar178._12_4_ = uVar186;
    auVar178._16_4_ = uVar186;
    auVar178._20_4_ = uVar186;
    auVar178._24_4_ = uVar186;
    auVar178._28_4_ = uVar186;
    auVar91 = vmovshdup_avx(auVar197);
    auVar91 = vsubps_avx(auVar91,auVar197);
    auVar201._0_4_ = auVar91._0_4_;
    auVar201._4_4_ = auVar201._0_4_;
    auVar201._8_4_ = auVar201._0_4_;
    auVar201._12_4_ = auVar201._0_4_;
    auVar201._16_4_ = auVar201._0_4_;
    auVar201._20_4_ = auVar201._0_4_;
    auVar201._24_4_ = auVar201._0_4_;
    auVar201._28_4_ = auVar201._0_4_;
    auVar91 = vfmadd132ps_fma(auVar201,auVar178,auVar179._0_32_);
    auVar102 = ZEXT1632(auVar91);
    local_400[0] = (RTCHitN)auVar102[0];
    local_400[1] = (RTCHitN)auVar102[1];
    local_400[2] = (RTCHitN)auVar102[2];
    local_400[3] = (RTCHitN)auVar102[3];
    local_400[4] = (RTCHitN)auVar102[4];
    local_400[5] = (RTCHitN)auVar102[5];
    local_400[6] = (RTCHitN)auVar102[6];
    local_400[7] = (RTCHitN)auVar102[7];
    local_400[8] = (RTCHitN)auVar102[8];
    local_400[9] = (RTCHitN)auVar102[9];
    local_400[10] = (RTCHitN)auVar102[10];
    local_400[0xb] = (RTCHitN)auVar102[0xb];
    local_400[0xc] = (RTCHitN)auVar102[0xc];
    local_400[0xd] = (RTCHitN)auVar102[0xd];
    local_400[0xe] = (RTCHitN)auVar102[0xe];
    local_400[0xf] = (RTCHitN)auVar102[0xf];
    local_400[0x10] = (RTCHitN)auVar102[0x10];
    local_400[0x11] = (RTCHitN)auVar102[0x11];
    local_400[0x12] = (RTCHitN)auVar102[0x12];
    local_400[0x13] = (RTCHitN)auVar102[0x13];
    local_400[0x14] = (RTCHitN)auVar102[0x14];
    local_400[0x15] = (RTCHitN)auVar102[0x15];
    local_400[0x16] = (RTCHitN)auVar102[0x16];
    local_400[0x17] = (RTCHitN)auVar102[0x17];
    local_400[0x18] = (RTCHitN)auVar102[0x18];
    local_400[0x19] = (RTCHitN)auVar102[0x19];
    local_400[0x1a] = (RTCHitN)auVar102[0x1a];
    local_400[0x1b] = (RTCHitN)auVar102[0x1b];
    local_400[0x1c] = (RTCHitN)auVar102[0x1c];
    local_400[0x1d] = (RTCHitN)auVar102[0x1d];
    local_400[0x1e] = (RTCHitN)auVar102[0x1e];
    local_400[0x1f] = (RTCHitN)auVar102[0x1f];
    local_6f0._8_8_ = 0;
    local_6f0._0_8_ = *(ulong *)(local_400 + (ulong)uVar156 * 4);
    uVar83 = (ulong)uVar88;
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }